

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx::CurveNvIntersector1<4>::
     intersect_t<embree::avx::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  float *pfVar2;
  undefined1 (*pauVar3) [32];
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar9;
  Primitive PVar10;
  uint uVar11;
  uint uVar12;
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  bool bVar99;
  bool bVar100;
  long lVar101;
  bool bVar102;
  bool bVar103;
  bool bVar104;
  bool bVar105;
  bool bVar106;
  bool bVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [28];
  undefined1 auVar118 [28];
  undefined1 auVar119 [28];
  undefined1 auVar120 [28];
  undefined1 auVar121 [28];
  undefined1 auVar122 [28];
  undefined1 auVar123 [24];
  uint uVar124;
  uint uVar125;
  long lVar126;
  uint uVar127;
  ulong uVar128;
  undefined1 auVar129 [8];
  Primitive *pPVar130;
  ulong uVar131;
  long lVar132;
  float fVar133;
  float fVar149;
  float fVar151;
  vint4 bi_2;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar155;
  float fVar157;
  float fVar159;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar150;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar156;
  float fVar158;
  float fVar160;
  float fVar161;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar162;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [64];
  vint4 bi_1;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar174;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  vint4 ai;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar188;
  float fVar189;
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar190;
  float fVar203;
  float fVar205;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar195 [16];
  float fVar191;
  float fVar204;
  float fVar206;
  float fVar208;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar207;
  undefined1 auVar194 [16];
  float fVar209;
  float fVar210;
  float fVar211;
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [64];
  float fVar224;
  vint4 bi;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  float fVar225;
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar226;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [64];
  float fVar227;
  float fVar236;
  float fVar237;
  vint4 ai_2;
  undefined1 auVar231 [16];
  undefined1 auVar229 [16];
  float fVar238;
  undefined1 auVar230 [16];
  float fVar228;
  float fVar239;
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  float fVar240;
  float fVar241;
  float fVar247;
  float fVar249;
  undefined1 auVar242 [16];
  float fVar251;
  undefined1 auVar243 [16];
  float fVar248;
  float fVar250;
  float fVar252;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  float fVar253;
  undefined1 auVar246 [32];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar263;
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  vint4 ai_1;
  undefined1 auVar264 [16];
  float fVar268;
  undefined1 auVar265 [32];
  float fVar269;
  undefined1 auVar266 [32];
  float fVar270;
  float fVar271;
  float fVar278;
  float fVar280;
  undefined1 auVar272 [16];
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  float fVar279;
  float fVar281;
  float fVar282;
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  undefined1 auVar294 [32];
  float fVar305;
  float fVar306;
  undefined1 auVar300 [16];
  float fVar307;
  float fVar308;
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  float fVar309;
  float fVar313;
  float fVar314;
  undefined1 auVar310 [16];
  float fVar315;
  float fVar316;
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  float fVar317;
  float fVar319;
  float fVar320;
  float fVar321;
  undefined1 auVar318 [32];
  float fVar322;
  float fVar325;
  float fVar326;
  float fVar327;
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  Precalculations *local_7a8;
  RayHit *local_7a0;
  RayQueryContext *local_798;
  Primitive *local_790;
  ulong local_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  undefined1 auStack_6b0 [8];
  float fStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  undefined1 auStack_690 [16];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  undefined1 auStack_670 [8];
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  undefined1 auStack_650 [8];
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined4 local_5e8;
  float local_5e4;
  undefined4 local_5e0;
  uint local_5dc;
  undefined4 local_5d8;
  uint local_5d4;
  uint local_5d0;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  undefined8 uStack_538;
  undefined1 local_530 [8];
  undefined8 uStack_528;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [2] [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  uint local_360;
  uint local_35c;
  float local_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined1 local_300 [32];
  float local_2e0 [4];
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [8];
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined1 local_240 [32];
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_190 [16];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar267 [64];
  undefined1 auVar277 [64];
  
  PVar10 = prim[1];
  uVar128 = (ulong)(byte)PVar10;
  lVar101 = uVar128 * 0x19;
  fVar227 = *(float *)(prim + lVar101 + 0x12);
  auVar231 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar101 + 6));
  auVar254._0_4_ = fVar227 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar254._4_4_ = fVar227 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar254._8_4_ = fVar227 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar254._12_4_ = fVar227 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar175._0_4_ = fVar227 * auVar231._0_4_;
  auVar175._4_4_ = fVar227 * auVar231._4_4_;
  auVar175._8_4_ = fVar227 * auVar231._8_4_;
  auVar175._12_4_ = fVar227 * auVar231._12_4_;
  auVar231 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 4 + 6)));
  auVar231 = vcvtdq2ps_avx(auVar231);
  auVar182 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 5 + 6)));
  auVar182 = vcvtdq2ps_avx(auVar182);
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 6 + 6)));
  auVar196 = vcvtdq2ps_avx(auVar196);
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0xb + 6)));
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar10 * 0xc) + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar10 * 0xc + uVar128 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  uVar131 = (ulong)(uint)((int)(uVar128 * 9) * 2);
  auVar135 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 + 6)));
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 + uVar128 + 6)));
  auVar136 = vcvtdq2ps_avx(auVar136);
  uVar131 = (ulong)(uint)((int)(uVar128 * 5) << 2);
  auVar164 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 + 6)));
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar134 = vshufps_avx(auVar254,auVar254,0);
  auVar163 = vshufps_avx(auVar254,auVar254,0x55);
  auVar176 = vshufps_avx(auVar254,auVar254,0xaa);
  fVar227 = auVar176._0_4_;
  fVar190 = auVar176._4_4_;
  fVar236 = auVar176._8_4_;
  fVar203 = auVar176._12_4_;
  fVar240 = auVar163._0_4_;
  fVar247 = auVar163._4_4_;
  fVar249 = auVar163._8_4_;
  fVar251 = auVar163._12_4_;
  fVar237 = auVar134._0_4_;
  fVar205 = auVar134._4_4_;
  fVar238 = auVar134._8_4_;
  fVar207 = auVar134._12_4_;
  auVar300._0_4_ = fVar237 * auVar231._0_4_ + fVar240 * auVar182._0_4_ + fVar227 * auVar196._0_4_;
  auVar300._4_4_ = fVar205 * auVar231._4_4_ + fVar247 * auVar182._4_4_ + fVar190 * auVar196._4_4_;
  auVar300._8_4_ = fVar238 * auVar231._8_4_ + fVar249 * auVar182._8_4_ + fVar236 * auVar196._8_4_;
  auVar300._12_4_ =
       fVar207 * auVar231._12_4_ + fVar251 * auVar182._12_4_ + fVar203 * auVar196._12_4_;
  auVar310._0_4_ = fVar237 * auVar195._0_4_ + fVar240 * auVar18._0_4_ + auVar19._0_4_ * fVar227;
  auVar310._4_4_ = fVar205 * auVar195._4_4_ + fVar247 * auVar18._4_4_ + auVar19._4_4_ * fVar190;
  auVar310._8_4_ = fVar238 * auVar195._8_4_ + fVar249 * auVar18._8_4_ + auVar19._8_4_ * fVar236;
  auVar310._12_4_ = fVar207 * auVar195._12_4_ + fVar251 * auVar18._12_4_ + auVar19._12_4_ * fVar203;
  auVar255._0_4_ = fVar237 * auVar135._0_4_ + fVar240 * auVar136._0_4_ + auVar164._0_4_ * fVar227;
  auVar255._4_4_ = fVar205 * auVar135._4_4_ + fVar247 * auVar136._4_4_ + auVar164._4_4_ * fVar190;
  auVar255._8_4_ = fVar238 * auVar135._8_4_ + fVar249 * auVar136._8_4_ + auVar164._8_4_ * fVar236;
  auVar255._12_4_ =
       fVar207 * auVar135._12_4_ + fVar251 * auVar136._12_4_ + auVar164._12_4_ * fVar203;
  auVar134 = vshufps_avx(auVar175,auVar175,0);
  auVar163 = vshufps_avx(auVar175,auVar175,0x55);
  auVar176 = vshufps_avx(auVar175,auVar175,0xaa);
  fVar227 = auVar176._0_4_;
  fVar190 = auVar176._4_4_;
  fVar236 = auVar176._8_4_;
  fVar203 = auVar176._12_4_;
  fVar240 = auVar163._0_4_;
  fVar247 = auVar163._4_4_;
  fVar249 = auVar163._8_4_;
  fVar251 = auVar163._12_4_;
  fVar237 = auVar134._0_4_;
  fVar205 = auVar134._4_4_;
  fVar238 = auVar134._8_4_;
  fVar207 = auVar134._12_4_;
  auVar212._0_4_ = fVar237 * auVar231._0_4_ + fVar240 * auVar182._0_4_ + fVar227 * auVar196._0_4_;
  auVar212._4_4_ = fVar205 * auVar231._4_4_ + fVar247 * auVar182._4_4_ + fVar190 * auVar196._4_4_;
  auVar212._8_4_ = fVar238 * auVar231._8_4_ + fVar249 * auVar182._8_4_ + fVar236 * auVar196._8_4_;
  auVar212._12_4_ =
       fVar207 * auVar231._12_4_ + fVar251 * auVar182._12_4_ + fVar203 * auVar196._12_4_;
  auVar163._0_4_ = fVar237 * auVar195._0_4_ + auVar19._0_4_ * fVar227 + fVar240 * auVar18._0_4_;
  auVar163._4_4_ = fVar205 * auVar195._4_4_ + auVar19._4_4_ * fVar190 + fVar247 * auVar18._4_4_;
  auVar163._8_4_ = fVar238 * auVar195._8_4_ + auVar19._8_4_ * fVar236 + fVar249 * auVar18._8_4_;
  auVar163._12_4_ = fVar207 * auVar195._12_4_ + auVar19._12_4_ * fVar203 + fVar251 * auVar18._12_4_;
  auVar134._0_4_ = fVar237 * auVar135._0_4_ + fVar240 * auVar136._0_4_ + auVar164._0_4_ * fVar227;
  auVar134._4_4_ = fVar205 * auVar135._4_4_ + fVar247 * auVar136._4_4_ + auVar164._4_4_ * fVar190;
  auVar134._8_4_ = fVar238 * auVar135._8_4_ + fVar249 * auVar136._8_4_ + auVar164._8_4_ * fVar236;
  auVar134._12_4_ =
       fVar207 * auVar135._12_4_ + fVar251 * auVar136._12_4_ + auVar164._12_4_ * fVar203;
  auVar242._8_4_ = 0x7fffffff;
  auVar242._0_8_ = 0x7fffffff7fffffff;
  auVar242._12_4_ = 0x7fffffff;
  auVar231 = vandps_avx(auVar300,auVar242);
  auVar192._8_4_ = 0x219392ef;
  auVar192._0_8_ = 0x219392ef219392ef;
  auVar192._12_4_ = 0x219392ef;
  auVar231 = vcmpps_avx(auVar231,auVar192,1);
  auVar182 = vblendvps_avx(auVar300,auVar192,auVar231);
  auVar231 = vandps_avx(auVar310,auVar242);
  auVar231 = vcmpps_avx(auVar231,auVar192,1);
  auVar196 = vblendvps_avx(auVar310,auVar192,auVar231);
  auVar231 = vandps_avx(auVar255,auVar242);
  auVar231 = vcmpps_avx(auVar231,auVar192,1);
  auVar231 = vblendvps_avx(auVar255,auVar192,auVar231);
  auVar195 = vrcpps_avx(auVar182);
  fVar240 = auVar195._0_4_;
  auVar176._0_4_ = fVar240 * auVar182._0_4_;
  fVar247 = auVar195._4_4_;
  auVar176._4_4_ = fVar247 * auVar182._4_4_;
  fVar249 = auVar195._8_4_;
  auVar176._8_4_ = fVar249 * auVar182._8_4_;
  fVar251 = auVar195._12_4_;
  auVar176._12_4_ = fVar251 * auVar182._12_4_;
  auVar256._8_4_ = 0x3f800000;
  auVar256._0_8_ = &DAT_3f8000003f800000;
  auVar256._12_4_ = 0x3f800000;
  auVar182 = vsubps_avx(auVar256,auVar176);
  fVar240 = fVar240 + fVar240 * auVar182._0_4_;
  fVar247 = fVar247 + fVar247 * auVar182._4_4_;
  fVar249 = fVar249 + fVar249 * auVar182._8_4_;
  fVar251 = fVar251 + fVar251 * auVar182._12_4_;
  auVar182 = vrcpps_avx(auVar196);
  fVar227 = auVar182._0_4_;
  auVar229._0_4_ = fVar227 * auVar196._0_4_;
  fVar236 = auVar182._4_4_;
  auVar229._4_4_ = fVar236 * auVar196._4_4_;
  fVar237 = auVar182._8_4_;
  auVar229._8_4_ = fVar237 * auVar196._8_4_;
  fVar238 = auVar182._12_4_;
  auVar229._12_4_ = fVar238 * auVar196._12_4_;
  auVar182 = vsubps_avx(auVar256,auVar229);
  fVar227 = fVar227 + fVar227 * auVar182._0_4_;
  fVar236 = fVar236 + fVar236 * auVar182._4_4_;
  fVar237 = fVar237 + fVar237 * auVar182._8_4_;
  fVar238 = fVar238 + fVar238 * auVar182._12_4_;
  auVar182 = vrcpps_avx(auVar231);
  fVar190 = auVar182._0_4_;
  auVar193._0_4_ = fVar190 * auVar231._0_4_;
  fVar203 = auVar182._4_4_;
  auVar193._4_4_ = fVar203 * auVar231._4_4_;
  fVar205 = auVar182._8_4_;
  auVar193._8_4_ = fVar205 * auVar231._8_4_;
  fVar207 = auVar182._12_4_;
  auVar193._12_4_ = fVar207 * auVar231._12_4_;
  auVar231 = vsubps_avx(auVar256,auVar193);
  fVar190 = fVar190 + fVar190 * auVar231._0_4_;
  fVar203 = fVar203 + fVar203 * auVar231._4_4_;
  fVar205 = fVar205 + fVar205 * auVar231._8_4_;
  fVar207 = fVar207 + fVar207 * auVar231._12_4_;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = *(ulong *)(prim + uVar128 * 7 + 6);
  auVar231 = vpmovsxwd_avx(auVar231);
  auVar231 = vcvtdq2ps_avx(auVar231);
  auVar231 = vsubps_avx(auVar231,auVar212);
  auVar177._0_4_ = fVar240 * auVar231._0_4_;
  auVar177._4_4_ = fVar247 * auVar231._4_4_;
  auVar177._8_4_ = fVar249 * auVar231._8_4_;
  auVar177._12_4_ = fVar251 * auVar231._12_4_;
  auVar182._8_8_ = 0;
  auVar182._0_8_ = *(ulong *)(prim + uVar128 * 9 + 6);
  auVar231 = vpmovsxwd_avx(auVar182);
  auVar231 = vcvtdq2ps_avx(auVar231);
  auVar231 = vsubps_avx(auVar231,auVar212);
  auVar213._0_4_ = fVar240 * auVar231._0_4_;
  auVar213._4_4_ = fVar247 * auVar231._4_4_;
  auVar213._8_4_ = fVar249 * auVar231._8_4_;
  auVar213._12_4_ = fVar251 * auVar231._12_4_;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  auVar182 = vpmovsxwd_avx(auVar196);
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar128 * -2 + 6);
  auVar231 = vpmovsxwd_avx(auVar195);
  auVar231 = vcvtdq2ps_avx(auVar231);
  auVar231 = vsubps_avx(auVar231,auVar163);
  auVar264._0_4_ = auVar231._0_4_ * fVar227;
  auVar264._4_4_ = auVar231._4_4_ * fVar236;
  auVar264._8_4_ = auVar231._8_4_ * fVar237;
  auVar264._12_4_ = auVar231._12_4_ * fVar238;
  auVar267 = ZEXT1664(auVar264);
  auVar231 = vcvtdq2ps_avx(auVar182);
  auVar231 = vsubps_avx(auVar231,auVar163);
  auVar164._0_4_ = fVar227 * auVar231._0_4_;
  auVar164._4_4_ = fVar236 * auVar231._4_4_;
  auVar164._8_4_ = fVar237 * auVar231._8_4_;
  auVar164._12_4_ = fVar238 * auVar231._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar131 + uVar128 + 6);
  auVar231 = vpmovsxwd_avx(auVar18);
  auVar231 = vcvtdq2ps_avx(auVar231);
  auVar231 = vsubps_avx(auVar231,auVar134);
  auVar230._0_4_ = auVar231._0_4_ * fVar190;
  auVar230._4_4_ = auVar231._4_4_ * fVar203;
  auVar230._8_4_ = auVar231._8_4_ * fVar205;
  auVar230._12_4_ = auVar231._12_4_ * fVar207;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar128 * 0x17 + 6);
  auVar231 = vpmovsxwd_avx(auVar19);
  auVar231 = vcvtdq2ps_avx(auVar231);
  auVar231 = vsubps_avx(auVar231,auVar134);
  auVar135._0_4_ = auVar231._0_4_ * fVar190;
  auVar135._4_4_ = auVar231._4_4_ * fVar203;
  auVar135._8_4_ = auVar231._8_4_ * fVar205;
  auVar135._12_4_ = auVar231._12_4_ * fVar207;
  auVar231 = vpminsd_avx(auVar177,auVar213);
  auVar182 = vpminsd_avx(auVar264,auVar164);
  auVar231 = vmaxps_avx(auVar231,auVar182);
  auVar182 = vpminsd_avx(auVar230,auVar135);
  uVar7 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar272._4_4_ = uVar7;
  auVar272._0_4_ = uVar7;
  auVar272._8_4_ = uVar7;
  auVar272._12_4_ = uVar7;
  auVar277 = ZEXT1664(auVar272);
  auVar182 = vmaxps_avx(auVar182,auVar272);
  auVar231 = vmaxps_avx(auVar231,auVar182);
  local_190._0_4_ = auVar231._0_4_ * 0.99999964;
  local_190._4_4_ = auVar231._4_4_ * 0.99999964;
  local_190._8_4_ = auVar231._8_4_ * 0.99999964;
  local_190._12_4_ = auVar231._12_4_ * 0.99999964;
  auVar231 = vpmaxsd_avx(auVar177,auVar213);
  auVar182 = vpmaxsd_avx(auVar264,auVar164);
  auVar231 = vminps_avx(auVar231,auVar182);
  auVar182 = vpmaxsd_avx(auVar230,auVar135);
  fVar227 = (ray->super_RayK<1>).tfar;
  auVar178._4_4_ = fVar227;
  auVar178._0_4_ = fVar227;
  auVar178._8_4_ = fVar227;
  auVar178._12_4_ = fVar227;
  auVar182 = vminps_avx(auVar182,auVar178);
  auVar231 = vminps_avx(auVar231,auVar182);
  auVar136._0_4_ = auVar231._0_4_ * 1.0000004;
  auVar136._4_4_ = auVar231._4_4_ * 1.0000004;
  auVar136._8_4_ = auVar231._8_4_ * 1.0000004;
  auVar136._12_4_ = auVar231._12_4_ * 1.0000004;
  auVar231 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar182 = vpcmpgtd_avx(auVar231,_DAT_01ff0cf0);
  auVar231 = vcmpps_avx(local_190,auVar136,2);
  auVar231 = vandps_avx(auVar231,auVar182);
  uVar127 = vmovmskps_avx(auVar231);
  if (uVar127 != 0) {
    uVar127 = uVar127 & 0xff;
    local_4c0[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_4c0[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_4c0[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_4c0[1]._24_8_ = mm_lookupmask_ps._24_8_;
    pPVar130 = prim;
    do {
      auVar234 = local_640;
      uVar131 = (ulong)uVar127;
      local_720 = auVar277._0_32_;
      local_700 = auVar267._0_32_;
      lVar126 = 0;
      if (uVar131 != 0) {
        for (; (uVar127 >> lVar126 & 1) == 0; lVar126 = lVar126 + 1) {
        }
      }
      uVar131 = uVar131 - 1 & uVar131;
      uVar127 = *(uint *)(pPVar130 + lVar126 * 4 + 6);
      lVar126 = lVar126 * 0x40;
      lVar132 = 0;
      if (uVar131 != 0) {
        for (; (uVar131 >> lVar132 & 1) == 0; lVar132 = lVar132 + 1) {
        }
      }
      uVar11 = *(uint *)(pPVar130 + 2);
      local_788 = (ulong)uVar11;
      pGVar13 = (context->scene->geometries).items[uVar11].ptr;
      _local_7c0 = *(undefined1 (*) [16])(prim + lVar126 + lVar101 + 0x16);
      if (((uVar131 != 0) && (uVar128 = uVar131 - 1 & uVar131, uVar128 != 0)) &&
         (lVar132 = 0, uVar128 != 0)) {
        for (; (uVar128 >> lVar132 & 1) == 0; lVar132 = lVar132 + 1) {
        }
      }
      _local_600 = *(undefined1 (*) [16])(prim + lVar126 + lVar101 + 0x26);
      _local_530 = *(undefined1 (*) [16])(prim + lVar126 + lVar101 + 0x36);
      _local_540 = *(undefined1 (*) [16])(prim + lVar126 + lVar101 + 0x46);
      uVar12 = (uint)pGVar13[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar9 = (ray->super_RayK<1>).org.field_0;
      auVar196 = vsubps_avx(_local_7c0,(undefined1  [16])aVar9);
      auVar135 = _local_7c0;
      auVar231 = vshufps_avx(auVar196,auVar196,0);
      auVar182 = vshufps_avx(auVar196,auVar196,0x55);
      auVar196 = vshufps_avx(auVar196,auVar196,0xaa);
      fVar227 = (pre->ray_space).vx.field_0.m128[0];
      fVar190 = (pre->ray_space).vx.field_0.m128[1];
      fVar236 = (pre->ray_space).vx.field_0.m128[2];
      fVar203 = (pre->ray_space).vx.field_0.m128[3];
      fVar237 = (pre->ray_space).vy.field_0.m128[0];
      fVar205 = (pre->ray_space).vy.field_0.m128[1];
      fVar238 = (pre->ray_space).vy.field_0.m128[2];
      fVar207 = (pre->ray_space).vy.field_0.m128[3];
      fVar240 = (pre->ray_space).vz.field_0.m128[0];
      fVar247 = (pre->ray_space).vz.field_0.m128[1];
      fVar249 = (pre->ray_space).vz.field_0.m128[2];
      fVar251 = (pre->ray_space).vz.field_0.m128[3];
      auVar214._0_4_ =
           auVar231._0_4_ * fVar227 + auVar196._0_4_ * fVar240 + auVar182._0_4_ * fVar237;
      auVar214._4_4_ =
           auVar231._4_4_ * fVar190 + auVar196._4_4_ * fVar247 + auVar182._4_4_ * fVar205;
      auVar214._8_4_ =
           auVar231._8_4_ * fVar236 + auVar196._8_4_ * fVar249 + auVar182._8_4_ * fVar238;
      auVar214._12_4_ =
           auVar231._12_4_ * fVar203 + auVar196._12_4_ * fVar251 + auVar182._12_4_ * fVar207;
      auVar231 = vblendps_avx(auVar214,_local_7c0,8);
      auVar136 = _local_600;
      auVar195 = vsubps_avx(_local_600,(undefined1  [16])aVar9);
      auVar182 = vshufps_avx(auVar195,auVar195,0);
      auVar196 = vshufps_avx(auVar195,auVar195,0x55);
      auVar195 = vshufps_avx(auVar195,auVar195,0xaa);
      auVar215._0_8_ =
           CONCAT44(auVar182._4_4_ * fVar190 + auVar196._4_4_ * fVar205 + auVar195._4_4_ * fVar247,
                    auVar182._0_4_ * fVar227 + auVar196._0_4_ * fVar237 + auVar195._0_4_ * fVar240);
      auVar215._8_4_ =
           auVar182._8_4_ * fVar236 + auVar196._8_4_ * fVar238 + auVar195._8_4_ * fVar249;
      auVar215._12_4_ =
           auVar182._12_4_ * fVar203 + auVar196._12_4_ * fVar207 + auVar195._12_4_ * fVar251;
      auVar182 = vblendps_avx(auVar215,_local_600,8);
      auVar18 = vsubps_avx(_local_530,(undefined1  [16])aVar9);
      auVar196 = vshufps_avx(auVar18,auVar18,0);
      auVar195 = vshufps_avx(auVar18,auVar18,0x55);
      auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
      auVar216._0_4_ = auVar196._0_4_ * fVar227 + auVar195._0_4_ * fVar237 + auVar18._0_4_ * fVar240
      ;
      auVar216._4_4_ = auVar196._4_4_ * fVar190 + auVar195._4_4_ * fVar205 + auVar18._4_4_ * fVar247
      ;
      auVar216._8_4_ = auVar196._8_4_ * fVar236 + auVar195._8_4_ * fVar238 + auVar18._8_4_ * fVar249
      ;
      auVar216._12_4_ =
           auVar196._12_4_ * fVar203 + auVar195._12_4_ * fVar207 + auVar18._12_4_ * fVar251;
      auVar196 = vblendps_avx(auVar216,_local_530,8);
      auVar19 = vsubps_avx(_local_540,(undefined1  [16])aVar9);
      auVar195 = vshufps_avx(auVar19,auVar19,0);
      auVar18 = vshufps_avx(auVar19,auVar19,0x55);
      auVar19 = vshufps_avx(auVar19,auVar19,0xaa);
      auVar243._0_4_ = auVar195._0_4_ * fVar227 + auVar19._0_4_ * fVar240 + auVar18._0_4_ * fVar237;
      auVar243._4_4_ = auVar195._4_4_ * fVar190 + auVar19._4_4_ * fVar247 + auVar18._4_4_ * fVar205;
      auVar243._8_4_ = auVar195._8_4_ * fVar236 + auVar19._8_4_ * fVar249 + auVar18._8_4_ * fVar238;
      auVar243._12_4_ =
           auVar195._12_4_ * fVar203 + auVar19._12_4_ * fVar251 + auVar18._12_4_ * fVar207;
      auVar195 = vblendps_avx(auVar243,_local_540,8);
      auVar194._8_4_ = 0x7fffffff;
      auVar194._0_8_ = 0x7fffffff7fffffff;
      auVar194._12_4_ = 0x7fffffff;
      auVar231 = vandps_avx(auVar231,auVar194);
      auVar182 = vandps_avx(auVar182,auVar194);
      auVar18 = vmaxps_avx(auVar231,auVar182);
      auVar231 = vandps_avx(auVar196,auVar194);
      auVar182 = vandps_avx(auVar195,auVar194);
      auVar231 = vmaxps_avx(auVar231,auVar182);
      auVar231 = vmaxps_avx(auVar18,auVar231);
      auVar182 = vmovshdup_avx(auVar231);
      auVar182 = vmaxss_avx(auVar182,auVar231);
      auVar231 = vshufpd_avx(auVar231,auVar231,1);
      auVar231 = vmaxss_avx(auVar231,auVar182);
      local_640._0_4_ = auVar231._0_4_;
      lVar126 = (long)(int)uVar12 * 0x44;
      fVar227 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar126 + 0x908);
      fVar190 = *(float *)(bspline_basis0 + lVar126 + 0x90c);
      fVar236 = *(float *)(bspline_basis0 + lVar126 + 0x910);
      fVar203 = *(float *)(bspline_basis0 + lVar126 + 0x914);
      fVar237 = *(float *)(bspline_basis0 + lVar126 + 0x918);
      fVar205 = *(float *)(bspline_basis0 + lVar126 + 0x91c);
      fVar238 = *(float *)(bspline_basis0 + lVar126 + 0x920);
      auVar118 = *(undefined1 (*) [28])(bspline_basis0 + lVar126 + 0x908);
      auVar182 = vshufps_avx(auVar216,auVar216,0);
      register0x00001250 = auVar182;
      _local_560 = auVar182;
      auVar196 = vshufps_avx(auVar216,auVar216,0x55);
      register0x00001350 = auVar196;
      _local_5c0 = auVar196;
      fVar207 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar126 + 0xd8c);
      fVar240 = *(float *)(bspline_basis0 + lVar126 + 0xd90);
      fVar247 = *(float *)(bspline_basis0 + lVar126 + 0xd94);
      fVar249 = *(float *)(bspline_basis0 + lVar126 + 0xd98);
      fVar251 = *(float *)(bspline_basis0 + lVar126 + 0xd9c);
      fVar308 = *(float *)(bspline_basis0 + lVar126 + 0xda0);
      fVar188 = *(float *)(bspline_basis0 + lVar126 + 0xda4);
      auVar117 = *(undefined1 (*) [28])(bspline_basis0 + lVar126 + 0xd8c);
      auVar195 = vshufps_avx(auVar243,auVar243,0);
      register0x000015d0 = auVar195;
      _local_3e0 = auVar195;
      auVar18 = vshufps_avx(auVar243,auVar243,0x55);
      register0x00001390 = auVar18;
      _local_6e0 = auVar18;
      fVar322 = auVar195._0_4_;
      fVar325 = auVar195._4_4_;
      fVar326 = auVar195._8_4_;
      fVar327 = auVar195._12_4_;
      fVar154 = auVar182._0_4_;
      fVar156 = auVar182._4_4_;
      fVar158 = auVar182._8_4_;
      fVar161 = auVar182._12_4_;
      fVar241 = auVar18._0_4_;
      fVar248 = auVar18._4_4_;
      fVar250 = auVar18._8_4_;
      fVar252 = auVar18._12_4_;
      fVar228 = auVar196._0_4_;
      fVar133 = auVar196._4_4_;
      fVar150 = auVar196._8_4_;
      fVar152 = auVar196._12_4_;
      auVar164 = _local_530;
      auVar182 = vshufps_avx(_local_530,_local_530,0xff);
      register0x00001490 = auVar182;
      _local_120 = auVar182;
      auVar19 = _local_540;
      auVar196 = vshufps_avx(_local_540,_local_540,0xff);
      register0x00001410 = auVar196;
      _local_140 = auVar196;
      fVar226 = auVar196._0_4_;
      fVar224 = auVar196._4_4_;
      fVar225 = auVar196._8_4_;
      fVar263 = auVar196._12_4_;
      fVar283 = auVar182._0_4_;
      fVar285 = auVar182._4_4_;
      fVar287 = auVar182._8_4_;
      auVar108._8_4_ = auVar215._8_4_;
      auVar108._0_8_ = auVar215._0_8_;
      auVar108._12_4_ = auVar215._12_4_;
      auVar196 = vshufps_avx(auVar108,auVar108,0);
      register0x00001550 = auVar196;
      _local_80 = auVar196;
      fVar159 = *(float *)(bspline_basis0 + lVar126 + 0x484);
      fVar295 = *(float *)(bspline_basis0 + lVar126 + 0x488);
      fVar296 = *(float *)(bspline_basis0 + lVar126 + 0x48c);
      fVar162 = *(float *)(bspline_basis0 + lVar126 + 0x490);
      fVar297 = *(float *)(bspline_basis0 + lVar126 + 0x494);
      fVar239 = *(float *)(bspline_basis0 + lVar126 + 0x498);
      fVar299 = *(float *)(bspline_basis0 + lVar126 + 0x49c);
      fVar309 = auVar196._0_4_;
      fVar313 = auVar196._4_4_;
      fVar314 = auVar196._8_4_;
      fVar315 = auVar196._12_4_;
      auVar196 = vshufps_avx(auVar108,auVar108,0x55);
      register0x00001350 = auVar196;
      _local_1c0 = auVar196;
      fVar209 = auVar196._0_4_;
      fVar210 = auVar196._4_4_;
      fVar269 = auVar196._8_4_;
      fVar253 = auVar196._12_4_;
      auVar196 = vpermilps_avx(_local_600,0xff);
      register0x00001590 = auVar196;
      _local_a0 = auVar196;
      fVar316 = auVar196._0_4_;
      fVar317 = auVar196._4_4_;
      fVar319 = auVar196._8_4_;
      fVar320 = auVar196._12_4_;
      auVar196 = vshufps_avx(auVar214,auVar214,0);
      local_1e0._16_16_ = auVar196;
      local_1e0._0_16_ = auVar196;
      fVar298 = *(float *)(bspline_basis0 + lVar126);
      fVar153 = *(float *)(bspline_basis0 + lVar126 + 4);
      fVar155 = *(float *)(bspline_basis0 + lVar126 + 8);
      fVar157 = *(float *)(bspline_basis0 + lVar126 + 0xc);
      fStack_450 = *(float *)(bspline_basis0 + lVar126 + 0x10);
      fStack_44c = *(float *)(bspline_basis0 + lVar126 + 0x14);
      fStack_448 = *(float *)(bspline_basis0 + lVar126 + 0x18);
      fVar191 = auVar196._0_4_;
      fVar204 = auVar196._4_4_;
      fVar206 = auVar196._8_4_;
      fVar208 = auVar196._12_4_;
      auVar294._0_4_ = fVar191 * fVar298 + fVar309 * fVar159 + fVar154 * fVar227 + fVar322 * fVar207
      ;
      auVar294._4_4_ = fVar204 * fVar153 + fVar313 * fVar295 + fVar156 * fVar190 + fVar325 * fVar240
      ;
      auVar294._8_4_ = fVar206 * fVar155 + fVar314 * fVar296 + fVar158 * fVar236 + fVar326 * fVar247
      ;
      auVar294._12_4_ =
           fVar208 * fVar157 + fVar315 * fVar162 + fVar161 * fVar203 + fVar327 * fVar249;
      auVar294._16_4_ =
           fVar191 * fStack_450 + fVar309 * fVar297 + fVar154 * fVar237 + fVar322 * fVar251;
      auVar294._20_4_ =
           fVar204 * fStack_44c + fVar313 * fVar239 + fVar156 * fVar205 + fVar325 * fVar308;
      auVar294._24_4_ =
           fVar206 * fStack_448 + fVar314 * fVar299 + fVar158 * fVar238 + fVar326 * fVar188;
      auVar294._28_4_ = fVar161 + 0.0 + 0.0 + 0.0;
      auVar196 = vshufps_avx(auVar214,auVar214,0x55);
      register0x00001510 = auVar196;
      _local_200 = auVar196;
      fVar289 = auVar196._0_4_;
      fVar305 = auVar196._4_4_;
      fVar306 = auVar196._8_4_;
      fVar307 = auVar196._12_4_;
      auVar244._0_4_ = fVar289 * fVar298 + fVar209 * fVar159 + fVar228 * fVar227 + fVar241 * fVar207
      ;
      auVar244._4_4_ = fVar305 * fVar153 + fVar210 * fVar295 + fVar133 * fVar190 + fVar248 * fVar240
      ;
      auVar244._8_4_ = fVar306 * fVar155 + fVar269 * fVar296 + fVar150 * fVar236 + fVar250 * fVar247
      ;
      auVar244._12_4_ =
           fVar307 * fVar157 + fVar253 * fVar162 + fVar152 * fVar203 + fVar252 * fVar249;
      auVar244._16_4_ =
           fVar289 * fStack_450 + fVar209 * fVar297 + fVar228 * fVar237 + fVar241 * fVar251;
      auVar244._20_4_ =
           fVar305 * fStack_44c + fVar210 * fVar239 + fVar133 * fVar205 + fVar248 * fVar308;
      auVar244._24_4_ =
           fVar306 * fStack_448 + fVar269 * fVar299 + fVar150 * fVar238 + fVar250 * fVar188;
      auVar244._28_4_ = fVar161 + 0.0 + 0.0 + 0.0;
      auVar196 = vpermilps_avx(_local_7c0,0xff);
      register0x00001450 = auVar196;
      _local_160 = auVar196;
      fStack_444 = *(float *)(bspline_basis0 + lVar126 + 0x1c);
      fVar270 = auVar196._0_4_;
      fVar278 = auVar196._4_4_;
      fVar280 = auVar196._8_4_;
      local_780._0_4_ =
           fVar270 * fVar298 + fVar316 * fVar159 + fVar283 * fVar227 + fVar226 * fVar207;
      local_780._4_4_ =
           fVar278 * fVar153 + fVar317 * fVar295 + fVar285 * fVar190 + fVar224 * fVar240;
      fStack_778 = fVar280 * fVar155 + fVar319 * fVar296 + fVar287 * fVar236 + fVar225 * fVar247;
      fStack_774 = auVar196._12_4_ * fVar157 +
                   fVar320 * fVar162 + auVar182._12_4_ * fVar203 + fVar263 * fVar249;
      fStack_770 = fVar270 * fStack_450 + fVar316 * fVar297 + fVar283 * fVar237 + fVar226 * fVar251;
      fStack_76c = fVar278 * fStack_44c + fVar317 * fVar239 + fVar285 * fVar205 + fVar224 * fVar308;
      fStack_768 = fVar280 * fStack_448 + fVar319 * fVar299 + fVar287 * fVar238 + fVar225 * fVar188;
      fStack_764 = *(float *)(bspline_basis0 + lVar126 + 0x924) + 0.0 + 0.0 + 0.0;
      fVar207 = *(float *)(bspline_basis1 + lVar126 + 0x908);
      fVar240 = *(float *)(bspline_basis1 + lVar126 + 0x90c);
      fVar247 = *(float *)(bspline_basis1 + lVar126 + 0x910);
      fVar249 = *(float *)(bspline_basis1 + lVar126 + 0x914);
      fVar251 = *(float *)(bspline_basis1 + lVar126 + 0x918);
      fVar308 = *(float *)(bspline_basis1 + lVar126 + 0x91c);
      fVar188 = *(float *)(bspline_basis1 + lVar126 + 0x920);
      fVar227 = *(float *)*(undefined1 (*) [28])(bspline_basis1 + lVar126 + 0xd8c);
      fVar190 = *(float *)(bspline_basis1 + lVar126 + 0xd90);
      fVar236 = *(float *)(bspline_basis1 + lVar126 + 0xd94);
      fVar203 = *(float *)(bspline_basis1 + lVar126 + 0xd98);
      fVar237 = *(float *)(bspline_basis1 + lVar126 + 0xd9c);
      fVar205 = *(float *)(bspline_basis1 + lVar126 + 0xda0);
      fVar238 = *(float *)(bspline_basis1 + lVar126 + 0xda4);
      auVar119 = *(undefined1 (*) [28])(bspline_basis1 + lVar126 + 0xd8c);
      fVar160 = *(float *)(bspline_basis1 + lVar126 + 0x484);
      fVar271 = *(float *)(bspline_basis1 + lVar126 + 0x488);
      fVar279 = *(float *)(bspline_basis1 + lVar126 + 0x48c);
      fVar281 = *(float *)(bspline_basis1 + lVar126 + 0x490);
      fVar282 = *(float *)(bspline_basis1 + lVar126 + 0x494);
      fVar284 = *(float *)(bspline_basis1 + lVar126 + 0x498);
      fVar286 = *(float *)(bspline_basis1 + lVar126 + 0x49c);
      fVar189 = fVar315 + 0.0;
      fVar288 = *(float *)(bspline_basis1 + lVar126);
      fVar268 = *(float *)(bspline_basis1 + lVar126 + 4);
      fVar211 = *(float *)(bspline_basis1 + lVar126 + 8);
      fVar174 = *(float *)(bspline_basis1 + lVar126 + 0xc);
      fVar290 = *(float *)(bspline_basis1 + lVar126 + 0x10);
      fVar149 = *(float *)(bspline_basis1 + lVar126 + 0x14);
      fVar151 = *(float *)(bspline_basis1 + lVar126 + 0x18);
      auVar218._0_4_ = fVar288 * fVar191 + fVar309 * fVar160 + fVar207 * fVar154 + fVar322 * fVar227
      ;
      auVar218._4_4_ = fVar268 * fVar204 + fVar313 * fVar271 + fVar240 * fVar156 + fVar325 * fVar190
      ;
      auVar218._8_4_ = fVar211 * fVar206 + fVar314 * fVar279 + fVar247 * fVar158 + fVar326 * fVar236
      ;
      auVar218._12_4_ =
           fVar174 * fVar208 + fVar315 * fVar281 + fVar249 * fVar161 + fVar327 * fVar203;
      auVar218._16_4_ =
           fVar290 * fVar191 + fVar309 * fVar282 + fVar251 * fVar154 + fVar322 * fVar237;
      auVar218._20_4_ =
           fVar149 * fVar204 + fVar313 * fVar284 + fVar308 * fVar156 + fVar325 * fVar205;
      auVar218._24_4_ =
           fVar151 * fVar206 + fVar314 * fVar286 + fVar188 * fVar158 + fVar326 * fVar238;
      auVar218._28_4_ = fVar320 + fVar189;
      local_220._0_4_ =
           fVar289 * fVar288 + fVar209 * fVar160 + fVar207 * fVar228 + fVar227 * fVar241;
      local_220._4_4_ =
           fVar305 * fVar268 + fVar210 * fVar271 + fVar240 * fVar133 + fVar190 * fVar248;
      fStack_218 = fVar306 * fVar211 + fVar269 * fVar279 + fVar247 * fVar150 + fVar236 * fVar250;
      fStack_214 = fVar307 * fVar174 + fVar253 * fVar281 + fVar249 * fVar152 + fVar203 * fVar252;
      fStack_210 = fVar289 * fVar290 + fVar209 * fVar282 + fVar251 * fVar228 + fVar237 * fVar241;
      fStack_20c = fVar305 * fVar149 + fVar210 * fVar284 + fVar308 * fVar133 + fVar205 * fVar248;
      fStack_208 = fVar306 * fVar151 + fVar269 * fVar286 + fVar188 * fVar150 + fVar238 * fVar250;
      register0x000012dc = fVar189 + fVar315 + 0.0;
      local_6a0._0_4_ =
           fVar316 * fVar160 + fVar283 * fVar207 + fVar226 * fVar227 + fVar270 * fVar288;
      local_6a0._4_4_ =
           fVar317 * fVar271 + fVar285 * fVar240 + fVar224 * fVar190 + fVar278 * fVar268;
      fStack_698 = fVar319 * fVar279 + fVar287 * fVar247 + fVar225 * fVar236 + fVar280 * fVar211;
      fStack_694 = fVar320 * fVar281 + auVar182._12_4_ * fVar249 + fVar263 * fVar203 +
                   auVar196._12_4_ * fVar174;
      register0x000015d0 =
           fVar316 * fVar282 + fVar283 * fVar251 + fVar226 * fVar237 + fVar270 * fVar290;
      register0x000015d4 =
           fVar317 * fVar284 + fVar285 * fVar308 + fVar224 * fVar205 + fVar278 * fVar149;
      register0x000015d8 =
           fVar319 * fVar286 + fVar287 * fVar188 + fVar225 * fVar238 + fVar280 * fVar151;
      register0x000015dc = fVar315 + fVar263 + 0.0 + fVar189;
      auVar20 = vsubps_avx(auVar218,auVar294);
      auVar21 = vsubps_avx(_local_220,auVar244);
      fVar226 = auVar20._0_4_;
      fVar224 = auVar20._4_4_;
      auVar17._4_4_ = fVar224 * auVar244._4_4_;
      auVar17._0_4_ = fVar226 * auVar244._0_4_;
      fVar225 = auVar20._8_4_;
      auVar17._8_4_ = fVar225 * auVar244._8_4_;
      fVar263 = auVar20._12_4_;
      auVar17._12_4_ = fVar263 * auVar244._12_4_;
      fVar270 = auVar20._16_4_;
      auVar17._16_4_ = fVar270 * auVar244._16_4_;
      fVar278 = auVar20._20_4_;
      auVar17._20_4_ = fVar278 * auVar244._20_4_;
      fVar280 = auVar20._24_4_;
      auVar17._24_4_ = fVar280 * auVar244._24_4_;
      auVar17._28_4_ = fVar189;
      fVar227 = auVar21._0_4_;
      fVar190 = auVar21._4_4_;
      auVar22._4_4_ = auVar294._4_4_ * fVar190;
      auVar22._0_4_ = auVar294._0_4_ * fVar227;
      fVar236 = auVar21._8_4_;
      auVar22._8_4_ = auVar294._8_4_ * fVar236;
      fVar203 = auVar21._12_4_;
      auVar22._12_4_ = auVar294._12_4_ * fVar203;
      fVar237 = auVar21._16_4_;
      auVar22._16_4_ = auVar294._16_4_ * fVar237;
      fVar205 = auVar21._20_4_;
      auVar22._20_4_ = auVar294._20_4_ * fVar205;
      fVar238 = auVar21._24_4_;
      auVar22._24_4_ = auVar294._24_4_ * fVar238;
      auVar22._28_4_ = register0x000012dc;
      auVar22 = vsubps_avx(auVar17,auVar22);
      auVar17 = vmaxps_avx(_local_780,_local_6a0);
      auVar27._4_4_ = auVar17._4_4_ * auVar17._4_4_ * (fVar224 * fVar224 + fVar190 * fVar190);
      auVar27._0_4_ = auVar17._0_4_ * auVar17._0_4_ * (fVar226 * fVar226 + fVar227 * fVar227);
      auVar27._8_4_ = auVar17._8_4_ * auVar17._8_4_ * (fVar225 * fVar225 + fVar236 * fVar236);
      auVar27._12_4_ = auVar17._12_4_ * auVar17._12_4_ * (fVar263 * fVar263 + fVar203 * fVar203);
      auVar27._16_4_ = auVar17._16_4_ * auVar17._16_4_ * (fVar270 * fVar270 + fVar237 * fVar237);
      auVar27._20_4_ = auVar17._20_4_ * auVar17._20_4_ * (fVar278 * fVar278 + fVar205 * fVar205);
      auVar27._24_4_ = auVar17._24_4_ * auVar17._24_4_ * (fVar280 * fVar280 + fVar238 * fVar238);
      auVar27._28_4_ = auVar21._28_4_ + register0x000012dc;
      auVar15._4_4_ = auVar22._4_4_ * auVar22._4_4_;
      auVar15._0_4_ = auVar22._0_4_ * auVar22._0_4_;
      auVar15._8_4_ = auVar22._8_4_ * auVar22._8_4_;
      auVar15._12_4_ = auVar22._12_4_ * auVar22._12_4_;
      auVar15._16_4_ = auVar22._16_4_ * auVar22._16_4_;
      auVar15._20_4_ = auVar22._20_4_ * auVar22._20_4_;
      auVar15._24_4_ = auVar22._24_4_ * auVar22._24_4_;
      auVar15._28_4_ = auVar22._28_4_;
      auVar17 = vcmpps_avx(auVar15,auVar27,2);
      auVar182 = ZEXT416((uint)(float)(int)uVar12);
      _local_400 = auVar182;
      auVar182 = vshufps_avx(auVar182,auVar182,0);
      auVar198._16_16_ = auVar182;
      auVar198._0_16_ = auVar182;
      auVar22 = vcmpps_avx(_DAT_02020f40,auVar198,1);
      auVar202 = ZEXT3264(auVar22);
      auVar182 = vpermilps_avx(auVar214,0xaa);
      register0x00001450 = auVar182;
      _local_4e0 = auVar182;
      auVar109._8_4_ = auVar215._8_4_;
      auVar109._0_8_ = auVar215._0_8_;
      auVar109._12_4_ = auVar215._12_4_;
      auVar196 = vpermilps_avx(auVar109,0xaa);
      register0x00001550 = auVar196;
      _local_180 = auVar196;
      auVar195 = vpermilps_avx(auVar216,0xaa);
      register0x00001590 = auVar195;
      _local_c0 = auVar195;
      auVar18 = vpermilps_avx(auVar243,0xaa);
      register0x00001310 = auVar18;
      _local_580 = auVar18;
      auVar27 = auVar22 & auVar17;
      local_620 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      fStack_61c = 0.0;
      fStack_618 = 0.0;
      fStack_614 = 0.0;
      auVar231 = ZEXT416((uint)(auVar231._0_4_ * 4.7683716e-07));
      fVar227 = fVar228;
      fVar190 = fVar133;
      fVar236 = fVar150;
      fVar203 = fVar241;
      fVar237 = fVar248;
      fVar205 = fVar250;
      fVar238 = fVar252;
      if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar27 >> 0x7f,0) == '\0') &&
            (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar27 >> 0xbf,0) == '\0') &&
          (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar27[0x1f])
      {
        auVar267 = ZEXT3264(local_700);
        auVar277 = ZEXT3264(local_720);
      }
      else {
        local_240 = vandps_avx(auVar17,auVar22);
        fVar263 = auVar182._0_4_;
        fVar270 = auVar182._4_4_;
        fVar278 = auVar182._8_4_;
        fVar280 = auVar182._12_4_;
        fVar283 = auVar196._0_4_;
        fVar285 = auVar196._4_4_;
        fVar287 = auVar196._8_4_;
        fVar316 = auVar196._12_4_;
        fVar317 = auVar195._0_4_;
        fVar319 = auVar195._4_4_;
        fVar320 = auVar195._8_4_;
        fVar321 = auVar195._12_4_;
        local_480._0_4_ = auVar119._0_4_;
        local_480._4_4_ = auVar119._4_4_;
        fStack_478 = auVar119._8_4_;
        fStack_474 = auVar119._12_4_;
        fStack_470 = auVar119._16_4_;
        fStack_46c = auVar119._20_4_;
        fStack_468 = auVar119._24_4_;
        fVar189 = auVar18._0_4_;
        fVar226 = auVar18._4_4_;
        fVar224 = auVar18._8_4_;
        fVar225 = auVar18._12_4_;
        local_480._0_4_ =
             fVar263 * fVar288 +
             fVar283 * fVar160 + fVar317 * fVar207 + fVar189 * (float)local_480._0_4_;
        local_480._4_4_ =
             fVar270 * fVar268 +
             fVar285 * fVar271 + fVar319 * fVar240 + fVar226 * (float)local_480._4_4_;
        fStack_478 = fVar278 * fVar211 +
                     fVar287 * fVar279 + fVar320 * fVar247 + fVar224 * fStack_478;
        fStack_474 = fVar280 * fVar174 +
                     fVar316 * fVar281 + fVar321 * fVar249 + fVar225 * fStack_474;
        fStack_470 = fVar263 * fVar290 +
                     fVar283 * fVar282 + fVar317 * fVar251 + fVar189 * fStack_470;
        fStack_46c = fVar270 * fVar149 +
                     fVar285 * fVar284 + fVar319 * fVar308 + fVar226 * fStack_46c;
        fStack_468 = fVar278 * fVar151 +
                     fVar287 * fVar286 + fVar320 * fVar188 + fVar224 * fStack_468;
        fStack_464 = local_240._28_4_ +
                     auVar22._28_4_ + *(float *)(bspline_basis1 + lVar126 + 0x924) + 0.0;
        local_440._0_4_ = auVar118._0_4_;
        local_440._4_4_ = auVar118._4_4_;
        fStack_438 = auVar118._8_4_;
        fStack_434 = auVar118._12_4_;
        fStack_430 = auVar118._16_4_;
        fStack_42c = auVar118._20_4_;
        fStack_428 = auVar118._24_4_;
        local_5a0._0_4_ = auVar117._0_4_;
        local_5a0._4_4_ = auVar117._4_4_;
        fStack_598 = auVar117._8_4_;
        fStack_594 = auVar117._12_4_;
        fStack_590 = auVar117._16_4_;
        fStack_58c = auVar117._20_4_;
        fStack_588 = auVar117._24_4_;
        local_440._0_4_ =
             fVar263 * fVar298 +
             fVar283 * fVar159 + fVar317 * (float)local_440._0_4_ + fVar189 * (float)local_5a0._0_4_
        ;
        local_440._4_4_ =
             fVar270 * fVar153 +
             fVar285 * fVar295 + fVar319 * (float)local_440._4_4_ + fVar226 * (float)local_5a0._4_4_
        ;
        fStack_438 = fVar278 * fVar155 +
                     fVar287 * fVar296 + fVar320 * fStack_438 + fVar224 * fStack_598;
        fStack_434 = fVar280 * fVar157 +
                     fVar316 * fVar162 + fVar321 * fStack_434 + fVar225 * fStack_594;
        fStack_430 = fVar263 * fStack_450 +
                     fVar283 * fVar297 + fVar317 * fStack_430 + fVar189 * fStack_590;
        fStack_42c = fVar270 * fStack_44c +
                     fVar285 * fVar239 + fVar319 * fStack_42c + fVar226 * fStack_58c;
        fStack_428 = fVar278 * fStack_448 +
                     fVar287 * fVar299 + fVar320 * fStack_428 + fVar224 * fStack_588;
        fStack_424 = fVar307 + fStack_464 + local_240._28_4_ + auVar22._28_4_;
        fVar207 = *(float *)(bspline_basis0 + lVar126 + 0x1210);
        fVar240 = *(float *)(bspline_basis0 + lVar126 + 0x1214);
        fVar247 = *(float *)(bspline_basis0 + lVar126 + 0x1218);
        fVar249 = *(float *)(bspline_basis0 + lVar126 + 0x121c);
        fVar251 = *(float *)(bspline_basis0 + lVar126 + 0x1220);
        fVar308 = *(float *)(bspline_basis0 + lVar126 + 0x1224);
        fVar188 = *(float *)(bspline_basis0 + lVar126 + 0x1228);
        fVar159 = *(float *)(bspline_basis0 + lVar126 + 0x1694);
        fVar295 = *(float *)(bspline_basis0 + lVar126 + 0x1698);
        fVar296 = *(float *)(bspline_basis0 + lVar126 + 0x169c);
        fVar162 = *(float *)(bspline_basis0 + lVar126 + 0x16a0);
        fVar297 = *(float *)(bspline_basis0 + lVar126 + 0x16a4);
        fVar239 = *(float *)(bspline_basis0 + lVar126 + 0x16a8);
        fVar299 = *(float *)(bspline_basis0 + lVar126 + 0x16ac);
        fVar298 = *(float *)(bspline_basis0 + lVar126 + 0x1b18);
        fVar153 = *(float *)(bspline_basis0 + lVar126 + 0x1b1c);
        fVar155 = *(float *)(bspline_basis0 + lVar126 + 0x1b20);
        fVar157 = *(float *)(bspline_basis0 + lVar126 + 0x1b24);
        fVar160 = *(float *)(bspline_basis0 + lVar126 + 0x1b28);
        fVar271 = *(float *)(bspline_basis0 + lVar126 + 0x1b2c);
        fVar279 = *(float *)(bspline_basis0 + lVar126 + 0x1b30);
        fVar281 = *(float *)(bspline_basis0 + lVar126 + 0x1f9c);
        fVar282 = *(float *)(bspline_basis0 + lVar126 + 0x1fa0);
        fVar284 = *(float *)(bspline_basis0 + lVar126 + 0x1fa4);
        fVar286 = *(float *)(bspline_basis0 + lVar126 + 0x1fa8);
        fVar288 = *(float *)(bspline_basis0 + lVar126 + 0x1fac);
        fVar268 = *(float *)(bspline_basis0 + lVar126 + 0x1fb0);
        fVar211 = *(float *)(bspline_basis0 + lVar126 + 0x1fb4);
        local_640._16_16_ = auVar234._16_16_;
        local_640._0_16_ = auVar231;
        fVar174 = *(float *)(bspline_basis0 + lVar126 + 0x1b34) +
                  *(float *)(bspline_basis0 + lVar126 + 0x1fb8);
        fVar290 = *(float *)(bspline_basis0 + lVar126 + 0x16b0) + fVar174;
        local_520 = fVar191 * fVar207 + fVar309 * fVar159 + fVar154 * fVar298 + fVar322 * fVar281;
        fStack_51c = fVar204 * fVar240 + fVar313 * fVar295 + fVar156 * fVar153 + fVar325 * fVar282;
        fStack_518 = fVar206 * fVar247 + fVar314 * fVar296 + fVar158 * fVar155 + fVar326 * fVar284;
        fStack_514 = fVar208 * fVar249 + fVar315 * fVar162 + fVar161 * fVar157 + fVar327 * fVar286;
        fStack_510 = fVar191 * fVar251 + fVar309 * fVar297 + fVar154 * fVar160 + fVar322 * fVar288;
        fStack_50c = fVar204 * fVar308 + fVar313 * fVar239 + fVar156 * fVar271 + fVar325 * fVar268;
        fStack_508 = fVar206 * fVar188 + fVar314 * fVar299 + fVar158 * fVar279 + fVar326 * fVar211;
        fStack_504 = *(float *)(bspline_basis0 + lVar126 + 0x16b0) +
                     *(float *)(bspline_basis0 + lVar126 + 0x1fb8) +
                     fVar280 + *(float *)(bspline_basis1 + lVar126 + 0x4a0);
        auVar257._0_4_ =
             fVar289 * fVar207 + fVar228 * fVar298 + fVar241 * fVar281 + fVar209 * fVar159;
        auVar257._4_4_ =
             fVar305 * fVar240 + fVar133 * fVar153 + fVar248 * fVar282 + fVar210 * fVar295;
        auVar257._8_4_ =
             fVar306 * fVar247 + fVar150 * fVar155 + fVar250 * fVar284 + fVar269 * fVar296;
        auVar257._12_4_ =
             fVar307 * fVar249 + fVar152 * fVar157 + fVar252 * fVar286 + fVar253 * fVar162;
        auVar257._16_4_ =
             fVar289 * fVar251 + fVar228 * fVar160 + fVar241 * fVar288 + fVar209 * fVar297;
        auVar257._20_4_ =
             fVar305 * fVar308 + fVar133 * fVar271 + fVar248 * fVar268 + fVar210 * fVar239;
        auVar257._24_4_ =
             fVar306 * fVar188 + fVar150 * fVar279 + fVar250 * fVar211 + fVar269 * fVar299;
        auVar257._28_4_ =
             fVar174 + fVar280 + *(float *)(bspline_basis1 + lVar126 + 0x1c) +
                       fVar280 + *(float *)(bspline_basis1 + lVar126 + 0x4a0);
        local_460 = fVar283 * fVar159 + fVar317 * fVar298 + fVar189 * fVar281 + fVar263 * fVar207;
        fStack_45c = fVar285 * fVar295 + fVar319 * fVar153 + fVar226 * fVar282 + fVar270 * fVar240;
        fStack_458 = fVar287 * fVar296 + fVar320 * fVar155 + fVar224 * fVar284 + fVar278 * fVar247;
        fStack_454 = fVar316 * fVar162 + fVar321 * fVar157 + fVar225 * fVar286 + fVar280 * fVar249;
        fStack_450 = fVar283 * fVar297 + fVar317 * fVar160 + fVar189 * fVar288 + fVar263 * fVar251;
        fStack_44c = fVar285 * fVar239 + fVar319 * fVar271 + fVar226 * fVar268 + fVar270 * fVar308;
        fStack_448 = fVar287 * fVar299 + fVar320 * fVar279 + fVar224 * fVar211 + fVar278 * fVar188;
        fStack_444 = fVar290 + *(float *)(bspline_basis0 + lVar126 + 0x122c);
        fVar207 = *(float *)(bspline_basis1 + lVar126 + 0x1b18);
        fVar240 = *(float *)(bspline_basis1 + lVar126 + 0x1b1c);
        fVar247 = *(float *)(bspline_basis1 + lVar126 + 0x1b20);
        fVar249 = *(float *)(bspline_basis1 + lVar126 + 0x1b24);
        fVar251 = *(float *)(bspline_basis1 + lVar126 + 0x1b28);
        fVar308 = *(float *)(bspline_basis1 + lVar126 + 0x1b2c);
        fVar188 = *(float *)(bspline_basis1 + lVar126 + 0x1b30);
        fVar159 = *(float *)(bspline_basis1 + lVar126 + 0x1f9c);
        fVar295 = *(float *)(bspline_basis1 + lVar126 + 0x1fa0);
        fVar296 = *(float *)(bspline_basis1 + lVar126 + 0x1fa4);
        fVar162 = *(float *)(bspline_basis1 + lVar126 + 0x1fa8);
        fVar297 = *(float *)(bspline_basis1 + lVar126 + 0x1fac);
        fVar239 = *(float *)(bspline_basis1 + lVar126 + 0x1fb0);
        fVar299 = *(float *)(bspline_basis1 + lVar126 + 0x1fb4);
        fVar298 = *(float *)(bspline_basis1 + lVar126 + 0x1694);
        fVar153 = *(float *)(bspline_basis1 + lVar126 + 0x1698);
        fVar155 = *(float *)(bspline_basis1 + lVar126 + 0x169c);
        fVar157 = *(float *)(bspline_basis1 + lVar126 + 0x16a0);
        fVar160 = *(float *)(bspline_basis1 + lVar126 + 0x16a4);
        fVar271 = *(float *)(bspline_basis1 + lVar126 + 0x16a8);
        fVar279 = *(float *)(bspline_basis1 + lVar126 + 0x16ac);
        fVar281 = *(float *)(bspline_basis1 + lVar126 + 0x1210);
        fVar282 = *(float *)(bspline_basis1 + lVar126 + 0x1214);
        fVar284 = *(float *)(bspline_basis1 + lVar126 + 0x1218);
        fVar286 = *(float *)(bspline_basis1 + lVar126 + 0x121c);
        fVar288 = *(float *)(bspline_basis1 + lVar126 + 0x1220);
        fVar268 = *(float *)(bspline_basis1 + lVar126 + 0x1224);
        fVar211 = *(float *)(bspline_basis1 + lVar126 + 0x1228);
        auVar265._0_4_ =
             fVar191 * fVar281 + fVar309 * fVar298 + fVar154 * fVar207 + fVar322 * fVar159;
        auVar265._4_4_ =
             fVar204 * fVar282 + fVar313 * fVar153 + fVar156 * fVar240 + fVar325 * fVar295;
        auVar265._8_4_ =
             fVar206 * fVar284 + fVar314 * fVar155 + fVar158 * fVar247 + fVar326 * fVar296;
        auVar265._12_4_ =
             fVar208 * fVar286 + fVar315 * fVar157 + fVar161 * fVar249 + fVar327 * fVar162;
        auVar265._16_4_ =
             fVar191 * fVar288 + fVar309 * fVar160 + fVar154 * fVar251 + fVar322 * fVar297;
        auVar265._20_4_ =
             fVar204 * fVar268 + fVar313 * fVar271 + fVar156 * fVar308 + fVar325 * fVar239;
        auVar265._24_4_ =
             fVar206 * fVar211 + fVar314 * fVar279 + fVar158 * fVar188 + fVar326 * fVar299;
        auVar265._28_4_ = fVar152 + fVar152 + fVar290 + fVar327;
        auVar273._0_4_ =
             fVar289 * fVar281 + fVar209 * fVar298 + fVar228 * fVar207 + fVar241 * fVar159;
        auVar273._4_4_ =
             fVar305 * fVar282 + fVar210 * fVar153 + fVar133 * fVar240 + fVar248 * fVar295;
        auVar273._8_4_ =
             fVar306 * fVar284 + fVar269 * fVar155 + fVar150 * fVar247 + fVar250 * fVar296;
        auVar273._12_4_ =
             fVar307 * fVar286 + fVar253 * fVar157 + fVar152 * fVar249 + fVar252 * fVar162;
        auVar273._16_4_ =
             fVar289 * fVar288 + fVar209 * fVar160 + fVar228 * fVar251 + fVar241 * fVar297;
        auVar273._20_4_ =
             fVar305 * fVar268 + fVar210 * fVar271 + fVar133 * fVar308 + fVar248 * fVar239;
        auVar273._24_4_ =
             fVar306 * fVar211 + fVar269 * fVar279 + fVar150 * fVar188 + fVar250 * fVar299;
        auVar273._28_4_ = fVar152 + fVar152 + fVar152 + fVar290;
        auVar186._0_4_ =
             fVar263 * fVar281 + fVar283 * fVar298 + fVar317 * fVar207 + fVar189 * fVar159;
        auVar186._4_4_ =
             fVar270 * fVar282 + fVar285 * fVar153 + fVar319 * fVar240 + fVar226 * fVar295;
        auVar186._8_4_ =
             fVar278 * fVar284 + fVar287 * fVar155 + fVar320 * fVar247 + fVar224 * fVar296;
        auVar186._12_4_ =
             fVar280 * fVar286 + fVar316 * fVar157 + fVar321 * fVar249 + fVar225 * fVar162;
        auVar186._16_4_ =
             fVar263 * fVar288 + fVar283 * fVar160 + fVar317 * fVar251 + fVar189 * fVar297;
        auVar186._20_4_ =
             fVar270 * fVar268 + fVar285 * fVar271 + fVar319 * fVar308 + fVar226 * fVar239;
        auVar186._24_4_ =
             fVar278 * fVar211 + fVar287 * fVar279 + fVar320 * fVar188 + fVar224 * fVar299;
        auVar186._28_4_ =
             *(float *)(bspline_basis1 + lVar126 + 0x122c) +
             *(float *)(bspline_basis1 + lVar126 + 0x16b0) +
             *(float *)(bspline_basis1 + lVar126 + 0x1b34) +
             *(float *)(bspline_basis1 + lVar126 + 0x1fb8);
        auVar219._8_4_ = 0x7fffffff;
        auVar219._0_8_ = 0x7fffffff7fffffff;
        auVar219._12_4_ = 0x7fffffff;
        auVar219._16_4_ = 0x7fffffff;
        auVar219._20_4_ = 0x7fffffff;
        auVar219._24_4_ = 0x7fffffff;
        auVar219._28_4_ = 0x7fffffff;
        auVar113._4_4_ = fStack_51c;
        auVar113._0_4_ = local_520;
        auVar113._8_4_ = fStack_518;
        auVar113._12_4_ = fStack_514;
        auVar113._16_4_ = fStack_510;
        auVar113._20_4_ = fStack_50c;
        auVar113._24_4_ = fStack_508;
        auVar113._28_4_ = fStack_504;
        auVar234 = vandps_avx(auVar113,auVar219);
        auVar17 = vandps_avx(auVar257,auVar219);
        auVar17 = vmaxps_avx(auVar234,auVar17);
        auVar116._4_4_ = fStack_45c;
        auVar116._0_4_ = local_460;
        auVar116._8_4_ = fStack_458;
        auVar116._12_4_ = fStack_454;
        auVar116._16_4_ = fStack_450;
        auVar116._20_4_ = fStack_44c;
        auVar116._24_4_ = fStack_448;
        auVar116._28_4_ = fVar290 + *(float *)(bspline_basis0 + lVar126 + 0x122c);
        auVar234 = vandps_avx(auVar219,auVar116);
        auVar234 = vmaxps_avx(auVar17,auVar234);
        auVar231 = vpermilps_avx(auVar231,0);
        auVar258._16_16_ = auVar231;
        auVar258._0_16_ = auVar231;
        auVar234 = vcmpps_avx(auVar234,auVar258,1);
        auVar22 = vblendvps_avx(auVar113,auVar20,auVar234);
        auVar27 = vblendvps_avx(auVar257,auVar21,auVar234);
        auVar234 = vandps_avx(auVar265,auVar219);
        auVar17 = vandps_avx(auVar273,auVar219);
        auVar15 = vmaxps_avx(auVar234,auVar17);
        auVar234 = vandps_avx(auVar186,auVar219);
        auVar234 = vmaxps_avx(auVar15,auVar234);
        auVar15 = vcmpps_avx(auVar234,auVar258,1);
        auVar234 = vblendvps_avx(auVar265,auVar20,auVar15);
        auVar20 = vblendvps_avx(auVar273,auVar21,auVar15);
        fVar290 = auVar22._0_4_;
        fVar149 = auVar22._4_4_;
        fVar151 = auVar22._8_4_;
        fVar154 = auVar22._12_4_;
        fVar156 = auVar22._16_4_;
        fVar158 = auVar22._20_4_;
        fVar161 = auVar22._24_4_;
        fVar189 = auVar234._0_4_;
        fVar191 = auVar234._4_4_;
        fVar204 = auVar234._8_4_;
        fVar206 = auVar234._12_4_;
        fVar208 = auVar234._16_4_;
        fVar209 = auVar234._20_4_;
        fVar210 = auVar234._24_4_;
        fVar269 = -auVar234._28_4_;
        fVar207 = auVar27._0_4_;
        fVar251 = auVar27._4_4_;
        fVar295 = auVar27._8_4_;
        fVar239 = auVar27._12_4_;
        fVar155 = auVar27._16_4_;
        fVar279 = auVar27._20_4_;
        fVar286 = auVar27._24_4_;
        auVar139._0_4_ = fVar207 * fVar207 + fVar290 * fVar290;
        auVar139._4_4_ = fVar251 * fVar251 + fVar149 * fVar149;
        auVar139._8_4_ = fVar295 * fVar295 + fVar151 * fVar151;
        auVar139._12_4_ = fVar239 * fVar239 + fVar154 * fVar154;
        auVar139._16_4_ = fVar155 * fVar155 + fVar156 * fVar156;
        auVar139._20_4_ = fVar279 * fVar279 + fVar158 * fVar158;
        auVar139._24_4_ = fVar286 * fVar286 + fVar161 * fVar161;
        auVar139._28_4_ = auVar273._28_4_ + auVar22._28_4_;
        auVar22 = vrsqrtps_avx(auVar139);
        fVar240 = auVar22._0_4_;
        fVar247 = auVar22._4_4_;
        auVar21._4_4_ = fVar247 * 1.5;
        auVar21._0_4_ = fVar240 * 1.5;
        fVar249 = auVar22._8_4_;
        auVar21._8_4_ = fVar249 * 1.5;
        fVar308 = auVar22._12_4_;
        auVar21._12_4_ = fVar308 * 1.5;
        fVar188 = auVar22._16_4_;
        auVar21._16_4_ = fVar188 * 1.5;
        fVar159 = auVar22._20_4_;
        auVar21._20_4_ = fVar159 * 1.5;
        fVar296 = auVar22._24_4_;
        fVar174 = auVar17._28_4_;
        auVar21._24_4_ = fVar296 * 1.5;
        auVar21._28_4_ = fVar174;
        auVar16._4_4_ = fVar247 * fVar247 * fVar247 * auVar139._4_4_ * 0.5;
        auVar16._0_4_ = fVar240 * fVar240 * fVar240 * auVar139._0_4_ * 0.5;
        auVar16._8_4_ = fVar249 * fVar249 * fVar249 * auVar139._8_4_ * 0.5;
        auVar16._12_4_ = fVar308 * fVar308 * fVar308 * auVar139._12_4_ * 0.5;
        auVar16._16_4_ = fVar188 * fVar188 * fVar188 * auVar139._16_4_ * 0.5;
        auVar16._20_4_ = fVar159 * fVar159 * fVar159 * auVar139._20_4_ * 0.5;
        auVar16._24_4_ = fVar296 * fVar296 * fVar296 * auVar139._24_4_ * 0.5;
        auVar16._28_4_ = auVar139._28_4_;
        auVar17 = vsubps_avx(auVar21,auVar16);
        fVar240 = auVar17._0_4_;
        fVar308 = auVar17._4_4_;
        fVar296 = auVar17._8_4_;
        fVar299 = auVar17._12_4_;
        fVar157 = auVar17._16_4_;
        fVar281 = auVar17._20_4_;
        fVar288 = auVar17._24_4_;
        fVar247 = auVar20._0_4_;
        fVar188 = auVar20._4_4_;
        fVar162 = auVar20._8_4_;
        fVar298 = auVar20._12_4_;
        fVar160 = auVar20._16_4_;
        fVar282 = auVar20._20_4_;
        fVar268 = auVar20._24_4_;
        auVar140._0_4_ = fVar247 * fVar247 + fVar189 * fVar189;
        auVar140._4_4_ = fVar188 * fVar188 + fVar191 * fVar191;
        auVar140._8_4_ = fVar162 * fVar162 + fVar204 * fVar204;
        auVar140._12_4_ = fVar298 * fVar298 + fVar206 * fVar206;
        auVar140._16_4_ = fVar160 * fVar160 + fVar208 * fVar208;
        auVar140._20_4_ = fVar282 * fVar282 + fVar209 * fVar209;
        auVar140._24_4_ = fVar268 * fVar268 + fVar210 * fVar210;
        auVar140._28_4_ = auVar234._28_4_ + auVar17._28_4_;
        auVar234 = vrsqrtps_avx(auVar140);
        fVar249 = auVar234._0_4_;
        fVar159 = auVar234._4_4_;
        auVar23._4_4_ = fVar159 * 1.5;
        auVar23._0_4_ = fVar249 * 1.5;
        fVar297 = auVar234._8_4_;
        auVar23._8_4_ = fVar297 * 1.5;
        fVar153 = auVar234._12_4_;
        auVar23._12_4_ = fVar153 * 1.5;
        fVar271 = auVar234._16_4_;
        auVar23._16_4_ = fVar271 * 1.5;
        fVar284 = auVar234._20_4_;
        auVar23._20_4_ = fVar284 * 1.5;
        fVar211 = auVar234._24_4_;
        auVar23._24_4_ = fVar211 * 1.5;
        auVar23._28_4_ = fVar174;
        auVar234._4_4_ = fVar159 * fVar159 * fVar159 * auVar140._4_4_ * 0.5;
        auVar234._0_4_ = fVar249 * fVar249 * fVar249 * auVar140._0_4_ * 0.5;
        auVar234._8_4_ = fVar297 * fVar297 * fVar297 * auVar140._8_4_ * 0.5;
        auVar234._12_4_ = fVar153 * fVar153 * fVar153 * auVar140._12_4_ * 0.5;
        auVar234._16_4_ = fVar271 * fVar271 * fVar271 * auVar140._16_4_ * 0.5;
        auVar234._20_4_ = fVar284 * fVar284 * fVar284 * auVar140._20_4_ * 0.5;
        auVar234._24_4_ = fVar211 * fVar211 * fVar211 * auVar140._24_4_ * 0.5;
        auVar234._28_4_ = auVar140._28_4_;
        auVar234 = vsubps_avx(auVar23,auVar234);
        fVar249 = auVar234._0_4_;
        fVar159 = auVar234._4_4_;
        fVar297 = auVar234._8_4_;
        fVar153 = auVar234._12_4_;
        fVar271 = auVar234._16_4_;
        fVar284 = auVar234._20_4_;
        fVar211 = auVar234._24_4_;
        fVar207 = (float)local_780._0_4_ * fVar207 * fVar240;
        fVar251 = (float)local_780._4_4_ * fVar251 * fVar308;
        auVar24._4_4_ = fVar251;
        auVar24._0_4_ = fVar207;
        fVar295 = fStack_778 * fVar295 * fVar296;
        auVar24._8_4_ = fVar295;
        fVar239 = fStack_774 * fVar239 * fVar299;
        auVar24._12_4_ = fVar239;
        fVar155 = fStack_770 * fVar155 * fVar157;
        auVar24._16_4_ = fVar155;
        fVar279 = fStack_76c * fVar279 * fVar281;
        auVar24._20_4_ = fVar279;
        fVar286 = fStack_768 * fVar286 * fVar288;
        auVar24._24_4_ = fVar286;
        auVar24._28_4_ = fVar269;
        local_5a0._4_4_ = fVar251 + auVar294._4_4_;
        local_5a0._0_4_ = fVar207 + auVar294._0_4_;
        fStack_598 = fVar295 + auVar294._8_4_;
        fStack_594 = fVar239 + auVar294._12_4_;
        fStack_590 = fVar155 + auVar294._16_4_;
        fStack_58c = fVar279 + auVar294._20_4_;
        fStack_588 = fVar286 + auVar294._24_4_;
        fStack_584 = fVar269 + auVar294._28_4_;
        fVar207 = (float)local_780._0_4_ * fVar240 * -fVar290;
        fVar251 = (float)local_780._4_4_ * fVar308 * -fVar149;
        auVar25._4_4_ = fVar251;
        auVar25._0_4_ = fVar207;
        fVar295 = fStack_778 * fVar296 * -fVar151;
        auVar25._8_4_ = fVar295;
        fVar239 = fStack_774 * fVar299 * -fVar154;
        auVar25._12_4_ = fVar239;
        fVar155 = fStack_770 * fVar157 * -fVar156;
        auVar25._16_4_ = fVar155;
        fVar279 = fStack_76c * fVar281 * -fVar158;
        auVar25._20_4_ = fVar279;
        fVar286 = fStack_768 * fVar288 * -fVar161;
        auVar25._24_4_ = fVar286;
        auVar25._28_4_ = fVar174;
        local_500._4_4_ = fVar251 + auVar244._4_4_;
        local_500._0_4_ = fVar207 + auVar244._0_4_;
        fStack_4f8 = fVar295 + auVar244._8_4_;
        fStack_4f4 = fVar239 + auVar244._12_4_;
        fStack_4f0 = fVar155 + auVar244._16_4_;
        fStack_4ec = fVar279 + auVar244._20_4_;
        fStack_4e8 = fVar286 + auVar244._24_4_;
        fStack_4e4 = fVar174 + auVar244._28_4_;
        fVar207 = fVar240 * 0.0 * (float)local_780._0_4_;
        fVar240 = fVar308 * 0.0 * (float)local_780._4_4_;
        auVar26._4_4_ = fVar240;
        auVar26._0_4_ = fVar207;
        fVar251 = fVar296 * 0.0 * fStack_778;
        auVar26._8_4_ = fVar251;
        fVar308 = fVar299 * 0.0 * fStack_774;
        auVar26._12_4_ = fVar308;
        fVar295 = fVar157 * 0.0 * fStack_770;
        auVar26._16_4_ = fVar295;
        fVar296 = fVar281 * 0.0 * fStack_76c;
        auVar26._20_4_ = fVar296;
        fVar239 = fVar288 * 0.0 * fStack_768;
        auVar26._24_4_ = fVar239;
        auVar26._28_4_ = fVar252;
        auVar259._0_4_ = fVar207 + (float)local_440._0_4_;
        auVar259._4_4_ = fVar240 + (float)local_440._4_4_;
        auVar259._8_4_ = fVar251 + fStack_438;
        auVar259._12_4_ = fVar308 + fStack_434;
        auVar259._16_4_ = fVar295 + fStack_430;
        auVar259._20_4_ = fVar296 + fStack_42c;
        auVar259._24_4_ = fVar239 + fStack_428;
        auVar259._28_4_ = fVar252 + fStack_424;
        fVar207 = (float)local_6a0._0_4_ * fVar247 * fVar249;
        fVar240 = (float)local_6a0._4_4_ * fVar188 * fVar159;
        auVar28._4_4_ = fVar240;
        auVar28._0_4_ = fVar207;
        fVar247 = fStack_698 * fVar162 * fVar297;
        auVar28._8_4_ = fVar247;
        fVar251 = fStack_694 * fVar298 * fVar153;
        auVar28._12_4_ = fVar251;
        fVar308 = register0x000015d0 * fVar160 * fVar271;
        auVar28._16_4_ = fVar308;
        fVar188 = register0x000015d4 * fVar282 * fVar284;
        auVar28._20_4_ = fVar188;
        fVar295 = register0x000015d8 * fVar268 * fVar211;
        auVar28._24_4_ = fVar295;
        auVar28._28_4_ = auVar20._28_4_;
        auVar21 = vsubps_avx(auVar294,auVar24);
        auVar274._0_4_ = auVar218._0_4_ + fVar207;
        auVar274._4_4_ = auVar218._4_4_ + fVar240;
        auVar274._8_4_ = auVar218._8_4_ + fVar247;
        auVar274._12_4_ = auVar218._12_4_ + fVar251;
        auVar274._16_4_ = auVar218._16_4_ + fVar308;
        auVar274._20_4_ = auVar218._20_4_ + fVar188;
        auVar274._24_4_ = auVar218._24_4_ + fVar295;
        auVar274._28_4_ = auVar218._28_4_ + auVar20._28_4_;
        fVar207 = (float)local_6a0._0_4_ * -fVar189 * fVar249;
        fVar240 = (float)local_6a0._4_4_ * -fVar191 * fVar159;
        auVar20._4_4_ = fVar240;
        auVar20._0_4_ = fVar207;
        fVar247 = fStack_698 * -fVar204 * fVar297;
        auVar20._8_4_ = fVar247;
        fVar251 = fStack_694 * -fVar206 * fVar153;
        auVar20._12_4_ = fVar251;
        fVar308 = register0x000015d0 * -fVar208 * fVar271;
        auVar20._16_4_ = fVar308;
        fVar188 = register0x000015d4 * -fVar209 * fVar284;
        auVar20._20_4_ = fVar188;
        fVar295 = register0x000015d8 * -fVar210 * fVar211;
        auVar20._24_4_ = fVar295;
        auVar20._28_4_ = fVar316;
        auVar27 = vsubps_avx(auVar244,auVar25);
        auVar291._0_4_ = fVar207 + (float)local_220._0_4_;
        auVar291._4_4_ = fVar240 + (float)local_220._4_4_;
        auVar291._8_4_ = fVar247 + fStack_218;
        auVar291._12_4_ = fVar251 + fStack_214;
        auVar291._16_4_ = fVar308 + fStack_210;
        auVar291._20_4_ = fVar188 + fStack_20c;
        auVar291._24_4_ = fVar295 + fStack_208;
        auVar291._28_4_ = fVar316 + register0x000012dc;
        fVar207 = fVar249 * 0.0 * (float)local_6a0._0_4_;
        fVar240 = fVar159 * 0.0 * (float)local_6a0._4_4_;
        auVar29._4_4_ = fVar240;
        auVar29._0_4_ = fVar207;
        fVar247 = fVar297 * 0.0 * fStack_698;
        auVar29._8_4_ = fVar247;
        fVar249 = fVar153 * 0.0 * fStack_694;
        auVar29._12_4_ = fVar249;
        fVar251 = fVar271 * 0.0 * register0x000015d0;
        auVar29._16_4_ = fVar251;
        fVar308 = fVar284 * 0.0 * register0x000015d4;
        auVar29._20_4_ = fVar308;
        fVar188 = fVar211 * 0.0 * register0x000015d8;
        auVar29._24_4_ = fVar188;
        auVar29._28_4_ = fVar321;
        auVar244 = vsubps_avx(_local_440,auVar26);
        auVar323._0_4_ = fVar207 + (float)local_480._0_4_;
        auVar323._4_4_ = fVar240 + (float)local_480._4_4_;
        auVar323._8_4_ = fVar247 + fStack_478;
        auVar323._12_4_ = fVar249 + fStack_474;
        auVar323._16_4_ = fVar251 + fStack_470;
        auVar323._20_4_ = fVar308 + fStack_46c;
        auVar323._24_4_ = fVar188 + fStack_468;
        auVar323._28_4_ = fVar321 + fStack_464;
        auVar234 = vsubps_avx(auVar218,auVar28);
        auVar17 = vsubps_avx(_local_220,auVar20);
        auVar22 = vsubps_avx(_local_480,auVar29);
        auVar20 = vsubps_avx(auVar291,auVar27);
        auVar15 = vsubps_avx(auVar323,auVar244);
        auVar30._4_4_ = auVar244._4_4_ * auVar20._4_4_;
        auVar30._0_4_ = auVar244._0_4_ * auVar20._0_4_;
        auVar30._8_4_ = auVar244._8_4_ * auVar20._8_4_;
        auVar30._12_4_ = auVar244._12_4_ * auVar20._12_4_;
        auVar30._16_4_ = auVar244._16_4_ * auVar20._16_4_;
        auVar30._20_4_ = auVar244._20_4_ * auVar20._20_4_;
        auVar30._24_4_ = auVar244._24_4_ * auVar20._24_4_;
        auVar30._28_4_ = fVar321;
        auVar31._4_4_ = auVar27._4_4_ * auVar15._4_4_;
        auVar31._0_4_ = auVar27._0_4_ * auVar15._0_4_;
        auVar31._8_4_ = auVar27._8_4_ * auVar15._8_4_;
        auVar31._12_4_ = auVar27._12_4_ * auVar15._12_4_;
        auVar31._16_4_ = auVar27._16_4_ * auVar15._16_4_;
        auVar31._20_4_ = auVar27._20_4_ * auVar15._20_4_;
        auVar31._24_4_ = auVar27._24_4_ * auVar15._24_4_;
        auVar31._28_4_ = register0x000012dc;
        auVar198 = vsubps_avx(auVar31,auVar30);
        auVar32._4_4_ = auVar21._4_4_ * auVar15._4_4_;
        auVar32._0_4_ = auVar21._0_4_ * auVar15._0_4_;
        auVar32._8_4_ = auVar21._8_4_ * auVar15._8_4_;
        auVar32._12_4_ = auVar21._12_4_ * auVar15._12_4_;
        auVar32._16_4_ = auVar21._16_4_ * auVar15._16_4_;
        auVar32._20_4_ = auVar21._20_4_ * auVar15._20_4_;
        auVar32._24_4_ = auVar21._24_4_ * auVar15._24_4_;
        auVar32._28_4_ = auVar15._28_4_;
        auVar16 = vsubps_avx(auVar274,auVar21);
        auVar33._4_4_ = auVar244._4_4_ * auVar16._4_4_;
        auVar33._0_4_ = auVar244._0_4_ * auVar16._0_4_;
        auVar33._8_4_ = auVar244._8_4_ * auVar16._8_4_;
        auVar33._12_4_ = auVar244._12_4_ * auVar16._12_4_;
        auVar33._16_4_ = auVar244._16_4_ * auVar16._16_4_;
        auVar33._20_4_ = auVar244._20_4_ * auVar16._20_4_;
        auVar33._24_4_ = auVar244._24_4_ * auVar16._24_4_;
        auVar33._28_4_ = auVar218._28_4_;
        auVar218 = vsubps_avx(auVar33,auVar32);
        auVar34._4_4_ = auVar16._4_4_ * auVar27._4_4_;
        auVar34._0_4_ = auVar16._0_4_ * auVar27._0_4_;
        auVar34._8_4_ = auVar16._8_4_ * auVar27._8_4_;
        auVar34._12_4_ = auVar16._12_4_ * auVar27._12_4_;
        auVar34._16_4_ = auVar16._16_4_ * auVar27._16_4_;
        auVar34._20_4_ = auVar16._20_4_ * auVar27._20_4_;
        auVar34._24_4_ = auVar16._24_4_ * auVar27._24_4_;
        auVar34._28_4_ = auVar15._28_4_;
        auVar35._4_4_ = auVar21._4_4_ * auVar20._4_4_;
        auVar35._0_4_ = auVar21._0_4_ * auVar20._0_4_;
        auVar35._8_4_ = auVar21._8_4_ * auVar20._8_4_;
        auVar35._12_4_ = auVar21._12_4_ * auVar20._12_4_;
        auVar35._16_4_ = auVar21._16_4_ * auVar20._16_4_;
        auVar35._20_4_ = auVar21._20_4_ * auVar20._20_4_;
        auVar35._24_4_ = auVar21._24_4_ * auVar20._24_4_;
        auVar35._28_4_ = auVar20._28_4_;
        auVar20 = vsubps_avx(auVar35,auVar34);
        auVar141._0_4_ = auVar198._0_4_ * 0.0 + auVar20._0_4_ + auVar218._0_4_ * 0.0;
        auVar141._4_4_ = auVar198._4_4_ * 0.0 + auVar20._4_4_ + auVar218._4_4_ * 0.0;
        auVar141._8_4_ = auVar198._8_4_ * 0.0 + auVar20._8_4_ + auVar218._8_4_ * 0.0;
        auVar141._12_4_ = auVar198._12_4_ * 0.0 + auVar20._12_4_ + auVar218._12_4_ * 0.0;
        auVar141._16_4_ = auVar198._16_4_ * 0.0 + auVar20._16_4_ + auVar218._16_4_ * 0.0;
        auVar141._20_4_ = auVar198._20_4_ * 0.0 + auVar20._20_4_ + auVar218._20_4_ * 0.0;
        auVar141._24_4_ = auVar198._24_4_ * 0.0 + auVar20._24_4_ + auVar218._24_4_ * 0.0;
        auVar141._28_4_ = auVar20._28_4_ + auVar20._28_4_ + auVar218._28_4_;
        auVar198 = vcmpps_avx(auVar141,ZEXT432(0) << 0x20,2);
        _local_6c0 = vblendvps_avx(auVar234,_local_5a0,auVar198);
        _local_680 = vblendvps_avx(auVar17,_local_500,auVar198);
        auVar234 = vblendvps_avx(auVar22,auVar259,auVar198);
        auVar17 = vblendvps_avx(auVar21,auVar274,auVar198);
        auVar22 = vblendvps_avx(auVar27,auVar291,auVar198);
        auVar20 = vblendvps_avx(auVar244,auVar323,auVar198);
        auVar21 = vblendvps_avx(auVar274,auVar21,auVar198);
        auVar27 = vblendvps_avx(auVar291,auVar27,auVar198);
        _local_660 = vpackssdw_avx(local_240._0_16_,local_240._16_16_);
        _auStack_650 = auVar294._16_16_;
        auVar15 = vblendvps_avx(auVar323,auVar244,auVar198);
        auVar21 = vsubps_avx(auVar21,_local_6c0);
        auVar218 = vsubps_avx(auVar27,_local_680);
        auVar15 = vsubps_avx(auVar15,auVar234);
        auVar294 = vsubps_avx(_local_680,auVar22);
        fVar207 = auVar218._0_4_;
        fVar161 = auVar234._0_4_;
        fVar308 = auVar218._4_4_;
        fVar189 = auVar234._4_4_;
        auVar36._4_4_ = fVar189 * fVar308;
        auVar36._0_4_ = fVar161 * fVar207;
        fVar162 = auVar218._8_4_;
        fVar191 = auVar234._8_4_;
        auVar36._8_4_ = fVar191 * fVar162;
        fVar153 = auVar218._12_4_;
        fVar204 = auVar234._12_4_;
        auVar36._12_4_ = fVar204 * fVar153;
        fVar279 = auVar218._16_4_;
        fVar206 = auVar234._16_4_;
        auVar36._16_4_ = fVar206 * fVar279;
        fVar288 = auVar218._20_4_;
        fVar208 = auVar234._20_4_;
        auVar36._20_4_ = fVar208 * fVar288;
        fVar149 = auVar218._24_4_;
        fVar209 = auVar234._24_4_;
        auVar36._24_4_ = fVar209 * fVar149;
        auVar36._28_4_ = auVar27._28_4_;
        fVar240 = local_680._0_4_;
        fVar270 = auVar15._0_4_;
        fVar188 = local_680._4_4_;
        fVar278 = auVar15._4_4_;
        auVar37._4_4_ = fVar278 * fVar188;
        auVar37._0_4_ = fVar270 * fVar240;
        fVar297 = local_680._8_4_;
        fVar280 = auVar15._8_4_;
        auVar37._8_4_ = fVar280 * fVar297;
        fVar155 = local_680._12_4_;
        fVar283 = auVar15._12_4_;
        auVar37._12_4_ = fVar283 * fVar155;
        fVar281 = local_680._16_4_;
        fVar285 = auVar15._16_4_;
        auVar37._16_4_ = fVar285 * fVar281;
        fVar268 = local_680._20_4_;
        fVar287 = auVar15._20_4_;
        auVar37._20_4_ = fVar287 * fVar268;
        fVar151 = local_680._24_4_;
        fVar289 = auVar15._24_4_;
        uVar7 = auVar244._28_4_;
        auVar37._24_4_ = fVar289 * fVar151;
        auVar37._28_4_ = uVar7;
        auVar27 = vsubps_avx(auVar37,auVar36);
        fVar247 = local_6c0._0_4_;
        fVar159 = local_6c0._4_4_;
        auVar38._4_4_ = fVar278 * fVar159;
        auVar38._0_4_ = fVar270 * fVar247;
        fVar239 = local_6c0._8_4_;
        auVar38._8_4_ = fVar280 * fVar239;
        fVar157 = local_6c0._12_4_;
        auVar38._12_4_ = fVar283 * fVar157;
        fVar282 = local_6c0._16_4_;
        auVar38._16_4_ = fVar285 * fVar282;
        fVar211 = local_6c0._20_4_;
        auVar38._20_4_ = fVar287 * fVar211;
        fVar154 = local_6c0._24_4_;
        auVar38._24_4_ = fVar289 * fVar154;
        auVar38._28_4_ = uVar7;
        fVar249 = auVar21._0_4_;
        auVar318._0_4_ = fVar161 * fVar249;
        fVar295 = auVar21._4_4_;
        auVar318._4_4_ = fVar189 * fVar295;
        fVar299 = auVar21._8_4_;
        auVar318._8_4_ = fVar191 * fVar299;
        fVar160 = auVar21._12_4_;
        auVar318._12_4_ = fVar204 * fVar160;
        fVar284 = auVar21._16_4_;
        auVar318._16_4_ = fVar206 * fVar284;
        fVar174 = auVar21._20_4_;
        auVar318._20_4_ = fVar208 * fVar174;
        fVar156 = auVar21._24_4_;
        auVar318._24_4_ = fVar209 * fVar156;
        auVar318._28_4_ = 0;
        auVar244 = vsubps_avx(auVar318,auVar38);
        auVar39._4_4_ = fVar188 * fVar295;
        auVar39._0_4_ = fVar240 * fVar249;
        auVar39._8_4_ = fVar297 * fVar299;
        auVar39._12_4_ = fVar155 * fVar160;
        auVar39._16_4_ = fVar281 * fVar284;
        auVar39._20_4_ = fVar268 * fVar174;
        auVar39._24_4_ = fVar151 * fVar156;
        auVar39._28_4_ = uVar7;
        auVar40._4_4_ = fVar159 * fVar308;
        auVar40._0_4_ = fVar247 * fVar207;
        auVar40._8_4_ = fVar239 * fVar162;
        auVar40._12_4_ = fVar157 * fVar153;
        auVar40._16_4_ = fVar282 * fVar279;
        auVar40._20_4_ = fVar211 * fVar288;
        auVar40._24_4_ = fVar154 * fVar149;
        auVar40._28_4_ = auVar323._28_4_;
        auVar16 = vsubps_avx(auVar40,auVar39);
        auVar23 = vsubps_avx(auVar234,auVar20);
        fVar251 = auVar16._28_4_ + auVar244._28_4_;
        auVar260._0_4_ = auVar16._0_4_ + auVar244._0_4_ * 0.0 + auVar27._0_4_ * 0.0;
        auVar260._4_4_ = auVar16._4_4_ + auVar244._4_4_ * 0.0 + auVar27._4_4_ * 0.0;
        auVar260._8_4_ = auVar16._8_4_ + auVar244._8_4_ * 0.0 + auVar27._8_4_ * 0.0;
        auVar260._12_4_ = auVar16._12_4_ + auVar244._12_4_ * 0.0 + auVar27._12_4_ * 0.0;
        auVar260._16_4_ = auVar16._16_4_ + auVar244._16_4_ * 0.0 + auVar27._16_4_ * 0.0;
        auVar260._20_4_ = auVar16._20_4_ + auVar244._20_4_ * 0.0 + auVar27._20_4_ * 0.0;
        auVar260._24_4_ = auVar16._24_4_ + auVar244._24_4_ * 0.0 + auVar27._24_4_ * 0.0;
        auVar260._28_4_ = fVar251 + auVar27._28_4_;
        fVar210 = auVar294._0_4_;
        fVar269 = auVar294._4_4_;
        auVar41._4_4_ = fVar269 * auVar20._4_4_;
        auVar41._0_4_ = fVar210 * auVar20._0_4_;
        fVar253 = auVar294._8_4_;
        auVar41._8_4_ = fVar253 * auVar20._8_4_;
        fVar226 = auVar294._12_4_;
        auVar41._12_4_ = fVar226 * auVar20._12_4_;
        fVar224 = auVar294._16_4_;
        auVar41._16_4_ = fVar224 * auVar20._16_4_;
        fVar225 = auVar294._20_4_;
        auVar41._20_4_ = fVar225 * auVar20._20_4_;
        fVar263 = auVar294._24_4_;
        auVar41._24_4_ = fVar263 * auVar20._24_4_;
        auVar41._28_4_ = fVar251;
        fVar251 = auVar23._0_4_;
        fVar296 = auVar23._4_4_;
        auVar42._4_4_ = auVar22._4_4_ * fVar296;
        auVar42._0_4_ = auVar22._0_4_ * fVar251;
        fVar298 = auVar23._8_4_;
        auVar42._8_4_ = auVar22._8_4_ * fVar298;
        fVar271 = auVar23._12_4_;
        auVar42._12_4_ = auVar22._12_4_ * fVar271;
        fVar286 = auVar23._16_4_;
        auVar42._16_4_ = auVar22._16_4_ * fVar286;
        fVar290 = auVar23._20_4_;
        auVar42._20_4_ = auVar22._20_4_ * fVar290;
        fVar158 = auVar23._24_4_;
        auVar42._24_4_ = auVar22._24_4_ * fVar158;
        auVar42._28_4_ = auVar16._28_4_;
        auVar244 = vsubps_avx(auVar42,auVar41);
        auVar294 = vsubps_avx(_local_6c0,auVar17);
        fVar305 = auVar294._0_4_;
        fVar306 = auVar294._4_4_;
        auVar43._4_4_ = fVar306 * auVar20._4_4_;
        auVar43._0_4_ = fVar305 * auVar20._0_4_;
        fVar307 = auVar294._8_4_;
        auVar43._8_4_ = fVar307 * auVar20._8_4_;
        fVar309 = auVar294._12_4_;
        auVar43._12_4_ = fVar309 * auVar20._12_4_;
        fVar313 = auVar294._16_4_;
        auVar43._16_4_ = fVar313 * auVar20._16_4_;
        fVar314 = auVar294._20_4_;
        auVar43._20_4_ = fVar314 * auVar20._20_4_;
        fVar315 = auVar294._24_4_;
        auVar43._24_4_ = fVar315 * auVar20._24_4_;
        auVar43._28_4_ = auVar20._28_4_;
        auVar44._4_4_ = auVar17._4_4_ * fVar296;
        auVar44._0_4_ = auVar17._0_4_ * fVar251;
        auVar44._8_4_ = auVar17._8_4_ * fVar298;
        auVar44._12_4_ = auVar17._12_4_ * fVar271;
        auVar44._16_4_ = auVar17._16_4_ * fVar286;
        auVar44._20_4_ = auVar17._20_4_ * fVar290;
        auVar44._24_4_ = auVar17._24_4_ * fVar158;
        auVar44._28_4_ = auVar27._28_4_;
        auVar27 = vsubps_avx(auVar43,auVar44);
        auVar45._4_4_ = auVar22._4_4_ * fVar306;
        auVar45._0_4_ = auVar22._0_4_ * fVar305;
        auVar45._8_4_ = auVar22._8_4_ * fVar307;
        auVar45._12_4_ = auVar22._12_4_ * fVar309;
        auVar45._16_4_ = auVar22._16_4_ * fVar313;
        auVar45._20_4_ = auVar22._20_4_ * fVar314;
        auVar45._24_4_ = auVar22._24_4_ * fVar315;
        auVar45._28_4_ = auVar20._28_4_;
        auVar46._4_4_ = auVar17._4_4_ * fVar269;
        auVar46._0_4_ = auVar17._0_4_ * fVar210;
        auVar46._8_4_ = auVar17._8_4_ * fVar253;
        auVar46._12_4_ = auVar17._12_4_ * fVar226;
        auVar46._16_4_ = auVar17._16_4_ * fVar224;
        auVar46._20_4_ = auVar17._20_4_ * fVar225;
        auVar46._24_4_ = auVar17._24_4_ * fVar263;
        auVar46._28_4_ = auVar17._28_4_;
        auVar17 = vsubps_avx(auVar46,auVar45);
        auVar220._0_4_ = auVar244._0_4_ * 0.0 + auVar17._0_4_ + auVar27._0_4_ * 0.0;
        auVar220._4_4_ = auVar244._4_4_ * 0.0 + auVar17._4_4_ + auVar27._4_4_ * 0.0;
        auVar220._8_4_ = auVar244._8_4_ * 0.0 + auVar17._8_4_ + auVar27._8_4_ * 0.0;
        auVar220._12_4_ = auVar244._12_4_ * 0.0 + auVar17._12_4_ + auVar27._12_4_ * 0.0;
        auVar220._16_4_ = auVar244._16_4_ * 0.0 + auVar17._16_4_ + auVar27._16_4_ * 0.0;
        auVar220._20_4_ = auVar244._20_4_ * 0.0 + auVar17._20_4_ + auVar27._20_4_ * 0.0;
        auVar220._24_4_ = auVar244._24_4_ * 0.0 + auVar17._24_4_ + auVar27._24_4_ * 0.0;
        auVar220._28_4_ = auVar17._28_4_ + auVar17._28_4_ + auVar27._28_4_;
        auVar17 = vmaxps_avx(auVar260,auVar220);
        auVar17 = vcmpps_avx(auVar17,ZEXT832(0) << 0x20,2);
        auVar231 = vpackssdw_avx(auVar17._0_16_,auVar17._16_16_);
        auVar231 = vpand_avx(auVar231,_local_660);
        auVar182 = vpmovsxwd_avx(auVar231);
        auVar196 = vpunpckhwd_avx(auVar231,auVar231);
        auVar199._16_16_ = auVar196;
        auVar199._0_16_ = auVar182;
        if ((((((((auVar199 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar199 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar199 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar199 >> 0x7f,0) == '\0') &&
              (auVar199 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar196 >> 0x3f,0) == '\0') &&
            (auVar199 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar196[0xf]) {
LAB_00efd2a0:
          auVar202 = ZEXT3264(auVar199);
          auVar223 = ZEXT3264(CONCAT824(local_4c0[1]._24_8_,
                                        CONCAT816(local_4c0[1]._16_8_,
                                                  CONCAT88(local_4c0[1]._8_8_,local_4c0[1]._0_8_))))
          ;
          auVar267 = ZEXT3264(local_700);
          auVar277 = ZEXT3264(local_720);
        }
        else {
          auVar47._4_4_ = fVar296 * fVar308;
          auVar47._0_4_ = fVar251 * fVar207;
          auVar47._8_4_ = fVar298 * fVar162;
          auVar47._12_4_ = fVar271 * fVar153;
          auVar47._16_4_ = fVar286 * fVar279;
          auVar47._20_4_ = fVar290 * fVar288;
          auVar47._24_4_ = fVar158 * fVar149;
          auVar47._28_4_ = auVar196._12_4_;
          auVar301._0_4_ = fVar210 * fVar270;
          auVar301._4_4_ = fVar269 * fVar278;
          auVar301._8_4_ = fVar253 * fVar280;
          auVar301._12_4_ = fVar226 * fVar283;
          auVar301._16_4_ = fVar224 * fVar285;
          auVar301._20_4_ = fVar225 * fVar287;
          auVar301._24_4_ = fVar263 * fVar289;
          auVar301._28_4_ = 0;
          auVar17 = vsubps_avx(auVar301,auVar47);
          auVar48._4_4_ = fVar306 * fVar278;
          auVar48._0_4_ = fVar305 * fVar270;
          auVar48._8_4_ = fVar307 * fVar280;
          auVar48._12_4_ = fVar309 * fVar283;
          auVar48._16_4_ = fVar313 * fVar285;
          auVar48._20_4_ = fVar314 * fVar287;
          auVar48._24_4_ = fVar315 * fVar289;
          auVar48._28_4_ = auVar15._28_4_;
          auVar49._4_4_ = fVar296 * fVar295;
          auVar49._0_4_ = fVar251 * fVar249;
          auVar49._8_4_ = fVar298 * fVar299;
          auVar49._12_4_ = fVar271 * fVar160;
          auVar49._16_4_ = fVar286 * fVar284;
          auVar49._20_4_ = fVar290 * fVar174;
          auVar49._24_4_ = fVar158 * fVar156;
          auVar49._28_4_ = auVar23._28_4_;
          auVar20 = vsubps_avx(auVar49,auVar48);
          auVar50._4_4_ = fVar269 * fVar295;
          auVar50._0_4_ = fVar210 * fVar249;
          auVar50._8_4_ = fVar253 * fVar299;
          auVar50._12_4_ = fVar226 * fVar160;
          auVar50._16_4_ = fVar224 * fVar284;
          auVar50._20_4_ = fVar225 * fVar174;
          auVar50._24_4_ = fVar263 * fVar156;
          auVar50._28_4_ = auVar21._28_4_;
          auVar51._4_4_ = fVar306 * fVar308;
          auVar51._0_4_ = fVar305 * fVar207;
          auVar51._8_4_ = fVar307 * fVar162;
          auVar51._12_4_ = fVar309 * fVar153;
          auVar51._16_4_ = fVar313 * fVar279;
          auVar51._20_4_ = fVar314 * fVar288;
          auVar51._24_4_ = fVar315 * fVar149;
          auVar51._28_4_ = auVar260._28_4_;
          auVar27 = vsubps_avx(auVar51,auVar50);
          auVar261._0_4_ = auVar17._0_4_ * 0.0 + auVar27._0_4_ + auVar20._0_4_ * 0.0;
          auVar261._4_4_ = auVar17._4_4_ * 0.0 + auVar27._4_4_ + auVar20._4_4_ * 0.0;
          auVar261._8_4_ = auVar17._8_4_ * 0.0 + auVar27._8_4_ + auVar20._8_4_ * 0.0;
          auVar261._12_4_ = auVar17._12_4_ * 0.0 + auVar27._12_4_ + auVar20._12_4_ * 0.0;
          auVar261._16_4_ = auVar17._16_4_ * 0.0 + auVar27._16_4_ + auVar20._16_4_ * 0.0;
          auVar261._20_4_ = auVar17._20_4_ * 0.0 + auVar27._20_4_ + auVar20._20_4_ * 0.0;
          auVar261._24_4_ = auVar17._24_4_ * 0.0 + auVar27._24_4_ + auVar20._24_4_ * 0.0;
          auVar261._28_4_ = auVar260._28_4_ + auVar27._28_4_ + auVar21._28_4_;
          auVar22 = vrcpps_avx(auVar261);
          fVar249 = auVar22._0_4_;
          fVar251 = auVar22._4_4_;
          auVar52._4_4_ = auVar261._4_4_ * fVar251;
          auVar52._0_4_ = auVar261._0_4_ * fVar249;
          fVar308 = auVar22._8_4_;
          auVar52._8_4_ = auVar261._8_4_ * fVar308;
          fVar295 = auVar22._12_4_;
          auVar52._12_4_ = auVar261._12_4_ * fVar295;
          fVar296 = auVar22._16_4_;
          auVar52._16_4_ = auVar261._16_4_ * fVar296;
          fVar162 = auVar22._20_4_;
          auVar52._20_4_ = auVar261._20_4_ * fVar162;
          fVar299 = auVar22._24_4_;
          auVar52._24_4_ = auVar261._24_4_ * fVar299;
          auVar52._28_4_ = auVar23._28_4_;
          auVar302._8_4_ = 0x3f800000;
          auVar302._0_8_ = &DAT_3f8000003f800000;
          auVar302._12_4_ = 0x3f800000;
          auVar302._16_4_ = 0x3f800000;
          auVar302._20_4_ = 0x3f800000;
          auVar302._24_4_ = 0x3f800000;
          auVar302._28_4_ = 0x3f800000;
          auVar21 = vsubps_avx(auVar302,auVar52);
          fVar249 = auVar21._0_4_ * fVar249 + fVar249;
          fVar251 = auVar21._4_4_ * fVar251 + fVar251;
          fVar308 = auVar21._8_4_ * fVar308 + fVar308;
          fVar295 = auVar21._12_4_ * fVar295 + fVar295;
          fVar296 = auVar21._16_4_ * fVar296 + fVar296;
          fVar162 = auVar21._20_4_ * fVar162 + fVar162;
          fVar299 = auVar21._24_4_ * fVar299 + fVar299;
          auVar53._4_4_ =
               (auVar17._4_4_ * fVar159 + auVar20._4_4_ * fVar188 + auVar27._4_4_ * fVar189) *
               fVar251;
          auVar53._0_4_ =
               (auVar17._0_4_ * fVar247 + auVar20._0_4_ * fVar240 + auVar27._0_4_ * fVar161) *
               fVar249;
          auVar53._8_4_ =
               (auVar17._8_4_ * fVar239 + auVar20._8_4_ * fVar297 + auVar27._8_4_ * fVar191) *
               fVar308;
          auVar53._12_4_ =
               (auVar17._12_4_ * fVar157 + auVar20._12_4_ * fVar155 + auVar27._12_4_ * fVar204) *
               fVar295;
          auVar53._16_4_ =
               (auVar17._16_4_ * fVar282 + auVar20._16_4_ * fVar281 + auVar27._16_4_ * fVar206) *
               fVar296;
          auVar53._20_4_ =
               (auVar17._20_4_ * fVar211 + auVar20._20_4_ * fVar268 + auVar27._20_4_ * fVar208) *
               fVar162;
          auVar53._24_4_ =
               (auVar17._24_4_ * fVar154 + auVar20._24_4_ * fVar151 + auVar27._24_4_ * fVar209) *
               fVar299;
          auVar53._28_4_ = local_6c0._28_4_ + auVar218._28_4_ + auVar234._28_4_;
          auVar182 = vpermilps_avx(ZEXT416((uint)local_620),0);
          auVar200._16_16_ = auVar182;
          auVar200._0_16_ = auVar182;
          auVar234 = vcmpps_avx(auVar200,auVar53,2);
          fVar207 = (ray->super_RayK<1>).tfar;
          auVar232._4_4_ = fVar207;
          auVar232._0_4_ = fVar207;
          auVar232._8_4_ = fVar207;
          auVar232._12_4_ = fVar207;
          auVar232._16_4_ = fVar207;
          auVar232._20_4_ = fVar207;
          auVar232._24_4_ = fVar207;
          auVar232._28_4_ = fVar207;
          auVar17 = vcmpps_avx(auVar53,auVar232,2);
          auVar234 = vandps_avx(auVar17,auVar234);
          auVar182 = vpackssdw_avx(auVar234._0_16_,auVar234._16_16_);
          auVar231 = vpand_avx(auVar231,auVar182);
          auVar182 = vpmovsxwd_avx(auVar231);
          auVar196 = vpshufd_avx(auVar231,0xee);
          auVar196 = vpmovsxwd_avx(auVar196);
          auVar199._16_16_ = auVar196;
          auVar199._0_16_ = auVar182;
          if ((((((((auVar199 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar199 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar199 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar199 >> 0x7f,0) == '\0') &&
                (auVar199 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar196 >> 0x3f,0) == '\0') &&
              (auVar199 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar196[0xf]) goto LAB_00efd2a0;
          auVar234 = vcmpps_avx(ZEXT832(0) << 0x20,auVar261,4);
          auVar182 = vpackssdw_avx(auVar234._0_16_,auVar234._16_16_);
          auVar231 = vpand_avx(auVar231,auVar182);
          auVar182 = vpmovsxwd_avx(auVar231);
          auVar231 = vpunpckhwd_avx(auVar231,auVar231);
          auVar202 = ZEXT1664(auVar231);
          auVar245._16_16_ = auVar231;
          auVar245._0_16_ = auVar182;
          auVar223 = ZEXT3264(CONCAT824(local_4c0[1]._24_8_,
                                        CONCAT816(local_4c0[1]._16_8_,
                                                  CONCAT88(local_4c0[1]._8_8_,local_4c0[1]._0_8_))))
          ;
          auVar267 = ZEXT3264(local_700);
          auVar277 = ZEXT3264(local_720);
          if ((((((((auVar245 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar245 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar245 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar245 >> 0x7f,0) != '\0') ||
                (auVar245 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar231 >> 0x3f,0) != '\0') ||
              (auVar245 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar231[0xf] < '\0') {
            auVar201._0_4_ = auVar260._0_4_ * fVar249;
            auVar201._4_4_ = auVar260._4_4_ * fVar251;
            auVar201._8_4_ = auVar260._8_4_ * fVar308;
            auVar201._12_4_ = auVar260._12_4_ * fVar295;
            auVar201._16_4_ = auVar260._16_4_ * fVar296;
            auVar201._20_4_ = auVar260._20_4_ * fVar162;
            auVar201._24_4_ = auVar260._24_4_ * fVar299;
            auVar201._28_4_ = 0;
            auVar54._4_4_ = auVar220._4_4_ * fVar251;
            auVar54._0_4_ = auVar220._0_4_ * fVar249;
            auVar54._8_4_ = auVar220._8_4_ * fVar308;
            auVar54._12_4_ = auVar220._12_4_ * fVar295;
            auVar54._16_4_ = auVar220._16_4_ * fVar296;
            auVar54._20_4_ = auVar220._20_4_ * fVar162;
            auVar54._24_4_ = auVar220._24_4_ * fVar299;
            auVar54._28_4_ = auVar21._28_4_ + auVar22._28_4_;
            auVar233._8_4_ = 0x3f800000;
            auVar233._0_8_ = &DAT_3f8000003f800000;
            auVar233._12_4_ = 0x3f800000;
            auVar233._16_4_ = 0x3f800000;
            auVar233._20_4_ = 0x3f800000;
            auVar233._24_4_ = 0x3f800000;
            auVar233._28_4_ = 0x3f800000;
            auVar234 = vsubps_avx(auVar233,auVar201);
            auVar234 = vblendvps_avx(auVar234,auVar201,auVar198);
            auVar267 = ZEXT3264(auVar234);
            auVar234 = vsubps_avx(auVar233,auVar54);
            auVar202 = ZEXT3264(auVar234);
            _local_260 = vblendvps_avx(auVar234,auVar54,auVar198);
            auVar223 = ZEXT3264(auVar245);
            auVar277 = ZEXT3264(auVar53);
          }
        }
        auVar234 = auVar223._0_32_;
        _local_600 = auVar136;
        _local_540 = auVar19;
        _local_530 = auVar164;
        if ((((((((auVar234 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar234 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar234 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar234 >> 0x7f,0) != '\0') ||
              (auVar223 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar234 >> 0xbf,0) != '\0') ||
            (auVar223 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar223[0x1f] < '\0') {
          auVar17 = vsubps_avx(_local_6a0,_local_780);
          fVar240 = (float)local_780._0_4_ + auVar267._0_4_ * auVar17._0_4_;
          fVar247 = (float)local_780._4_4_ + auVar267._4_4_ * auVar17._4_4_;
          fVar249 = fStack_778 + auVar267._8_4_ * auVar17._8_4_;
          fVar251 = fStack_774 + auVar267._12_4_ * auVar17._12_4_;
          fVar308 = fStack_770 + auVar267._16_4_ * auVar17._16_4_;
          fVar188 = fStack_76c + auVar267._20_4_ * auVar17._20_4_;
          fVar159 = fStack_768 + auVar267._24_4_ * auVar17._24_4_;
          fVar295 = fStack_764 + auVar17._28_4_;
          fVar207 = pre->depth_scale;
          auVar55._4_4_ = (fVar247 + fVar247) * fVar207;
          auVar55._0_4_ = (fVar240 + fVar240) * fVar207;
          auVar55._8_4_ = (fVar249 + fVar249) * fVar207;
          auVar55._12_4_ = (fVar251 + fVar251) * fVar207;
          auVar55._16_4_ = (fVar308 + fVar308) * fVar207;
          auVar55._20_4_ = (fVar188 + fVar188) * fVar207;
          auVar55._24_4_ = (fVar159 + fVar159) * fVar207;
          auVar55._28_4_ = fVar295 + fVar295;
          local_380 = auVar277._0_32_;
          auVar17 = vcmpps_avx(local_380,auVar55,6);
          auVar22 = auVar234 & auVar17;
          if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar22 >> 0x7f,0) != '\0') ||
                (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar22 >> 0xbf,0) != '\0') ||
              (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar22[0x1f] < '\0') {
            auVar234 = vandps_avx(auVar17,auVar234);
            local_260._0_4_ = (float)local_260._0_4_ + (float)local_260._0_4_ + -1.0;
            local_260._4_4_ = (float)local_260._4_4_ + (float)local_260._4_4_ + -1.0;
            uStack_258._0_4_ = (float)uStack_258 + (float)uStack_258 + -1.0;
            uStack_258._4_4_ = uStack_258._4_4_ + uStack_258._4_4_ + -1.0;
            uStack_250._0_4_ = (float)uStack_250 + (float)uStack_250 + -1.0;
            uStack_250._4_4_ = uStack_250._4_4_ + uStack_250._4_4_ + -1.0;
            uStack_248._0_4_ = (float)uStack_248 + (float)uStack_248 + -1.0;
            uStack_248._4_4_ = uStack_248._4_4_ + uStack_248._4_4_ + -1.0;
            local_3c0 = auVar267._0_32_;
            auVar123 = _local_260;
            auVar17 = _local_260;
            local_3a0 = (float)local_260._0_4_;
            fStack_39c = (float)local_260._4_4_;
            fStack_398 = (float)uStack_258;
            fStack_394 = uStack_258._4_4_;
            fStack_390 = (float)uStack_250;
            fStack_38c = uStack_250._4_4_;
            fStack_388 = (float)uStack_248;
            fStack_384 = uStack_248._4_4_;
            local_360 = 0;
            local_35c = uVar12;
            local_350 = (float)local_7c0._0_4_;
            fStack_34c = (float)local_7c0._4_4_;
            fStack_348 = fStack_7b8;
            fStack_344 = fStack_7b4;
            local_340 = local_600;
            uStack_338 = uStack_5f8;
            local_330 = local_530;
            uStack_328 = uStack_528;
            local_320 = local_540;
            uStack_318 = uStack_538;
            local_300 = auVar234;
            _local_260 = auVar17;
            if ((pGVar13->mask & (ray->super_RayK<1>).mask) != 0) {
              local_4c0[0] = auVar234;
              auVar179._0_4_ = 1.0 / (float)(int)uVar12;
              auVar179._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar231 = vshufps_avx(auVar179,auVar179,0);
              local_2e0[0] = auVar231._0_4_ * (auVar267._0_4_ + 0.0);
              local_2e0[1] = auVar231._4_4_ * (auVar267._4_4_ + 1.0);
              local_2e0[2] = auVar231._8_4_ * (auVar267._8_4_ + 2.0);
              local_2e0[3] = auVar231._12_4_ * (auVar267._12_4_ + 3.0);
              fStack_2d0 = auVar231._0_4_ * (auVar267._16_4_ + 4.0);
              fStack_2cc = auVar231._4_4_ * (auVar267._20_4_ + 5.0);
              fStack_2c8 = auVar231._8_4_ * (auVar267._24_4_ + 6.0);
              fStack_2c4 = auVar267._28_4_ + 7.0;
              uStack_250 = auVar123._16_8_;
              uStack_248 = auVar17._24_8_;
              local_2c0 = local_260;
              uStack_2b8 = uStack_258;
              uStack_2b0 = uStack_250;
              uStack_2a8 = uStack_248;
              local_2a0 = local_380;
              auVar165._8_4_ = 0x7f800000;
              auVar165._0_8_ = 0x7f8000007f800000;
              auVar165._12_4_ = 0x7f800000;
              auVar165._16_4_ = 0x7f800000;
              auVar165._20_4_ = 0x7f800000;
              auVar165._24_4_ = 0x7f800000;
              auVar165._28_4_ = 0x7f800000;
              auVar17 = vblendvps_avx(auVar165,local_380,auVar234);
              auVar22 = vshufps_avx(auVar17,auVar17,0xb1);
              auVar22 = vminps_avx(auVar17,auVar22);
              auVar20 = vshufpd_avx(auVar22,auVar22,5);
              auVar22 = vminps_avx(auVar22,auVar20);
              auVar20 = vperm2f128_avx(auVar22,auVar22,1);
              auVar22 = vminps_avx(auVar22,auVar20);
              auVar17 = vcmpps_avx(auVar17,auVar22,0);
              auVar22 = auVar234 & auVar17;
              if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar22 >> 0x7f,0) != '\0') ||
                    (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar22 >> 0xbf,0) != '\0') ||
                  (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar22[0x1f] < '\0') {
                auVar234 = vandps_avx(auVar17,auVar234);
              }
              uVar124 = vmovmskps_avx(auVar234);
              uVar125 = 0;
              if (uVar124 != 0) {
                for (; (uVar124 >> uVar125 & 1) == 0; uVar125 = uVar125 + 1) {
                }
              }
              auVar129 = (undefined1  [8])(ulong)uVar125;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar207 = local_2e0[(long)auVar129];
                fVar240 = *(float *)((long)&local_2c0 + (long)auVar129 * 4);
                fVar249 = 1.0 - fVar207;
                fVar247 = fVar207 * fVar249 * 4.0;
                auVar231 = ZEXT416((uint)(fVar207 * fVar207 * 0.5));
                auVar231 = vshufps_avx(auVar231,auVar231,0);
                auVar182 = ZEXT416((uint)((fVar249 * fVar249 + fVar247) * 0.5));
                auVar182 = vshufps_avx(auVar182,auVar182,0);
                auVar196 = ZEXT416((uint)((-fVar207 * fVar207 - fVar247) * 0.5));
                auVar196 = vshufps_avx(auVar196,auVar196,0);
                auVar195 = ZEXT416((uint)(fVar249 * -fVar249 * 0.5));
                auVar195 = vshufps_avx(auVar195,auVar195,0);
                auVar180._0_4_ =
                     (float)local_7c0._0_4_ * auVar195._0_4_ +
                     auVar196._0_4_ * (float)local_600._0_4_ +
                     auVar231._0_4_ * (float)local_540._0_4_ +
                     auVar182._0_4_ * (float)local_530._0_4_;
                auVar180._4_4_ =
                     (float)local_7c0._4_4_ * auVar195._4_4_ +
                     auVar196._4_4_ * (float)local_600._4_4_ +
                     auVar231._4_4_ * (float)local_540._4_4_ +
                     auVar182._4_4_ * (float)local_530._4_4_;
                auVar180._8_4_ =
                     fStack_7b8 * auVar195._8_4_ +
                     auVar196._8_4_ * (float)uStack_5f8 +
                     auVar231._8_4_ * (float)uStack_538 + auVar182._8_4_ * (float)uStack_528;
                auVar180._12_4_ =
                     fStack_7b4 * auVar195._12_4_ +
                     auVar196._12_4_ * uStack_5f8._4_4_ +
                     auVar231._12_4_ * uStack_538._4_4_ + auVar182._12_4_ * uStack_528._4_4_;
                auVar202 = ZEXT464((uint)*(float *)(local_2a0 + (long)auVar129 * 4));
                (ray->super_RayK<1>).tfar = *(float *)(local_2a0 + (long)auVar129 * 4);
                uVar8 = vmovlps_avx(auVar180);
                *(undefined8 *)&(ray->Ng).field_0 = uVar8;
                fVar247 = (float)vextractps_avx(auVar180,2);
                (ray->Ng).field_0.field_0.z = fVar247;
                ray->u = fVar207;
                ray->v = fVar240;
                ray->primID = uVar127;
                ray->geomID = uVar11;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                _local_660 = _local_600;
                _local_6c0 = _local_530;
                _local_680 = _local_540;
                local_700 = auVar267._0_32_;
                local_720 = local_380;
                local_790 = pPVar130;
                local_798 = context;
                local_7a0 = ray;
                local_7a8 = pre;
                fVar207 = (float)local_7c0._0_4_;
                fVar240 = (float)local_7c0._4_4_;
                fVar247 = fStack_7b8;
                fVar249 = fStack_7b4;
                _local_7c0 = auVar135;
                do {
                  local_5e4 = local_2e0[(long)auVar129];
                  local_5e0 = *(undefined4 *)((long)&local_2c0 + (long)auVar129 * 4);
                  local_6a0._0_4_ = (ray->super_RayK<1>).tfar;
                  (ray->super_RayK<1>).tfar = *(float *)(local_2a0 + (long)auVar129 * 4);
                  local_750.context = context->user;
                  fVar308 = 1.0 - local_5e4;
                  fVar251 = local_5e4 * fVar308 * 4.0;
                  auVar231 = ZEXT416((uint)(local_5e4 * local_5e4 * 0.5));
                  auVar231 = vshufps_avx(auVar231,auVar231,0);
                  auVar182 = ZEXT416((uint)((fVar308 * fVar308 + fVar251) * 0.5));
                  auVar182 = vshufps_avx(auVar182,auVar182,0);
                  auVar196 = ZEXT416((uint)((-local_5e4 * local_5e4 - fVar251) * 0.5));
                  auVar196 = vshufps_avx(auVar196,auVar196,0);
                  auVar195 = ZEXT416((uint)(fVar308 * -fVar308 * 0.5));
                  auVar195 = vshufps_avx(auVar195,auVar195,0);
                  auVar197._0_4_ = fVar207 * auVar195._0_4_;
                  auVar197._4_4_ = fVar240 * auVar195._4_4_;
                  auVar197._8_4_ = fVar247 * auVar195._8_4_;
                  auVar197._12_4_ = fVar249 * auVar195._12_4_;
                  auVar202 = ZEXT1664(auVar197);
                  auVar185._0_4_ =
                       auVar197._0_4_ +
                       auVar196._0_4_ * (float)local_660._0_4_ +
                       auVar231._0_4_ * (float)local_680._0_4_ +
                       auVar182._0_4_ * (float)local_6c0._0_4_;
                  auVar185._4_4_ =
                       auVar197._4_4_ +
                       auVar196._4_4_ * (float)local_660._4_4_ +
                       auVar231._4_4_ * (float)local_680._4_4_ +
                       auVar182._4_4_ * (float)local_6c0._4_4_;
                  auVar185._8_4_ =
                       auVar197._8_4_ +
                       auVar196._8_4_ * fStack_658 +
                       auVar231._8_4_ * fStack_678 + auVar182._8_4_ * fStack_6b8;
                  auVar185._12_4_ =
                       auVar197._12_4_ +
                       auVar196._12_4_ * fStack_654 +
                       auVar231._12_4_ * fStack_674 + auVar182._12_4_ * fStack_6b4;
                  local_5f0 = vmovlps_avx(auVar185);
                  local_5e8 = vextractps_avx(auVar185,2);
                  local_5dc = uVar127;
                  local_5d8 = (int)local_788;
                  local_5d4 = (local_750.context)->instID[0];
                  local_5d0 = (local_750.context)->instPrimID[0];
                  local_7c4 = -1;
                  local_750.valid = &local_7c4;
                  local_750.geometryUserPtr = pGVar13->userPtr;
                  local_750.ray = (RTCRayN *)ray;
                  local_750.hit = (RTCHitN *)&local_5f0;
                  local_750.N = 1;
                  local_780 = auVar129;
                  if (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00efd528:
                    p_Var14 = context->args->filter;
                    if (p_Var14 != (RTCFilterFunctionN)0x0) {
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar13->field_8).field_0x2 & 0x40) != 0)) {
                        auVar202 = ZEXT1664(auVar202._0_16_);
                        (*p_Var14)(&local_750);
                        auVar277 = ZEXT3264(local_720);
                        auVar267 = ZEXT3264(local_700);
                        auVar129 = local_780;
                        pre = local_7a8;
                        pPVar130 = local_790;
                        context = local_798;
                        ray = local_7a0;
                        fVar207 = (float)local_7c0._0_4_;
                        fVar240 = (float)local_7c0._4_4_;
                        fVar247 = fStack_7b8;
                        fVar249 = fStack_7b4;
                        fVar228 = (float)local_5c0._0_4_;
                        fVar133 = (float)local_5c0._4_4_;
                        fVar150 = fStack_5b8;
                        fVar152 = fStack_5b4;
                        fVar227 = fStack_5b0;
                        fVar190 = fStack_5ac;
                        fVar236 = fStack_5a8;
                        fVar241 = (float)local_6e0._0_4_;
                        fVar248 = (float)local_6e0._4_4_;
                        fVar250 = fStack_6d8;
                        fVar252 = fStack_6d4;
                        fVar203 = fStack_6d0;
                        fVar237 = fStack_6cc;
                        fVar205 = fStack_6c8;
                        fVar238 = fStack_6c4;
                      }
                      if (*local_750.valid == 0) goto LAB_00efd60c;
                    }
                    (((Vec3f *)((long)local_750.ray + 0x30))->field_0).components[0] =
                         *(float *)local_750.hit;
                    (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_750.hit + 4);
                    (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_750.hit + 8);
                    *(float *)((long)local_750.ray + 0x3c) = *(float *)(local_750.hit + 0xc);
                    *(float *)((long)local_750.ray + 0x40) = *(float *)(local_750.hit + 0x10);
                    *(float *)((long)local_750.ray + 0x44) = *(float *)(local_750.hit + 0x14);
                    *(float *)((long)local_750.ray + 0x48) = *(float *)(local_750.hit + 0x18);
                    *(float *)((long)local_750.ray + 0x4c) = *(float *)(local_750.hit + 0x1c);
                    *(float *)((long)local_750.ray + 0x50) = *(float *)(local_750.hit + 0x20);
                    auVar129 = local_780;
                  }
                  else {
                    auVar202 = ZEXT1664(auVar197);
                    (*pGVar13->intersectionFilterN)(&local_750);
                    auVar277 = ZEXT3264(local_720);
                    auVar267 = ZEXT3264(local_700);
                    auVar129 = local_780;
                    pre = local_7a8;
                    pPVar130 = local_790;
                    context = local_798;
                    ray = local_7a0;
                    fVar207 = (float)local_7c0._0_4_;
                    fVar240 = (float)local_7c0._4_4_;
                    fVar247 = fStack_7b8;
                    fVar249 = fStack_7b4;
                    fVar228 = (float)local_5c0._0_4_;
                    fVar133 = (float)local_5c0._4_4_;
                    fVar150 = fStack_5b8;
                    fVar152 = fStack_5b4;
                    fVar227 = fStack_5b0;
                    fVar190 = fStack_5ac;
                    fVar236 = fStack_5a8;
                    fVar241 = (float)local_6e0._0_4_;
                    fVar248 = (float)local_6e0._4_4_;
                    fVar250 = fStack_6d8;
                    fVar252 = fStack_6d4;
                    fVar203 = fStack_6d0;
                    fVar237 = fStack_6cc;
                    fVar205 = fStack_6c8;
                    fVar238 = fStack_6c4;
                    if (*local_750.valid != 0) goto LAB_00efd528;
LAB_00efd60c:
                    (ray->super_RayK<1>).tfar = (float)local_6a0._0_4_;
                  }
                  *(undefined4 *)(local_4c0[0] + (long)auVar129 * 4) = 0;
                  auVar22 = local_4c0[0];
                  fVar251 = (ray->super_RayK<1>).tfar;
                  auVar147._4_4_ = fVar251;
                  auVar147._0_4_ = fVar251;
                  auVar147._8_4_ = fVar251;
                  auVar147._12_4_ = fVar251;
                  auVar147._16_4_ = fVar251;
                  auVar147._20_4_ = fVar251;
                  auVar147._24_4_ = fVar251;
                  auVar147._28_4_ = fVar251;
                  auVar17 = vcmpps_avx(auVar277._0_32_,auVar147,2);
                  auVar234 = vandps_avx(auVar17,local_4c0[0]);
                  local_4c0[0] = auVar234;
                  auVar22 = auVar22 & auVar17;
                  bVar106 = (auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar107 = (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar105 = (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar104 = SUB321(auVar22 >> 0x7f,0) != '\0';
                  bVar103 = (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar102 = SUB321(auVar22 >> 0xbf,0) != '\0';
                  bVar100 = (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar99 = auVar22[0x1f] < '\0';
                  if (((((((bVar106 || bVar107) || bVar105) || bVar104) || bVar103) || bVar102) ||
                      bVar100) || bVar99) {
                    auVar173._8_4_ = 0x7f800000;
                    auVar173._0_8_ = 0x7f8000007f800000;
                    auVar173._12_4_ = 0x7f800000;
                    auVar173._16_4_ = 0x7f800000;
                    auVar173._20_4_ = 0x7f800000;
                    auVar173._24_4_ = 0x7f800000;
                    auVar173._28_4_ = 0x7f800000;
                    auVar17 = vblendvps_avx(auVar173,auVar277._0_32_,auVar234);
                    auVar22 = vshufps_avx(auVar17,auVar17,0xb1);
                    auVar22 = vminps_avx(auVar17,auVar22);
                    auVar20 = vshufpd_avx(auVar22,auVar22,5);
                    auVar22 = vminps_avx(auVar22,auVar20);
                    auVar20 = vperm2f128_avx(auVar22,auVar22,1);
                    auVar202 = ZEXT3264(auVar20);
                    auVar22 = vminps_avx(auVar22,auVar20);
                    auVar17 = vcmpps_avx(auVar17,auVar22,0);
                    auVar22 = auVar234 & auVar17;
                    if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar22 >> 0x7f,0) != '\0') ||
                          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar22 >> 0xbf,0) != '\0') ||
                        (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar22[0x1f] < '\0') {
                      auVar234 = vandps_avx(auVar17,auVar234);
                    }
                    uVar125 = vmovmskps_avx(auVar234);
                    uVar11 = 0;
                    if (uVar125 != 0) {
                      for (; (uVar125 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                      }
                    }
                    auVar129 = (undefined1  [8])(ulong)uVar11;
                  }
                  auVar135 = _local_7c0;
                } while (((((((bVar106 || bVar107) || bVar105) || bVar104) || bVar103) || bVar102)
                         || bVar100) || bVar99);
              }
            }
          }
        }
        _local_7c0 = auVar135;
        auVar231 = local_640._0_16_;
      }
      auVar223 = ZEXT3264(_local_580);
      if (8 < (int)uVar12) {
        auVar182 = vpshufd_avx(ZEXT416(uVar12),0);
        local_460 = auVar182._0_4_;
        fStack_45c = auVar182._4_4_;
        fStack_458 = auVar182._8_4_;
        fStack_454 = auVar182._12_4_;
        auVar231 = vshufps_avx(auVar231,auVar231,0);
        local_240._16_16_ = auVar231;
        local_240._0_16_ = auVar231;
        auVar110._4_4_ = fStack_61c;
        auVar110._0_4_ = local_620;
        auVar110._8_4_ = fStack_618;
        auVar110._12_4_ = fStack_614;
        auVar231 = vpermilps_avx(auVar110,0);
        local_100._16_16_ = auVar231;
        local_100._0_16_ = auVar231;
        auVar138._0_4_ = 1.0 / (float)local_400._0_4_;
        auVar138._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar231 = vshufps_avx(auVar138,auVar138,0);
        _fStack_3f0 = auVar231;
        _local_400 = auVar231;
        auVar148 = ZEXT3264(_local_400);
        lVar132 = 8;
        local_700 = auVar267._0_32_;
        local_720 = auVar277._0_32_;
        fVar207 = (float)local_560._0_4_;
        fVar240 = (float)local_560._4_4_;
        fVar247 = fStack_558;
        fVar249 = fStack_554;
        fVar251 = fStack_550;
        fVar308 = fStack_54c;
        fVar188 = fStack_548;
        fVar159 = fStack_544;
        do {
          pauVar1 = (undefined1 (*) [28])(bspline_basis0 + lVar132 * 4 + lVar126);
          fVar295 = *(float *)*pauVar1;
          fVar296 = *(float *)(*pauVar1 + 4);
          fVar162 = *(float *)(*pauVar1 + 8);
          fVar297 = *(float *)(*pauVar1 + 0xc);
          fVar239 = *(float *)(*pauVar1 + 0x10);
          fVar299 = *(float *)(*pauVar1 + 0x14);
          fVar298 = *(float *)(*pauVar1 + 0x18);
          auVar120 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar126 + 0x222bfac + lVar132 * 4);
          fVar153 = *(float *)*pauVar1;
          fVar155 = *(float *)(*pauVar1 + 4);
          fVar157 = *(float *)(*pauVar1 + 8);
          fVar160 = *(float *)(*pauVar1 + 0xc);
          fVar271 = *(float *)(*pauVar1 + 0x10);
          fVar279 = *(float *)(*pauVar1 + 0x14);
          fVar281 = *(float *)(*pauVar1 + 0x18);
          auVar119 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar126 + 0x222c430 + lVar132 * 4);
          fVar282 = *(float *)*pauVar1;
          fVar284 = *(float *)(*pauVar1 + 4);
          fVar286 = *(float *)(*pauVar1 + 8);
          fVar288 = *(float *)(*pauVar1 + 0xc);
          fVar268 = *(float *)(*pauVar1 + 0x10);
          fVar211 = *(float *)(*pauVar1 + 0x14);
          fVar174 = *(float *)(*pauVar1 + 0x18);
          auVar118 = *pauVar1;
          pauVar3 = (undefined1 (*) [32])(lVar126 + 0x222c8b4 + lVar132 * 4);
          fVar290 = *(float *)*pauVar3;
          fVar149 = *(float *)(*pauVar3 + 4);
          fVar151 = *(float *)(*pauVar3 + 8);
          fVar154 = *(float *)(*pauVar3 + 0xc);
          fVar156 = *(float *)(*pauVar3 + 0x10);
          fVar158 = *(float *)(*pauVar3 + 0x14);
          fVar161 = *(float *)(*pauVar3 + 0x18);
          auVar117 = *(undefined1 (*) [28])*pauVar3;
          _local_220 = *pauVar3;
          auVar20 = _local_220;
          fVar253 = auVar202._28_4_;
          fVar189 = fVar253 + *(float *)(*pauVar3 + 0x1c);
          fStack_604 = fVar253 + fVar253 + auVar148._28_4_;
          fVar226 = fVar253 + fVar189;
          auVar202 = ZEXT3264(local_1e0);
          fVar191 = local_1e0._0_4_;
          fVar204 = local_1e0._4_4_;
          fVar206 = local_1e0._8_4_;
          fVar208 = local_1e0._12_4_;
          fVar209 = local_1e0._16_4_;
          fVar210 = local_1e0._20_4_;
          fVar269 = local_1e0._24_4_;
          local_640._0_4_ =
               fVar191 * fVar295 +
               (float)local_80._0_4_ * fVar153 +
               fVar207 * fVar282 + (float)local_3e0._0_4_ * fVar290;
          local_640._4_4_ =
               fVar204 * fVar296 +
               (float)local_80._4_4_ * fVar155 +
               fVar240 * fVar284 + (float)local_3e0._4_4_ * fVar149;
          local_640._8_4_ =
               fVar206 * fVar162 + fStack_78 * fVar157 + fVar247 * fVar286 + fStack_3d8 * fVar151;
          local_640._12_4_ =
               fVar208 * fVar297 + fStack_74 * fVar160 + fVar249 * fVar288 + fStack_3d4 * fVar154;
          local_640._16_4_ =
               fVar209 * fVar239 + fStack_70 * fVar271 + fVar251 * fVar268 + fStack_3d0 * fVar156;
          local_640._20_4_ =
               fVar210 * fVar299 + fStack_6c * fVar279 + fVar308 * fVar211 + fStack_3cc * fVar158;
          local_640._24_4_ =
               fVar269 * fVar298 + fStack_68 * fVar281 + fVar188 * fVar174 + fStack_3c8 * fVar161;
          local_640._28_4_ = fVar189 + fStack_604;
          auVar187._0_4_ =
               (float)local_200._0_4_ * fVar295 +
               (float)local_1c0._0_4_ * fVar153 + fVar228 * fVar282 + fVar241 * fVar290;
          auVar187._4_4_ =
               (float)local_200._4_4_ * fVar296 +
               (float)local_1c0._4_4_ * fVar155 + fVar133 * fVar284 + fVar248 * fVar149;
          auVar187._8_4_ =
               fStack_1f8 * fVar162 + fStack_1b8 * fVar157 + fVar150 * fVar286 + fVar250 * fVar151;
          auVar187._12_4_ =
               fStack_1f4 * fVar297 + fStack_1b4 * fVar160 + fVar152 * fVar288 + fVar252 * fVar154;
          auVar187._16_4_ =
               fStack_1f0 * fVar239 + fStack_1b0 * fVar271 + fVar227 * fVar268 + fVar203 * fVar156;
          auVar187._20_4_ =
               fStack_1ec * fVar299 + fStack_1ac * fVar279 + fVar190 * fVar211 + fVar237 * fVar158;
          auVar187._24_4_ =
               fStack_1e8 * fVar298 + fStack_1a8 * fVar281 + fVar236 * fVar174 + fVar205 * fVar161;
          auVar187._28_4_ = fStack_604 + fVar253 + fVar253 + auVar223._28_4_;
          local_620 = fVar295 * (float)local_160._0_4_ +
                      (float)local_a0._0_4_ * fVar153 +
                      fVar282 * (float)local_120._0_4_ + fVar290 * (float)local_140._0_4_;
          fStack_61c = fVar296 * (float)local_160._4_4_ +
                       (float)local_a0._4_4_ * fVar155 +
                       fVar284 * (float)local_120._4_4_ + fVar149 * (float)local_140._4_4_;
          fStack_618 = fVar162 * fStack_158 +
                       fStack_98 * fVar157 + fVar286 * fStack_118 + fVar151 * fStack_138;
          fStack_614 = fVar297 * fStack_154 +
                       fStack_94 * fVar160 + fVar288 * fStack_114 + fVar154 * fStack_134;
          fStack_610 = fVar239 * fStack_150 +
                       fStack_90 * fVar271 + fVar268 * fStack_110 + fVar156 * fStack_130;
          fStack_60c = fVar299 * fStack_14c +
                       fStack_8c * fVar279 + fVar211 * fStack_10c + fVar158 * fStack_12c;
          fStack_608 = fVar298 * fStack_148 +
                       fStack_88 * fVar281 + fVar174 * fStack_108 + fVar161 * fStack_128;
          fStack_604 = fStack_604 + fVar226;
          pfVar2 = (float *)(bspline_basis1 + lVar132 * 4 + lVar126);
          fVar295 = *pfVar2;
          fVar296 = pfVar2[1];
          fVar162 = pfVar2[2];
          fVar297 = pfVar2[3];
          fVar239 = pfVar2[4];
          fVar299 = pfVar2[5];
          fVar298 = pfVar2[6];
          pauVar1 = (undefined1 (*) [28])(lVar126 + 0x222e3cc + lVar132 * 4);
          fVar153 = *(float *)*pauVar1;
          fVar155 = *(float *)(*pauVar1 + 4);
          fVar157 = *(float *)(*pauVar1 + 8);
          fVar160 = *(float *)(*pauVar1 + 0xc);
          fVar271 = *(float *)(*pauVar1 + 0x10);
          fVar279 = *(float *)(*pauVar1 + 0x14);
          fVar281 = *(float *)(*pauVar1 + 0x18);
          auVar122 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar126 + 0x222e850 + lVar132 * 4);
          fVar282 = *(float *)*pauVar1;
          fVar284 = *(float *)(*pauVar1 + 4);
          fVar286 = *(float *)(*pauVar1 + 8);
          fVar288 = *(float *)(*pauVar1 + 0xc);
          fVar268 = *(float *)(*pauVar1 + 0x10);
          fVar211 = *(float *)(*pauVar1 + 0x14);
          fVar174 = *(float *)(*pauVar1 + 0x18);
          auVar121 = *pauVar1;
          pfVar4 = (float *)(lVar126 + 0x222ecd4 + lVar132 * 4);
          fVar290 = *pfVar4;
          fVar149 = pfVar4[1];
          fVar151 = pfVar4[2];
          fVar154 = pfVar4[3];
          fVar156 = pfVar4[4];
          fVar158 = pfVar4[5];
          fVar161 = pfVar4[6];
          fVar253 = fVar159 + pfVar4[7];
          fVar189 = fVar159 + fVar159 + fVar226;
          local_480._0_4_ =
               fVar295 * fVar191 +
               (float)local_80._0_4_ * fVar153 +
               fVar207 * fVar282 + (float)local_3e0._0_4_ * fVar290;
          local_480._4_4_ =
               fVar296 * fVar204 +
               (float)local_80._4_4_ * fVar155 +
               fVar240 * fVar284 + (float)local_3e0._4_4_ * fVar149;
          fStack_478 = fVar162 * fVar206 +
                       fStack_78 * fVar157 + fVar247 * fVar286 + fStack_3d8 * fVar151;
          fStack_474 = fVar297 * fVar208 +
                       fStack_74 * fVar160 + fVar249 * fVar288 + fStack_3d4 * fVar154;
          fStack_470 = fVar239 * fVar209 +
                       fStack_70 * fVar271 + fVar251 * fVar268 + fStack_3d0 * fVar156;
          fStack_46c = fVar299 * fVar210 +
                       fStack_6c * fVar279 + fVar308 * fVar211 + fStack_3cc * fVar158;
          fStack_468 = fVar298 * fVar269 +
                       fStack_68 * fVar281 + fVar188 * fVar174 + fStack_3c8 * fVar161;
          fStack_464 = fVar253 + fVar189;
          local_6a0._0_4_ =
               (float)local_200._0_4_ * fVar295 +
               fVar228 * fVar282 + fVar241 * fVar290 + (float)local_1c0._0_4_ * fVar153;
          local_6a0._4_4_ =
               (float)local_200._4_4_ * fVar296 +
               fVar133 * fVar284 + fVar248 * fVar149 + (float)local_1c0._4_4_ * fVar155;
          fStack_698 = fStack_1f8 * fVar162 +
                       fVar150 * fVar286 + fVar250 * fVar151 + fStack_1b8 * fVar157;
          fStack_694 = fStack_1f4 * fVar297 +
                       fVar152 * fVar288 + fVar252 * fVar154 + fStack_1b4 * fVar160;
          register0x00001350 =
               fStack_1f0 * fVar239 + fVar227 * fVar268 + fVar203 * fVar156 + fStack_1b0 * fVar271;
          register0x00001354 =
               fStack_1ec * fVar299 + fVar190 * fVar211 + fVar237 * fVar158 + fStack_1ac * fVar279;
          register0x00001358 =
               fStack_1e8 * fVar298 + fVar236 * fVar174 + fVar205 * fVar161 + fStack_1a8 * fVar281;
          register0x0000135c = fVar189 + fVar159 + fStack_3c4 + fVar159;
          auVar262._0_4_ =
               (float)local_a0._0_4_ * fVar153 +
               fVar282 * (float)local_120._0_4_ + fVar290 * (float)local_140._0_4_ +
               fVar295 * (float)local_160._0_4_;
          auVar262._4_4_ =
               (float)local_a0._4_4_ * fVar155 +
               fVar284 * (float)local_120._4_4_ + fVar149 * (float)local_140._4_4_ +
               fVar296 * (float)local_160._4_4_;
          auVar262._8_4_ =
               fStack_98 * fVar157 + fVar286 * fStack_118 + fVar151 * fStack_138 +
               fVar162 * fStack_158;
          auVar262._12_4_ =
               fStack_94 * fVar160 + fVar288 * fStack_114 + fVar154 * fStack_134 +
               fVar297 * fStack_154;
          auVar262._16_4_ =
               fStack_90 * fVar271 + fVar268 * fStack_110 + fVar156 * fStack_130 +
               fVar239 * fStack_150;
          auVar262._20_4_ =
               fStack_8c * fVar279 + fVar211 * fStack_10c + fVar158 * fStack_12c +
               fVar299 * fStack_14c;
          auVar262._24_4_ =
               fStack_88 * fVar281 + fVar174 * fStack_108 + fVar161 * fStack_128 +
               fVar298 * fStack_148;
          auVar262._28_4_ = fVar159 + fVar253 + fVar189;
          auVar17 = vsubps_avx(_local_480,local_640);
          _local_440 = vsubps_avx(_local_6a0,auVar187);
          fVar251 = auVar17._0_4_;
          fVar308 = auVar17._4_4_;
          auVar56._4_4_ = fVar308 * auVar187._4_4_;
          auVar56._0_4_ = fVar251 * auVar187._0_4_;
          fVar188 = auVar17._8_4_;
          auVar56._8_4_ = fVar188 * auVar187._8_4_;
          fVar159 = auVar17._12_4_;
          auVar56._12_4_ = fVar159 * auVar187._12_4_;
          fVar153 = auVar17._16_4_;
          auVar56._16_4_ = fVar153 * auVar187._16_4_;
          fVar155 = auVar17._20_4_;
          auVar56._20_4_ = fVar155 * auVar187._20_4_;
          fVar157 = auVar17._24_4_;
          auVar56._24_4_ = fVar157 * auVar187._24_4_;
          auVar56._28_4_ = fVar189;
          fVar227 = local_440._0_4_;
          fVar190 = local_440._4_4_;
          auVar57._4_4_ = local_640._4_4_ * fVar190;
          auVar57._0_4_ = (float)local_640._0_4_ * fVar227;
          fVar236 = local_440._8_4_;
          auVar57._8_4_ = local_640._8_4_ * fVar236;
          fVar207 = local_440._12_4_;
          auVar57._12_4_ = local_640._12_4_ * fVar207;
          fVar240 = local_440._16_4_;
          auVar57._16_4_ = local_640._16_4_ * fVar240;
          fVar247 = local_440._20_4_;
          auVar57._20_4_ = local_640._20_4_ * fVar247;
          fVar249 = local_440._24_4_;
          auVar57._24_4_ = local_640._24_4_ * fVar249;
          auVar57._28_4_ = register0x0000135c;
          auVar22 = vsubps_avx(auVar56,auVar57);
          auVar111._4_4_ = fStack_61c;
          auVar111._0_4_ = local_620;
          auVar111._8_4_ = fStack_618;
          auVar111._12_4_ = fStack_614;
          auVar111._16_4_ = fStack_610;
          auVar111._20_4_ = fStack_60c;
          auVar111._24_4_ = fStack_608;
          auVar111._28_4_ = fStack_604;
          auVar148 = ZEXT3264(auVar111);
          auVar234 = vmaxps_avx(auVar111,auVar262);
          auVar58._4_4_ = auVar234._4_4_ * auVar234._4_4_ * (fVar308 * fVar308 + fVar190 * fVar190);
          auVar58._0_4_ = auVar234._0_4_ * auVar234._0_4_ * (fVar251 * fVar251 + fVar227 * fVar227);
          auVar58._8_4_ = auVar234._8_4_ * auVar234._8_4_ * (fVar188 * fVar188 + fVar236 * fVar236);
          auVar58._12_4_ =
               auVar234._12_4_ * auVar234._12_4_ * (fVar159 * fVar159 + fVar207 * fVar207);
          auVar58._16_4_ =
               auVar234._16_4_ * auVar234._16_4_ * (fVar153 * fVar153 + fVar240 * fVar240);
          auVar58._20_4_ =
               auVar234._20_4_ * auVar234._20_4_ * (fVar155 * fVar155 + fVar247 * fVar247);
          auVar58._24_4_ =
               auVar234._24_4_ * auVar234._24_4_ * (fVar157 * fVar157 + fVar249 * fVar249);
          auVar58._28_4_ = fVar253 + register0x0000135c;
          auVar59._4_4_ = auVar22._4_4_ * auVar22._4_4_;
          auVar59._0_4_ = auVar22._0_4_ * auVar22._0_4_;
          auVar59._8_4_ = auVar22._8_4_ * auVar22._8_4_;
          auVar59._12_4_ = auVar22._12_4_ * auVar22._12_4_;
          auVar59._16_4_ = auVar22._16_4_ * auVar22._16_4_;
          auVar59._20_4_ = auVar22._20_4_ * auVar22._20_4_;
          auVar59._24_4_ = auVar22._24_4_ * auVar22._24_4_;
          auVar59._28_4_ = auVar22._28_4_;
          auVar223 = ZEXT3264(auVar59);
          auVar234 = vcmpps_avx(auVar59,auVar58,2);
          local_360 = (uint)lVar132;
          auVar182 = vpshufd_avx(ZEXT416(local_360),0);
          auVar231 = vpor_avx(auVar182,_DAT_01ff0cf0);
          auVar182 = vpor_avx(auVar182,_DAT_02020ea0);
          auVar115._4_4_ = fStack_45c;
          auVar115._0_4_ = local_460;
          auVar115._8_4_ = fStack_458;
          auVar115._12_4_ = fStack_454;
          auVar231 = vpcmpgtd_avx(auVar115,auVar231);
          auVar182 = vpcmpgtd_avx(auVar115,auVar182);
          auVar166._16_16_ = auVar182;
          auVar166._0_16_ = auVar231;
          auVar22 = auVar166 & auVar234;
          fVar207 = (float)local_560._0_4_;
          fVar240 = (float)local_560._4_4_;
          fVar247 = fStack_558;
          fVar249 = fStack_554;
          fVar251 = fStack_550;
          fVar308 = fStack_54c;
          fVar188 = fStack_548;
          fVar159 = fStack_544;
          if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar22 >> 0x7f,0) == '\0') &&
                (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar22 >> 0xbf,0) == '\0') &&
              (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar22[0x1f]) {
LAB_00efcbc4:
            auVar277 = ZEXT3264(local_720);
            auVar267 = ZEXT3264(local_700);
          }
          else {
            local_5a0._0_4_ = auVar122._0_4_;
            local_5a0._4_4_ = auVar122._4_4_;
            fStack_598 = auVar122._8_4_;
            fStack_594 = auVar122._12_4_;
            fStack_590 = auVar122._16_4_;
            fStack_58c = auVar122._20_4_;
            fStack_588 = auVar122._24_4_;
            fVar271 = (float)local_180._0_4_ * (float)local_5a0._0_4_;
            fVar279 = (float)local_180._4_4_ * (float)local_5a0._4_4_;
            fVar281 = fStack_178 * fStack_598;
            fVar282 = fStack_174 * fStack_594;
            fVar284 = fStack_170 * fStack_590;
            fVar286 = fStack_16c * fStack_58c;
            fVar288 = fStack_168 * fStack_588;
            _local_5a0 = auVar234;
            local_500._0_4_ = auVar121._0_4_;
            local_500._4_4_ = auVar121._4_4_;
            fStack_4f8 = auVar121._8_4_;
            fStack_4f4 = auVar121._12_4_;
            fStack_4f0 = auVar121._16_4_;
            fStack_4ec = auVar121._20_4_;
            fStack_4e8 = auVar121._24_4_;
            fVar227 = (float)local_c0._0_4_ * (float)local_500._0_4_;
            fVar190 = (float)local_c0._4_4_ * (float)local_500._4_4_;
            fVar236 = fStack_b8 * fStack_4f8;
            fVar153 = fStack_b4 * fStack_4f4;
            fVar155 = fStack_b0 * fStack_4f0;
            fVar157 = fStack_ac * fStack_4ec;
            fVar160 = fStack_a8 * fStack_4e8;
            _local_500 = auVar166;
            local_520 = fVar295 * (float)local_4e0._0_4_ +
                        fVar271 + fVar227 + (float)local_580._0_4_ * fVar290;
            fStack_51c = fVar296 * (float)local_4e0._4_4_ +
                         fVar279 + fVar190 + (float)local_580._4_4_ * fVar149;
            fStack_518 = fVar162 * fStack_4d8 + fVar281 + fVar236 + fStack_578 * fVar151;
            fStack_514 = fVar297 * fStack_4d4 + fVar282 + fVar153 + fStack_574 * fVar154;
            fStack_510 = fVar239 * fStack_4d0 + fVar284 + fVar155 + fStack_570 * fVar156;
            fStack_50c = fVar299 * fStack_4cc + fVar286 + fVar157 + fStack_56c * fVar158;
            fStack_508 = fVar298 * fStack_4c8 + fVar288 + fVar160 + fStack_568 * fVar161;
            fStack_504 = fStack_464 + fStack_604 + auVar182._12_4_ + 0.0;
            local_6c0._0_4_ = auVar119._0_4_;
            local_6c0._4_4_ = auVar119._4_4_;
            fStack_6b8 = auVar119._8_4_;
            fStack_6b4 = auVar119._12_4_;
            auStack_6b0._0_4_ = auVar119._16_4_;
            auStack_6b0._4_4_ = auVar119._20_4_;
            fStack_6a8 = auVar119._24_4_;
            fVar133 = (float)local_180._0_4_ * (float)local_6c0._0_4_;
            fVar150 = (float)local_180._4_4_ * (float)local_6c0._4_4_;
            fVar152 = fStack_178 * fStack_6b8;
            fVar154 = fStack_174 * fStack_6b4;
            fVar156 = fStack_170 * (float)auStack_6b0._0_4_;
            fVar158 = fStack_16c * (float)auStack_6b0._4_4_;
            fVar161 = fStack_168 * fStack_6a8;
            local_680._0_4_ = auVar118._0_4_;
            local_680._4_4_ = auVar118._4_4_;
            fStack_678 = auVar118._8_4_;
            fStack_674 = auVar118._12_4_;
            auStack_670._0_4_ = auVar118._16_4_;
            auStack_670._4_4_ = auVar118._20_4_;
            fStack_668 = auVar118._24_4_;
            local_220._0_4_ = auVar117._0_4_;
            local_220._4_4_ = auVar117._4_4_;
            fStack_218 = auVar117._8_4_;
            fStack_214 = auVar117._12_4_;
            fStack_210 = auVar117._16_4_;
            fStack_20c = auVar117._20_4_;
            fStack_208 = auVar117._24_4_;
            pfVar4 = (float *)(lVar126 + 0x222d640 + lVar132 * 4);
            fVar227 = *pfVar4;
            fVar190 = pfVar4[1];
            fVar236 = pfVar4[2];
            fVar295 = pfVar4[3];
            fVar296 = pfVar4[4];
            fVar162 = pfVar4[5];
            fVar297 = pfVar4[6];
            pfVar5 = (float *)(lVar126 + 0x222dac4 + lVar132 * 4);
            fVar239 = *pfVar5;
            fVar299 = pfVar5[1];
            fVar298 = pfVar5[2];
            fVar153 = pfVar5[3];
            fVar155 = pfVar5[4];
            fVar157 = pfVar5[5];
            fVar160 = pfVar5[6];
            _local_6c0 = auVar262;
            pfVar6 = (float *)(lVar126 + 0x222d1bc + lVar132 * 4);
            fVar271 = *pfVar6;
            fVar279 = pfVar6[1];
            fVar281 = pfVar6[2];
            fVar282 = pfVar6[3];
            fVar284 = pfVar6[4];
            fVar286 = pfVar6[5];
            fVar288 = pfVar6[6];
            fVar189 = pfVar4[7] + pfVar5[7];
            fVar253 = pfVar5[7] + fStack_1e4 + 0.0;
            fVar226 = fStack_1e4 + pfVar2[7] + fStack_1e4 + 0.0;
            pfVar2 = (float *)(lVar126 + 0x222cd38 + lVar132 * 4);
            fVar268 = *pfVar2;
            fVar211 = pfVar2[1];
            fVar174 = pfVar2[2];
            fVar290 = pfVar2[3];
            fVar149 = pfVar2[4];
            fVar151 = pfVar2[5];
            fVar228 = pfVar2[6];
            auVar142._0_4_ =
                 fVar268 * fVar191 +
                 (float)local_80._0_4_ * fVar271 +
                 (float)local_560._0_4_ * fVar227 + (float)local_3e0._0_4_ * fVar239;
            auVar142._4_4_ =
                 fVar211 * fVar204 +
                 (float)local_80._4_4_ * fVar279 +
                 (float)local_560._4_4_ * fVar190 + (float)local_3e0._4_4_ * fVar299;
            auVar142._8_4_ =
                 fVar174 * fVar206 +
                 fStack_78 * fVar281 + fStack_558 * fVar236 + fStack_3d8 * fVar298;
            auVar142._12_4_ =
                 fVar290 * fVar208 +
                 fStack_74 * fVar282 + fStack_554 * fVar295 + fStack_3d4 * fVar153;
            auVar142._16_4_ =
                 fVar149 * fVar209 +
                 fStack_70 * fVar284 + fStack_550 * fVar296 + fStack_3d0 * fVar155;
            auVar142._20_4_ =
                 fVar151 * fVar210 +
                 fStack_6c * fVar286 + fStack_54c * fVar162 + fStack_3cc * fVar157;
            auVar142._24_4_ =
                 fVar228 * fVar269 +
                 fStack_68 * fVar288 + fStack_548 * fVar297 + fStack_3c8 * fVar160;
            auVar142._28_4_ = fVar189 + fVar253;
            auVar167._0_4_ =
                 fVar268 * (float)local_200._0_4_ +
                 (float)local_5c0._0_4_ * fVar227 + fVar241 * fVar239 +
                 (float)local_1c0._0_4_ * fVar271;
            auVar167._4_4_ =
                 fVar211 * (float)local_200._4_4_ +
                 (float)local_5c0._4_4_ * fVar190 + fVar248 * fVar299 +
                 (float)local_1c0._4_4_ * fVar279;
            auVar167._8_4_ =
                 fVar174 * fStack_1f8 +
                 fStack_5b8 * fVar236 + fVar250 * fVar298 + fStack_1b8 * fVar281;
            auVar167._12_4_ =
                 fVar290 * fStack_1f4 +
                 fStack_5b4 * fVar295 + fVar252 * fVar153 + fStack_1b4 * fVar282;
            auVar167._16_4_ =
                 fVar149 * fStack_1f0 +
                 fStack_5b0 * fVar296 + fVar203 * fVar155 + fStack_1b0 * fVar284;
            auVar167._20_4_ =
                 fVar151 * fStack_1ec +
                 fStack_5ac * fVar162 + fVar237 * fVar157 + fStack_1ac * fVar286;
            auVar167._24_4_ =
                 fVar228 * fStack_1e8 +
                 fStack_5a8 * fVar297 + fVar205 * fVar160 + fStack_1a8 * fVar288;
            auVar167._28_4_ = fVar253 + fVar226;
            auVar311._0_4_ =
                 fVar271 * (float)local_180._0_4_ +
                 (float)local_c0._0_4_ * fVar227 + (float)local_580._0_4_ * fVar239 +
                 fVar268 * (float)local_4e0._0_4_;
            auVar311._4_4_ =
                 fVar279 * (float)local_180._4_4_ +
                 (float)local_c0._4_4_ * fVar190 + (float)local_580._4_4_ * fVar299 +
                 fVar211 * (float)local_4e0._4_4_;
            auVar311._8_4_ =
                 fVar281 * fStack_178 + fStack_b8 * fVar236 + fStack_578 * fVar298 +
                 fVar174 * fStack_4d8;
            auVar311._12_4_ =
                 fVar282 * fStack_174 + fStack_b4 * fVar295 + fStack_574 * fVar153 +
                 fVar290 * fStack_4d4;
            auVar311._16_4_ =
                 fVar284 * fStack_170 + fStack_b0 * fVar296 + fStack_570 * fVar155 +
                 fVar149 * fStack_4d0;
            auVar311._20_4_ =
                 fVar286 * fStack_16c + fStack_ac * fVar162 + fStack_56c * fVar157 +
                 fVar151 * fStack_4cc;
            auVar311._24_4_ =
                 fVar288 * fStack_168 + fStack_a8 * fVar297 + fStack_568 * fVar160 +
                 fVar228 * fStack_4c8;
            auVar311._28_4_ = pfVar6[7] + fVar189 + fVar226;
            pfVar2 = (float *)(lVar126 + 0x222fa60 + lVar132 * 4);
            fVar227 = *pfVar2;
            fVar190 = pfVar2[1];
            fVar236 = pfVar2[2];
            fVar295 = pfVar2[3];
            fVar296 = pfVar2[4];
            fVar162 = pfVar2[5];
            fVar297 = pfVar2[6];
            pfVar4 = (float *)(lVar126 + 0x222fee4 + lVar132 * 4);
            fVar239 = *pfVar4;
            fVar299 = pfVar4[1];
            fVar298 = pfVar4[2];
            fVar153 = pfVar4[3];
            fVar155 = pfVar4[4];
            fVar157 = pfVar4[5];
            fVar160 = pfVar4[6];
            pfVar5 = (float *)(lVar126 + 0x222f5dc + lVar132 * 4);
            fVar271 = *pfVar5;
            fVar279 = pfVar5[1];
            fVar281 = pfVar5[2];
            fVar282 = pfVar5[3];
            fVar284 = pfVar5[4];
            fVar286 = pfVar5[5];
            fVar288 = pfVar5[6];
            pfVar6 = (float *)(lVar126 + 0x222f158 + lVar132 * 4);
            fVar268 = *pfVar6;
            fVar211 = pfVar6[1];
            fVar174 = pfVar6[2];
            fVar290 = pfVar6[3];
            fVar149 = pfVar6[4];
            fVar151 = pfVar6[5];
            fVar228 = pfVar6[6];
            auVar275._0_4_ =
                 fVar268 * fVar191 +
                 (float)local_80._0_4_ * fVar271 +
                 (float)local_560._0_4_ * fVar227 + (float)local_3e0._0_4_ * fVar239;
            auVar275._4_4_ =
                 fVar211 * fVar204 +
                 (float)local_80._4_4_ * fVar279 +
                 (float)local_560._4_4_ * fVar190 + (float)local_3e0._4_4_ * fVar299;
            auVar275._8_4_ =
                 fVar174 * fVar206 +
                 fStack_78 * fVar281 + fStack_558 * fVar236 + fStack_3d8 * fVar298;
            auVar275._12_4_ =
                 fVar290 * fVar208 +
                 fStack_74 * fVar282 + fStack_554 * fVar295 + fStack_3d4 * fVar153;
            auVar275._16_4_ =
                 fVar149 * fVar209 +
                 fStack_70 * fVar284 + fStack_550 * fVar296 + fStack_3d0 * fVar155;
            auVar275._20_4_ =
                 fVar151 * fVar210 +
                 fStack_6c * fVar286 + fStack_54c * fVar162 + fStack_3cc * fVar157;
            auVar275._24_4_ =
                 fVar228 * fVar269 +
                 fStack_68 * fVar288 + fStack_548 * fVar297 + fStack_3c8 * fVar160;
            auVar275._28_4_ = fStack_1a4 + fStack_1a4 + fStack_3c4 + fStack_1a4;
            auVar303._0_4_ =
                 fVar268 * (float)local_200._0_4_ +
                 fVar271 * (float)local_1c0._0_4_ +
                 (float)local_5c0._0_4_ * fVar227 + fVar241 * fVar239;
            auVar303._4_4_ =
                 fVar211 * (float)local_200._4_4_ +
                 fVar279 * (float)local_1c0._4_4_ +
                 (float)local_5c0._4_4_ * fVar190 + fVar248 * fVar299;
            auVar303._8_4_ =
                 fVar174 * fStack_1f8 +
                 fVar281 * fStack_1b8 + fStack_5b8 * fVar236 + fVar250 * fVar298;
            auVar303._12_4_ =
                 fVar290 * fStack_1f4 +
                 fVar282 * fStack_1b4 + fStack_5b4 * fVar295 + fVar252 * fVar153;
            auVar303._16_4_ =
                 fVar149 * fStack_1f0 +
                 fVar284 * fStack_1b0 + fStack_5b0 * fVar296 + fVar203 * fVar155;
            auVar303._20_4_ =
                 fVar151 * fStack_1ec +
                 fVar286 * fStack_1ac + fStack_5ac * fVar162 + fVar237 * fVar157;
            auVar303._24_4_ =
                 fVar228 * fStack_1e8 +
                 fVar288 * fStack_1a8 + fStack_5a8 * fVar297 + fVar205 * fVar160;
            auVar303._28_4_ = fStack_1a4 + fStack_1a4 + fStack_544 + fStack_1a4;
            auVar235._8_4_ = 0x7fffffff;
            auVar235._0_8_ = 0x7fffffff7fffffff;
            auVar235._12_4_ = 0x7fffffff;
            auVar235._16_4_ = 0x7fffffff;
            auVar235._20_4_ = 0x7fffffff;
            auVar235._24_4_ = 0x7fffffff;
            auVar235._28_4_ = 0x7fffffff;
            auVar22 = vandps_avx(auVar142,auVar235);
            auVar21 = vandps_avx(auVar167,auVar235);
            auVar21 = vmaxps_avx(auVar22,auVar21);
            auVar22 = vandps_avx(auVar311,auVar235);
            auVar21 = vmaxps_avx(auVar21,auVar22);
            auVar21 = vcmpps_avx(auVar21,local_240,1);
            auVar27 = vblendvps_avx(auVar142,auVar17,auVar21);
            auVar143._0_4_ =
                 fVar268 * (float)local_4e0._0_4_ +
                 fVar271 * (float)local_180._0_4_ +
                 fVar239 * (float)local_580._0_4_ + (float)local_c0._0_4_ * fVar227;
            auVar143._4_4_ =
                 fVar211 * (float)local_4e0._4_4_ +
                 fVar279 * (float)local_180._4_4_ +
                 fVar299 * (float)local_580._4_4_ + (float)local_c0._4_4_ * fVar190;
            auVar143._8_4_ =
                 fVar174 * fStack_4d8 +
                 fVar281 * fStack_178 + fVar298 * fStack_578 + fStack_b8 * fVar236;
            auVar143._12_4_ =
                 fVar290 * fStack_4d4 +
                 fVar282 * fStack_174 + fVar153 * fStack_574 + fStack_b4 * fVar295;
            auVar143._16_4_ =
                 fVar149 * fStack_4d0 +
                 fVar284 * fStack_170 + fVar155 * fStack_570 + fStack_b0 * fVar296;
            auVar143._20_4_ =
                 fVar151 * fStack_4cc +
                 fVar286 * fStack_16c + fVar157 * fStack_56c + fStack_ac * fVar162;
            auVar143._24_4_ =
                 fVar228 * fStack_4c8 +
                 fVar288 * fStack_168 + fVar160 * fStack_568 + fStack_a8 * fVar297;
            auVar143._28_4_ = auVar22._28_4_ + pfVar5[7] + pfVar4[7] + pfVar2[7];
            auVar15 = vblendvps_avx(auVar167,_local_440,auVar21);
            auVar22 = vandps_avx(auVar275,auVar235);
            auVar21 = vandps_avx(auVar303,auVar235);
            auVar198 = vmaxps_avx(auVar22,auVar21);
            auVar22 = vandps_avx(auVar143,auVar235);
            auVar22 = vmaxps_avx(auVar198,auVar22);
            local_660._0_4_ = auVar120._0_4_;
            local_660._4_4_ = auVar120._4_4_;
            fStack_658 = auVar120._8_4_;
            fStack_654 = auVar120._12_4_;
            auStack_650._0_4_ = auVar120._16_4_;
            auStack_650._4_4_ = auVar120._20_4_;
            fStack_648 = auVar120._24_4_;
            auVar21 = vcmpps_avx(auVar22,local_240,1);
            auVar22 = vblendvps_avx(auVar275,auVar17,auVar21);
            auVar144._0_4_ =
                 (float)local_4e0._0_4_ * (float)local_660._0_4_ +
                 fVar133 + (float)local_c0._0_4_ * (float)local_680._0_4_ +
                           (float)local_580._0_4_ * (float)local_220._0_4_;
            auVar144._4_4_ =
                 (float)local_4e0._4_4_ * (float)local_660._4_4_ +
                 fVar150 + (float)local_c0._4_4_ * (float)local_680._4_4_ +
                           (float)local_580._4_4_ * (float)local_220._4_4_;
            auVar144._8_4_ =
                 fStack_4d8 * fStack_658 +
                 fVar152 + fStack_b8 * fStack_678 + fStack_578 * fStack_218;
            auVar144._12_4_ =
                 fStack_4d4 * fStack_654 +
                 fVar154 + fStack_b4 * fStack_674 + fStack_574 * fStack_214;
            auVar144._16_4_ =
                 fStack_4d0 * (float)auStack_650._0_4_ +
                 fVar156 + fStack_b0 * (float)auStack_670._0_4_ + fStack_570 * fStack_210;
            auVar144._20_4_ =
                 fStack_4cc * (float)auStack_650._4_4_ +
                 fVar158 + fStack_ac * (float)auStack_670._4_4_ + fStack_56c * fStack_20c;
            auVar144._24_4_ =
                 fStack_4c8 * fStack_648 +
                 fVar161 + fStack_a8 * fStack_668 + fStack_568 * fStack_208;
            auVar144._28_4_ = auVar198._28_4_ + fStack_504 + auVar182._12_4_ + 0.0;
            auVar21 = vblendvps_avx(auVar303,_local_440,auVar21);
            fVar241 = auVar27._0_4_;
            fVar248 = auVar27._4_4_;
            fVar250 = auVar27._8_4_;
            fVar252 = auVar27._12_4_;
            fVar154 = auVar27._16_4_;
            fVar156 = auVar27._20_4_;
            fVar158 = auVar27._24_4_;
            fVar161 = auVar27._28_4_;
            fVar153 = auVar22._0_4_;
            fVar157 = auVar22._4_4_;
            fVar271 = auVar22._8_4_;
            fVar281 = auVar22._12_4_;
            fVar284 = auVar22._16_4_;
            fVar288 = auVar22._20_4_;
            fVar211 = auVar22._24_4_;
            fVar227 = auVar15._0_4_;
            fVar236 = auVar15._4_4_;
            fVar237 = auVar15._8_4_;
            fVar295 = auVar15._12_4_;
            fVar296 = auVar15._16_4_;
            fVar297 = auVar15._20_4_;
            fVar299 = auVar15._24_4_;
            auVar292._0_4_ = fVar227 * fVar227 + fVar241 * fVar241;
            auVar292._4_4_ = fVar236 * fVar236 + fVar248 * fVar248;
            auVar292._8_4_ = fVar237 * fVar237 + fVar250 * fVar250;
            auVar292._12_4_ = fVar295 * fVar295 + fVar252 * fVar252;
            auVar292._16_4_ = fVar296 * fVar296 + fVar154 * fVar154;
            auVar292._20_4_ = fVar297 * fVar297 + fVar156 * fVar156;
            auVar292._24_4_ = fVar299 * fVar299 + fVar158 * fVar158;
            auVar292._28_4_ = fVar238 + auVar17._28_4_;
            auVar17 = vrsqrtps_avx(auVar292);
            fVar190 = auVar17._0_4_;
            fVar203 = auVar17._4_4_;
            auVar60._4_4_ = fVar203 * 1.5;
            auVar60._0_4_ = fVar190 * 1.5;
            fVar205 = auVar17._8_4_;
            auVar60._8_4_ = fVar205 * 1.5;
            fVar238 = auVar17._12_4_;
            auVar60._12_4_ = fVar238 * 1.5;
            fVar162 = auVar17._16_4_;
            auVar60._16_4_ = fVar162 * 1.5;
            fVar239 = auVar17._20_4_;
            auVar60._20_4_ = fVar239 * 1.5;
            fVar298 = auVar17._24_4_;
            auVar60._24_4_ = fVar298 * 1.5;
            auVar60._28_4_ = auVar303._28_4_;
            auVar61._4_4_ = fVar203 * fVar203 * fVar203 * auVar292._4_4_ * 0.5;
            auVar61._0_4_ = fVar190 * fVar190 * fVar190 * auVar292._0_4_ * 0.5;
            auVar61._8_4_ = fVar205 * fVar205 * fVar205 * auVar292._8_4_ * 0.5;
            auVar61._12_4_ = fVar238 * fVar238 * fVar238 * auVar292._12_4_ * 0.5;
            auVar61._16_4_ = fVar162 * fVar162 * fVar162 * auVar292._16_4_ * 0.5;
            auVar61._20_4_ = fVar239 * fVar239 * fVar239 * auVar292._20_4_ * 0.5;
            auVar61._24_4_ = fVar298 * fVar298 * fVar298 * auVar292._24_4_ * 0.5;
            auVar61._28_4_ = auVar292._28_4_;
            auVar27 = vsubps_avx(auVar60,auVar61);
            fVar290 = auVar27._0_4_;
            fVar149 = auVar27._4_4_;
            fVar151 = auVar27._8_4_;
            fVar228 = auVar27._12_4_;
            fVar133 = auVar27._16_4_;
            fVar150 = auVar27._20_4_;
            fVar152 = auVar27._24_4_;
            fVar190 = auVar21._0_4_;
            fVar203 = auVar21._4_4_;
            fVar205 = auVar21._8_4_;
            fVar238 = auVar21._12_4_;
            fVar162 = auVar21._16_4_;
            fVar239 = auVar21._20_4_;
            fVar298 = auVar21._24_4_;
            auVar266._0_4_ = fVar190 * fVar190 + fVar153 * fVar153;
            auVar266._4_4_ = fVar203 * fVar203 + fVar157 * fVar157;
            auVar266._8_4_ = fVar205 * fVar205 + fVar271 * fVar271;
            auVar266._12_4_ = fVar238 * fVar238 + fVar281 * fVar281;
            auVar266._16_4_ = fVar162 * fVar162 + fVar284 * fVar284;
            auVar266._20_4_ = fVar239 * fVar239 + fVar288 * fVar288;
            auVar266._24_4_ = fVar298 * fVar298 + fVar211 * fVar211;
            auVar266._28_4_ = auVar17._28_4_ + auVar22._28_4_;
            auVar17 = vrsqrtps_avx(auVar266);
            fVar155 = auVar17._0_4_;
            fVar160 = auVar17._4_4_;
            auVar62._4_4_ = fVar160 * 1.5;
            auVar62._0_4_ = fVar155 * 1.5;
            fVar279 = auVar17._8_4_;
            auVar62._8_4_ = fVar279 * 1.5;
            fVar282 = auVar17._12_4_;
            auVar62._12_4_ = fVar282 * 1.5;
            fVar286 = auVar17._16_4_;
            auVar62._16_4_ = fVar286 * 1.5;
            fVar268 = auVar17._20_4_;
            auVar62._20_4_ = fVar268 * 1.5;
            fVar174 = auVar17._24_4_;
            auVar62._24_4_ = fVar174 * 1.5;
            auVar62._28_4_ = auVar303._28_4_;
            auVar63._4_4_ = fVar160 * fVar160 * fVar160 * auVar266._4_4_ * 0.5;
            auVar63._0_4_ = fVar155 * fVar155 * fVar155 * auVar266._0_4_ * 0.5;
            auVar63._8_4_ = fVar279 * fVar279 * fVar279 * auVar266._8_4_ * 0.5;
            auVar63._12_4_ = fVar282 * fVar282 * fVar282 * auVar266._12_4_ * 0.5;
            auVar63._16_4_ = fVar286 * fVar286 * fVar286 * auVar266._16_4_ * 0.5;
            auVar63._20_4_ = fVar268 * fVar268 * fVar268 * auVar266._20_4_ * 0.5;
            auVar63._24_4_ = fVar174 * fVar174 * fVar174 * auVar266._24_4_ * 0.5;
            auVar63._28_4_ = auVar266._28_4_;
            auVar22 = vsubps_avx(auVar62,auVar63);
            fVar155 = auVar22._0_4_;
            fVar160 = auVar22._4_4_;
            fVar279 = auVar22._8_4_;
            fVar282 = auVar22._12_4_;
            fVar286 = auVar22._16_4_;
            fVar268 = auVar22._20_4_;
            fVar174 = auVar22._24_4_;
            fVar227 = local_620 * fVar290 * fVar227;
            fVar236 = fStack_61c * fVar149 * fVar236;
            auVar64._4_4_ = fVar236;
            auVar64._0_4_ = fVar227;
            fVar237 = fStack_618 * fVar151 * fVar237;
            auVar64._8_4_ = fVar237;
            fVar295 = fStack_614 * fVar228 * fVar295;
            auVar64._12_4_ = fVar295;
            fVar296 = fStack_610 * fVar133 * fVar296;
            auVar64._16_4_ = fVar296;
            fVar297 = fStack_60c * fVar150 * fVar297;
            auVar64._20_4_ = fVar297;
            fVar299 = fStack_608 * fVar152 * fVar299;
            auVar64._24_4_ = fVar299;
            auVar64._28_4_ = auVar17._28_4_;
            local_660._4_4_ = fVar236 + local_640._4_4_;
            local_660._0_4_ = fVar227 + (float)local_640._0_4_;
            fStack_658 = fVar237 + local_640._8_4_;
            fStack_654 = fVar295 + local_640._12_4_;
            auStack_650._0_4_ = fVar296 + local_640._16_4_;
            auStack_650._4_4_ = fVar297 + local_640._20_4_;
            fStack_648 = fVar299 + local_640._24_4_;
            fStack_644 = auVar17._28_4_ + local_640._28_4_;
            fVar227 = local_620 * fVar290 * -fVar241;
            fVar236 = fStack_61c * fVar149 * -fVar248;
            auVar65._4_4_ = fVar236;
            auVar65._0_4_ = fVar227;
            fVar237 = fStack_618 * fVar151 * -fVar250;
            auVar65._8_4_ = fVar237;
            fVar295 = fStack_614 * fVar228 * -fVar252;
            auVar65._12_4_ = fVar295;
            fVar296 = fStack_610 * fVar133 * -fVar154;
            auVar65._16_4_ = fVar296;
            fVar297 = fStack_60c * fVar150 * -fVar156;
            auVar65._20_4_ = fVar297;
            fVar299 = fStack_608 * fVar152 * -fVar158;
            auVar65._24_4_ = fVar299;
            auVar65._28_4_ = -fVar161;
            local_680._4_4_ = auVar187._4_4_ + fVar236;
            local_680._0_4_ = auVar187._0_4_ + fVar227;
            fStack_678 = auVar187._8_4_ + fVar237;
            fStack_674 = auVar187._12_4_ + fVar295;
            auStack_670._0_4_ = auVar187._16_4_ + fVar296;
            auStack_670._4_4_ = auVar187._20_4_ + fVar297;
            fStack_668 = auVar187._24_4_ + fVar299;
            fStack_664 = auVar187._28_4_ + -fVar161;
            fVar227 = fVar290 * 0.0 * local_620;
            fVar236 = fVar149 * 0.0 * fStack_61c;
            auVar66._4_4_ = fVar236;
            auVar66._0_4_ = fVar227;
            fVar237 = fVar151 * 0.0 * fStack_618;
            auVar66._8_4_ = fVar237;
            fVar295 = fVar228 * 0.0 * fStack_614;
            auVar66._12_4_ = fVar295;
            fVar296 = fVar133 * 0.0 * fStack_610;
            auVar66._16_4_ = fVar296;
            fVar297 = fVar150 * 0.0 * fStack_60c;
            auVar66._20_4_ = fVar297;
            fVar299 = fVar152 * 0.0 * fStack_608;
            auVar66._24_4_ = fVar299;
            auVar66._28_4_ = fVar161;
            auVar218 = vsubps_avx(local_640,auVar64);
            auVar324._0_4_ = fVar227 + auVar144._0_4_;
            auVar324._4_4_ = fVar236 + auVar144._4_4_;
            auVar324._8_4_ = fVar237 + auVar144._8_4_;
            auVar324._12_4_ = fVar295 + auVar144._12_4_;
            auVar324._16_4_ = fVar296 + auVar144._16_4_;
            auVar324._20_4_ = fVar297 + auVar144._20_4_;
            auVar324._24_4_ = fVar299 + auVar144._24_4_;
            auVar324._28_4_ = fVar161 + auVar144._28_4_;
            fVar227 = auVar262._0_4_ * fVar155 * fVar190;
            fVar190 = auVar262._4_4_ * fVar160 * fVar203;
            auVar67._4_4_ = fVar190;
            auVar67._0_4_ = fVar227;
            fVar236 = auVar262._8_4_ * fVar279 * fVar205;
            auVar67._8_4_ = fVar236;
            fVar203 = auVar262._12_4_ * fVar282 * fVar238;
            auVar67._12_4_ = fVar203;
            fVar237 = auVar262._16_4_ * fVar286 * fVar162;
            auVar67._16_4_ = fVar237;
            fVar205 = auVar262._20_4_ * fVar268 * fVar239;
            auVar67._20_4_ = fVar205;
            fVar238 = auVar262._24_4_ * fVar174 * fVar298;
            auVar67._24_4_ = fVar238;
            auVar67._28_4_ = fStack_604;
            auVar23 = vsubps_avx(auVar187,auVar65);
            auVar312._0_4_ = (float)local_480._0_4_ + fVar227;
            auVar312._4_4_ = (float)local_480._4_4_ + fVar190;
            auVar312._8_4_ = fStack_478 + fVar236;
            auVar312._12_4_ = fStack_474 + fVar203;
            auVar312._16_4_ = fStack_470 + fVar237;
            auVar312._20_4_ = fStack_46c + fVar205;
            auVar312._24_4_ = fStack_468 + fVar238;
            auVar312._28_4_ = fStack_464 + fStack_604;
            fVar227 = fVar155 * -fVar153 * auVar262._0_4_;
            fVar190 = fVar160 * -fVar157 * auVar262._4_4_;
            auVar68._4_4_ = fVar190;
            auVar68._0_4_ = fVar227;
            fVar236 = fVar279 * -fVar271 * auVar262._8_4_;
            auVar68._8_4_ = fVar236;
            fVar203 = fVar282 * -fVar281 * auVar262._12_4_;
            auVar68._12_4_ = fVar203;
            fVar237 = fVar286 * -fVar284 * auVar262._16_4_;
            auVar68._16_4_ = fVar237;
            fVar205 = fVar268 * -fVar288 * auVar262._20_4_;
            auVar68._20_4_ = fVar205;
            fVar238 = fVar174 * -fVar211 * auVar262._24_4_;
            auVar68._24_4_ = fVar238;
            auVar68._28_4_ = local_640._28_4_;
            auVar24 = vsubps_avx(auVar144,auVar66);
            auVar221._0_4_ = (float)local_6a0._0_4_ + fVar227;
            auVar221._4_4_ = (float)local_6a0._4_4_ + fVar190;
            auVar221._8_4_ = fStack_698 + fVar236;
            auVar221._12_4_ = fStack_694 + fVar203;
            auVar221._16_4_ = register0x00001350 + fVar237;
            auVar221._20_4_ = register0x00001354 + fVar205;
            auVar221._24_4_ = register0x00001358 + fVar238;
            auVar221._28_4_ = register0x0000135c + local_640._28_4_;
            fVar227 = fVar155 * 0.0 * auVar262._0_4_;
            fVar190 = fVar160 * 0.0 * auVar262._4_4_;
            auVar69._4_4_ = fVar190;
            auVar69._0_4_ = fVar227;
            fVar236 = fVar279 * 0.0 * auVar262._8_4_;
            auVar69._8_4_ = fVar236;
            fVar203 = fVar282 * 0.0 * auVar262._12_4_;
            auVar69._12_4_ = fVar203;
            fVar237 = fVar286 * 0.0 * auVar262._16_4_;
            auVar69._16_4_ = fVar237;
            fVar205 = fVar268 * 0.0 * auVar262._20_4_;
            auVar69._20_4_ = fVar205;
            fVar238 = fVar174 * 0.0 * auVar262._24_4_;
            auVar69._24_4_ = fVar238;
            auVar69._28_4_ = auVar144._28_4_;
            auVar17 = vsubps_avx(_local_480,auVar67);
            auVar114._4_4_ = fStack_51c;
            auVar114._0_4_ = local_520;
            auVar114._8_4_ = fStack_518;
            auVar114._12_4_ = fStack_514;
            auVar114._16_4_ = fStack_510;
            auVar114._20_4_ = fStack_50c;
            auVar114._24_4_ = fStack_508;
            auVar114._28_4_ = fStack_504;
            auVar276._0_4_ = local_520 + fVar227;
            auVar276._4_4_ = fStack_51c + fVar190;
            auVar276._8_4_ = fStack_518 + fVar236;
            auVar276._12_4_ = fStack_514 + fVar203;
            auVar276._16_4_ = fStack_510 + fVar237;
            auVar276._20_4_ = fStack_50c + fVar205;
            auVar276._24_4_ = fStack_508 + fVar238;
            auVar276._28_4_ = fStack_504 + auVar144._28_4_;
            auVar21 = vsubps_avx(_local_6a0,auVar68);
            auVar27 = vsubps_avx(auVar114,auVar69);
            auVar15 = vsubps_avx(auVar221,auVar23);
            auVar198 = vsubps_avx(auVar276,auVar24);
            auVar70._4_4_ = auVar24._4_4_ * auVar15._4_4_;
            auVar70._0_4_ = auVar24._0_4_ * auVar15._0_4_;
            auVar70._8_4_ = auVar24._8_4_ * auVar15._8_4_;
            auVar70._12_4_ = auVar24._12_4_ * auVar15._12_4_;
            auVar70._16_4_ = auVar24._16_4_ * auVar15._16_4_;
            auVar70._20_4_ = auVar24._20_4_ * auVar15._20_4_;
            auVar70._24_4_ = auVar24._24_4_ * auVar15._24_4_;
            auVar70._28_4_ = auVar303._28_4_;
            auVar71._4_4_ = auVar23._4_4_ * auVar198._4_4_;
            auVar71._0_4_ = auVar23._0_4_ * auVar198._0_4_;
            auVar71._8_4_ = auVar23._8_4_ * auVar198._8_4_;
            auVar71._12_4_ = auVar23._12_4_ * auVar198._12_4_;
            auVar71._16_4_ = auVar23._16_4_ * auVar198._16_4_;
            auVar71._20_4_ = auVar23._20_4_ * auVar198._20_4_;
            auVar71._24_4_ = auVar23._24_4_ * auVar198._24_4_;
            auVar71._28_4_ = register0x0000135c;
            auVar244 = vsubps_avx(auVar71,auVar70);
            auVar72._4_4_ = auVar218._4_4_ * auVar198._4_4_;
            auVar72._0_4_ = auVar218._0_4_ * auVar198._0_4_;
            auVar72._8_4_ = auVar218._8_4_ * auVar198._8_4_;
            auVar72._12_4_ = auVar218._12_4_ * auVar198._12_4_;
            auVar72._16_4_ = auVar218._16_4_ * auVar198._16_4_;
            auVar72._20_4_ = auVar218._20_4_ * auVar198._20_4_;
            auVar72._24_4_ = auVar218._24_4_ * auVar198._24_4_;
            auVar72._28_4_ = auVar198._28_4_;
            auVar198 = vsubps_avx(auVar312,auVar218);
            auVar73._4_4_ = auVar24._4_4_ * auVar198._4_4_;
            auVar73._0_4_ = auVar24._0_4_ * auVar198._0_4_;
            auVar73._8_4_ = auVar24._8_4_ * auVar198._8_4_;
            auVar73._12_4_ = auVar24._12_4_ * auVar198._12_4_;
            auVar73._16_4_ = auVar24._16_4_ * auVar198._16_4_;
            auVar73._20_4_ = auVar24._20_4_ * auVar198._20_4_;
            auVar73._24_4_ = auVar24._24_4_ * auVar198._24_4_;
            auVar73._28_4_ = auVar22._28_4_;
            auVar294 = vsubps_avx(auVar73,auVar72);
            auVar74._4_4_ = auVar23._4_4_ * auVar198._4_4_;
            auVar74._0_4_ = auVar23._0_4_ * auVar198._0_4_;
            auVar74._8_4_ = auVar23._8_4_ * auVar198._8_4_;
            auVar74._12_4_ = auVar23._12_4_ * auVar198._12_4_;
            auVar74._16_4_ = auVar23._16_4_ * auVar198._16_4_;
            auVar74._20_4_ = auVar23._20_4_ * auVar198._20_4_;
            auVar74._24_4_ = auVar23._24_4_ * auVar198._24_4_;
            auVar74._28_4_ = auVar22._28_4_;
            auVar75._4_4_ = auVar218._4_4_ * auVar15._4_4_;
            auVar75._0_4_ = auVar218._0_4_ * auVar15._0_4_;
            auVar75._8_4_ = auVar218._8_4_ * auVar15._8_4_;
            auVar75._12_4_ = auVar218._12_4_ * auVar15._12_4_;
            auVar75._16_4_ = auVar218._16_4_ * auVar15._16_4_;
            auVar75._20_4_ = auVar218._20_4_ * auVar15._20_4_;
            auVar75._24_4_ = auVar218._24_4_ * auVar15._24_4_;
            auVar75._28_4_ = auVar15._28_4_;
            auVar22 = vsubps_avx(auVar75,auVar74);
            auVar168._0_4_ = auVar244._0_4_ * 0.0 + auVar22._0_4_ + auVar294._0_4_ * 0.0;
            auVar168._4_4_ = auVar244._4_4_ * 0.0 + auVar22._4_4_ + auVar294._4_4_ * 0.0;
            auVar168._8_4_ = auVar244._8_4_ * 0.0 + auVar22._8_4_ + auVar294._8_4_ * 0.0;
            auVar168._12_4_ = auVar244._12_4_ * 0.0 + auVar22._12_4_ + auVar294._12_4_ * 0.0;
            auVar168._16_4_ = auVar244._16_4_ * 0.0 + auVar22._16_4_ + auVar294._16_4_ * 0.0;
            auVar168._20_4_ = auVar244._20_4_ * 0.0 + auVar22._20_4_ + auVar294._20_4_ * 0.0;
            auVar168._24_4_ = auVar244._24_4_ * 0.0 + auVar22._24_4_ + auVar294._24_4_ * 0.0;
            auVar168._28_4_ = auVar244._28_4_ + auVar22._28_4_ + auVar294._28_4_;
            auVar16 = vcmpps_avx(auVar168,ZEXT832(0) << 0x20,2);
            auVar17 = vblendvps_avx(auVar17,_local_660,auVar16);
            auVar202 = ZEXT3264(auVar17);
            auVar22 = vblendvps_avx(auVar21,_local_680,auVar16);
            auVar21 = vblendvps_avx(auVar27,auVar324,auVar16);
            auVar27 = vblendvps_avx(auVar218,auVar312,auVar16);
            auVar15 = vblendvps_avx(auVar23,auVar221,auVar16);
            auVar198 = vblendvps_avx(auVar24,auVar276,auVar16);
            auVar218 = vblendvps_avx(auVar312,auVar218,auVar16);
            auVar244 = vblendvps_avx(auVar221,auVar23,auVar16);
            auVar294 = vblendvps_avx(auVar276,auVar24,auVar16);
            _local_780 = vandps_avx(auVar166,auVar234);
            auVar218 = vsubps_avx(auVar218,auVar17);
            auVar25 = vsubps_avx(auVar244,auVar22);
            auVar294 = vsubps_avx(auVar294,auVar21);
            auVar234 = vsubps_avx(auVar22,auVar15);
            fVar227 = auVar25._0_4_;
            fVar210 = auVar21._0_4_;
            fVar295 = auVar25._4_4_;
            fVar269 = auVar21._4_4_;
            auVar76._4_4_ = fVar269 * fVar295;
            auVar76._0_4_ = fVar210 * fVar227;
            fVar153 = auVar25._8_4_;
            fVar253 = auVar21._8_4_;
            auVar76._8_4_ = fVar253 * fVar153;
            fVar282 = auVar25._12_4_;
            fVar226 = auVar21._12_4_;
            auVar76._12_4_ = fVar226 * fVar282;
            fVar290 = auVar25._16_4_;
            fVar224 = auVar21._16_4_;
            auVar76._16_4_ = fVar224 * fVar290;
            fVar241 = auVar25._20_4_;
            fVar225 = auVar21._20_4_;
            auVar76._20_4_ = fVar225 * fVar241;
            fVar161 = auVar25._24_4_;
            fVar263 = auVar21._24_4_;
            auVar76._24_4_ = fVar263 * fVar161;
            auVar76._28_4_ = auVar244._28_4_;
            fVar190 = auVar22._0_4_;
            fVar270 = auVar294._0_4_;
            fVar296 = auVar22._4_4_;
            fVar278 = auVar294._4_4_;
            auVar77._4_4_ = fVar278 * fVar296;
            auVar77._0_4_ = fVar270 * fVar190;
            fVar155 = auVar22._8_4_;
            fVar280 = auVar294._8_4_;
            auVar77._8_4_ = fVar280 * fVar155;
            fVar284 = auVar22._12_4_;
            fVar283 = auVar294._12_4_;
            auVar77._12_4_ = fVar283 * fVar284;
            fVar149 = auVar22._16_4_;
            fVar285 = auVar294._16_4_;
            auVar77._16_4_ = fVar285 * fVar149;
            fVar248 = auVar22._20_4_;
            fVar287 = auVar294._20_4_;
            auVar77._20_4_ = fVar287 * fVar248;
            fVar189 = auVar22._24_4_;
            fVar289 = auVar294._24_4_;
            uVar7 = auVar23._28_4_;
            auVar77._24_4_ = fVar289 * fVar189;
            auVar77._28_4_ = uVar7;
            auVar244 = vsubps_avx(auVar77,auVar76);
            fVar236 = auVar17._0_4_;
            fVar162 = auVar17._4_4_;
            auVar78._4_4_ = fVar278 * fVar162;
            auVar78._0_4_ = fVar270 * fVar236;
            fVar157 = auVar17._8_4_;
            auVar78._8_4_ = fVar280 * fVar157;
            fVar286 = auVar17._12_4_;
            auVar78._12_4_ = fVar283 * fVar286;
            fVar151 = auVar17._16_4_;
            auVar78._16_4_ = fVar285 * fVar151;
            fVar250 = auVar17._20_4_;
            auVar78._20_4_ = fVar287 * fVar250;
            fVar191 = auVar17._24_4_;
            auVar78._24_4_ = fVar289 * fVar191;
            auVar78._28_4_ = uVar7;
            fVar203 = auVar218._0_4_;
            fVar297 = auVar218._4_4_;
            auVar79._4_4_ = fVar269 * fVar297;
            auVar79._0_4_ = fVar210 * fVar203;
            fVar160 = auVar218._8_4_;
            auVar79._8_4_ = fVar253 * fVar160;
            fVar288 = auVar218._12_4_;
            auVar79._12_4_ = fVar226 * fVar288;
            fVar228 = auVar218._16_4_;
            auVar79._16_4_ = fVar224 * fVar228;
            fVar252 = auVar218._20_4_;
            auVar79._20_4_ = fVar225 * fVar252;
            fVar204 = auVar218._24_4_;
            auVar79._24_4_ = fVar263 * fVar204;
            auVar79._28_4_ = auVar312._28_4_;
            auVar23 = vsubps_avx(auVar79,auVar78);
            auVar80._4_4_ = fVar296 * fVar297;
            auVar80._0_4_ = fVar190 * fVar203;
            auVar80._8_4_ = fVar155 * fVar160;
            auVar80._12_4_ = fVar284 * fVar288;
            auVar80._16_4_ = fVar149 * fVar228;
            auVar80._20_4_ = fVar248 * fVar252;
            auVar80._24_4_ = fVar189 * fVar204;
            auVar80._28_4_ = uVar7;
            auVar81._4_4_ = fVar162 * fVar295;
            auVar81._0_4_ = fVar236 * fVar227;
            auVar81._8_4_ = fVar157 * fVar153;
            auVar81._12_4_ = fVar286 * fVar282;
            auVar81._16_4_ = fVar151 * fVar290;
            auVar81._20_4_ = fVar250 * fVar241;
            auVar81._24_4_ = fVar191 * fVar161;
            auVar81._28_4_ = auVar24._28_4_;
            auVar24 = vsubps_avx(auVar81,auVar80);
            auVar26 = vsubps_avx(auVar21,auVar198);
            fVar205 = auVar24._28_4_ + auVar23._28_4_;
            auVar293._0_4_ = auVar24._0_4_ + auVar23._0_4_ * 0.0 + auVar244._0_4_ * 0.0;
            auVar293._4_4_ = auVar24._4_4_ + auVar23._4_4_ * 0.0 + auVar244._4_4_ * 0.0;
            auVar293._8_4_ = auVar24._8_4_ + auVar23._8_4_ * 0.0 + auVar244._8_4_ * 0.0;
            auVar293._12_4_ = auVar24._12_4_ + auVar23._12_4_ * 0.0 + auVar244._12_4_ * 0.0;
            auVar293._16_4_ = auVar24._16_4_ + auVar23._16_4_ * 0.0 + auVar244._16_4_ * 0.0;
            auVar293._20_4_ = auVar24._20_4_ + auVar23._20_4_ * 0.0 + auVar244._20_4_ * 0.0;
            auVar293._24_4_ = auVar24._24_4_ + auVar23._24_4_ * 0.0 + auVar244._24_4_ * 0.0;
            auVar293._28_4_ = fVar205 + auVar244._28_4_;
            fVar237 = auVar234._0_4_;
            fVar239 = auVar234._4_4_;
            auVar82._4_4_ = auVar198._4_4_ * fVar239;
            auVar82._0_4_ = auVar198._0_4_ * fVar237;
            fVar271 = auVar234._8_4_;
            auVar82._8_4_ = auVar198._8_4_ * fVar271;
            fVar268 = auVar234._12_4_;
            auVar82._12_4_ = auVar198._12_4_ * fVar268;
            fVar133 = auVar234._16_4_;
            auVar82._16_4_ = auVar198._16_4_ * fVar133;
            fVar154 = auVar234._20_4_;
            auVar82._20_4_ = auVar198._20_4_ * fVar154;
            fVar206 = auVar234._24_4_;
            auVar82._24_4_ = auVar198._24_4_ * fVar206;
            auVar82._28_4_ = fVar205;
            fVar205 = auVar26._0_4_;
            fVar299 = auVar26._4_4_;
            auVar83._4_4_ = auVar15._4_4_ * fVar299;
            auVar83._0_4_ = auVar15._0_4_ * fVar205;
            fVar279 = auVar26._8_4_;
            auVar83._8_4_ = auVar15._8_4_ * fVar279;
            fVar211 = auVar26._12_4_;
            auVar83._12_4_ = auVar15._12_4_ * fVar211;
            fVar150 = auVar26._16_4_;
            auVar83._16_4_ = auVar15._16_4_ * fVar150;
            fVar156 = auVar26._20_4_;
            auVar83._20_4_ = auVar15._20_4_ * fVar156;
            fVar208 = auVar26._24_4_;
            auVar83._24_4_ = auVar15._24_4_ * fVar208;
            auVar83._28_4_ = auVar24._28_4_;
            auVar234 = vsubps_avx(auVar83,auVar82);
            auVar23 = vsubps_avx(auVar17,auVar27);
            fVar238 = auVar23._0_4_;
            fVar298 = auVar23._4_4_;
            auVar84._4_4_ = auVar198._4_4_ * fVar298;
            auVar84._0_4_ = auVar198._0_4_ * fVar238;
            fVar281 = auVar23._8_4_;
            auVar84._8_4_ = auVar198._8_4_ * fVar281;
            fVar174 = auVar23._12_4_;
            auVar84._12_4_ = auVar198._12_4_ * fVar174;
            fVar152 = auVar23._16_4_;
            auVar84._16_4_ = auVar198._16_4_ * fVar152;
            fVar158 = auVar23._20_4_;
            auVar84._20_4_ = auVar198._20_4_ * fVar158;
            fVar209 = auVar23._24_4_;
            auVar84._24_4_ = auVar198._24_4_ * fVar209;
            auVar84._28_4_ = auVar198._28_4_;
            auVar85._4_4_ = fVar299 * auVar27._4_4_;
            auVar85._0_4_ = fVar205 * auVar27._0_4_;
            auVar85._8_4_ = fVar279 * auVar27._8_4_;
            auVar85._12_4_ = fVar211 * auVar27._12_4_;
            auVar85._16_4_ = fVar150 * auVar27._16_4_;
            auVar85._20_4_ = fVar156 * auVar27._20_4_;
            auVar85._24_4_ = fVar208 * auVar27._24_4_;
            auVar85._28_4_ = auVar244._28_4_;
            auVar198 = vsubps_avx(auVar84,auVar85);
            auVar86._4_4_ = auVar15._4_4_ * fVar298;
            auVar86._0_4_ = auVar15._0_4_ * fVar238;
            auVar86._8_4_ = auVar15._8_4_ * fVar281;
            auVar86._12_4_ = auVar15._12_4_ * fVar174;
            auVar86._16_4_ = auVar15._16_4_ * fVar152;
            auVar86._20_4_ = auVar15._20_4_ * fVar158;
            auVar86._24_4_ = auVar15._24_4_ * fVar209;
            auVar86._28_4_ = auVar15._28_4_;
            auVar87._4_4_ = fVar239 * auVar27._4_4_;
            auVar87._0_4_ = fVar237 * auVar27._0_4_;
            auVar87._8_4_ = fVar271 * auVar27._8_4_;
            auVar87._12_4_ = fVar268 * auVar27._12_4_;
            auVar87._16_4_ = fVar133 * auVar27._16_4_;
            auVar87._20_4_ = fVar154 * auVar27._20_4_;
            auVar87._24_4_ = fVar206 * auVar27._24_4_;
            auVar87._28_4_ = auVar27._28_4_;
            auVar27 = vsubps_avx(auVar87,auVar86);
            auVar145._0_4_ = auVar234._0_4_ * 0.0 + auVar27._0_4_ + auVar198._0_4_ * 0.0;
            auVar145._4_4_ = auVar234._4_4_ * 0.0 + auVar27._4_4_ + auVar198._4_4_ * 0.0;
            auVar145._8_4_ = auVar234._8_4_ * 0.0 + auVar27._8_4_ + auVar198._8_4_ * 0.0;
            auVar145._12_4_ = auVar234._12_4_ * 0.0 + auVar27._12_4_ + auVar198._12_4_ * 0.0;
            auVar145._16_4_ = auVar234._16_4_ * 0.0 + auVar27._16_4_ + auVar198._16_4_ * 0.0;
            auVar145._20_4_ = auVar234._20_4_ * 0.0 + auVar27._20_4_ + auVar198._20_4_ * 0.0;
            auVar145._24_4_ = auVar234._24_4_ * 0.0 + auVar27._24_4_ + auVar198._24_4_ * 0.0;
            auVar145._28_4_ = auVar198._28_4_ + auVar27._28_4_ + auVar198._28_4_;
            auVar148 = ZEXT3264(auVar145);
            auVar234 = vmaxps_avx(auVar293,auVar145);
            auVar234 = vcmpps_avx(auVar234,ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar223 = ZEXT3264(_local_780);
            auVar27 = _local_780 & auVar234;
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar27 >> 0x7f,0) == '\0') &&
                  (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar27 >> 0xbf,0) == '\0') &&
                (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar27[0x1f]) {
LAB_00efceae:
              auVar170._8_8_ = local_4c0[1]._8_8_;
              auVar170._0_8_ = local_4c0[1]._0_8_;
              auVar170._16_8_ = local_4c0[1]._16_8_;
              auVar170._24_8_ = local_4c0[1]._24_8_;
            }
            else {
              auVar27 = vandps_avx(auVar234,_local_780);
              auVar88._4_4_ = fVar299 * fVar295;
              auVar88._0_4_ = fVar205 * fVar227;
              auVar88._8_4_ = fVar279 * fVar153;
              auVar88._12_4_ = fVar211 * fVar282;
              auVar88._16_4_ = fVar150 * fVar290;
              auVar88._20_4_ = fVar156 * fVar241;
              auVar88._24_4_ = fVar208 * fVar161;
              auVar88._28_4_ = local_780._28_4_;
              auVar89._4_4_ = fVar239 * fVar278;
              auVar89._0_4_ = fVar237 * fVar270;
              auVar89._8_4_ = fVar271 * fVar280;
              auVar89._12_4_ = fVar268 * fVar283;
              auVar89._16_4_ = fVar133 * fVar285;
              auVar89._20_4_ = fVar154 * fVar287;
              auVar89._24_4_ = fVar206 * fVar289;
              auVar89._28_4_ = auVar234._28_4_;
              auVar15 = vsubps_avx(auVar89,auVar88);
              auVar90._4_4_ = fVar298 * fVar278;
              auVar90._0_4_ = fVar238 * fVar270;
              auVar90._8_4_ = fVar281 * fVar280;
              auVar90._12_4_ = fVar174 * fVar283;
              auVar90._16_4_ = fVar152 * fVar285;
              auVar90._20_4_ = fVar158 * fVar287;
              auVar90._24_4_ = fVar209 * fVar289;
              auVar90._28_4_ = auVar294._28_4_;
              auVar91._4_4_ = fVar299 * fVar297;
              auVar91._0_4_ = fVar205 * fVar203;
              auVar91._8_4_ = fVar279 * fVar160;
              auVar91._12_4_ = fVar211 * fVar288;
              auVar91._16_4_ = fVar150 * fVar228;
              auVar91._20_4_ = fVar156 * fVar252;
              auVar91._24_4_ = fVar208 * fVar204;
              auVar91._28_4_ = auVar26._28_4_;
              auVar198 = vsubps_avx(auVar91,auVar90);
              auVar92._4_4_ = fVar239 * fVar297;
              auVar92._0_4_ = fVar237 * fVar203;
              auVar92._8_4_ = fVar271 * fVar160;
              auVar92._12_4_ = fVar268 * fVar288;
              auVar92._16_4_ = fVar133 * fVar228;
              auVar92._20_4_ = fVar154 * fVar252;
              auVar92._24_4_ = fVar206 * fVar204;
              auVar92._28_4_ = auVar218._28_4_;
              auVar93._4_4_ = fVar298 * fVar295;
              auVar93._0_4_ = fVar238 * fVar227;
              auVar93._8_4_ = fVar281 * fVar153;
              auVar93._12_4_ = fVar174 * fVar282;
              auVar93._16_4_ = fVar152 * fVar290;
              auVar93._20_4_ = fVar158 * fVar241;
              auVar93._24_4_ = fVar209 * fVar161;
              auVar93._28_4_ = auVar25._28_4_;
              auVar244 = vsubps_avx(auVar93,auVar92);
              auVar169._0_4_ = auVar15._0_4_ * 0.0 + auVar244._0_4_ + auVar198._0_4_ * 0.0;
              auVar169._4_4_ = auVar15._4_4_ * 0.0 + auVar244._4_4_ + auVar198._4_4_ * 0.0;
              auVar169._8_4_ = auVar15._8_4_ * 0.0 + auVar244._8_4_ + auVar198._8_4_ * 0.0;
              auVar169._12_4_ = auVar15._12_4_ * 0.0 + auVar244._12_4_ + auVar198._12_4_ * 0.0;
              auVar169._16_4_ = auVar15._16_4_ * 0.0 + auVar244._16_4_ + auVar198._16_4_ * 0.0;
              auVar169._20_4_ = auVar15._20_4_ * 0.0 + auVar244._20_4_ + auVar198._20_4_ * 0.0;
              auVar169._24_4_ = auVar15._24_4_ * 0.0 + auVar244._24_4_ + auVar198._24_4_ * 0.0;
              auVar169._28_4_ = auVar25._28_4_ + auVar244._28_4_ + auVar218._28_4_;
              auVar234 = vrcpps_avx(auVar169);
              fVar203 = auVar234._0_4_;
              fVar237 = auVar234._4_4_;
              auVar94._4_4_ = auVar169._4_4_ * fVar237;
              auVar94._0_4_ = auVar169._0_4_ * fVar203;
              fVar205 = auVar234._8_4_;
              auVar94._8_4_ = auVar169._8_4_ * fVar205;
              fVar238 = auVar234._12_4_;
              auVar94._12_4_ = auVar169._12_4_ * fVar238;
              fVar295 = auVar234._16_4_;
              auVar94._16_4_ = auVar169._16_4_ * fVar295;
              fVar297 = auVar234._20_4_;
              auVar94._20_4_ = auVar169._20_4_ * fVar297;
              fVar239 = auVar234._24_4_;
              auVar94._24_4_ = auVar169._24_4_ * fVar239;
              auVar94._28_4_ = auVar26._28_4_;
              auVar304._8_4_ = 0x3f800000;
              auVar304._0_8_ = &DAT_3f8000003f800000;
              auVar304._12_4_ = 0x3f800000;
              auVar304._16_4_ = 0x3f800000;
              auVar304._20_4_ = 0x3f800000;
              auVar304._24_4_ = 0x3f800000;
              auVar304._28_4_ = 0x3f800000;
              auVar234 = vsubps_avx(auVar304,auVar94);
              fVar203 = auVar234._0_4_ * fVar203 + fVar203;
              fVar237 = auVar234._4_4_ * fVar237 + fVar237;
              fVar205 = auVar234._8_4_ * fVar205 + fVar205;
              fVar238 = auVar234._12_4_ * fVar238 + fVar238;
              fVar295 = auVar234._16_4_ * fVar295 + fVar295;
              fVar297 = auVar234._20_4_ * fVar297 + fVar297;
              fVar239 = auVar234._24_4_ * fVar239 + fVar239;
              auVar95._4_4_ =
                   (fVar162 * auVar15._4_4_ + auVar198._4_4_ * fVar296 + auVar244._4_4_ * fVar269) *
                   fVar237;
              auVar95._0_4_ =
                   (fVar236 * auVar15._0_4_ + auVar198._0_4_ * fVar190 + auVar244._0_4_ * fVar210) *
                   fVar203;
              auVar95._8_4_ =
                   (fVar157 * auVar15._8_4_ + auVar198._8_4_ * fVar155 + auVar244._8_4_ * fVar253) *
                   fVar205;
              auVar95._12_4_ =
                   (fVar286 * auVar15._12_4_ + auVar198._12_4_ * fVar284 + auVar244._12_4_ * fVar226
                   ) * fVar238;
              auVar95._16_4_ =
                   (fVar151 * auVar15._16_4_ + auVar198._16_4_ * fVar149 + auVar244._16_4_ * fVar224
                   ) * fVar295;
              auVar95._20_4_ =
                   (fVar250 * auVar15._20_4_ + auVar198._20_4_ * fVar248 + auVar244._20_4_ * fVar225
                   ) * fVar297;
              auVar95._24_4_ =
                   (fVar191 * auVar15._24_4_ + auVar198._24_4_ * fVar189 + auVar244._24_4_ * fVar263
                   ) * fVar239;
              auVar95._28_4_ = auVar17._28_4_ + auVar22._28_4_ + auVar21._28_4_;
              auVar202 = ZEXT3264(auVar95);
              fVar227 = (ray->super_RayK<1>).tfar;
              auVar222._4_4_ = fVar227;
              auVar222._0_4_ = fVar227;
              auVar222._8_4_ = fVar227;
              auVar222._12_4_ = fVar227;
              auVar222._16_4_ = fVar227;
              auVar222._20_4_ = fVar227;
              auVar222._24_4_ = fVar227;
              auVar222._28_4_ = fVar227;
              auVar234 = vcmpps_avx(local_100,auVar95,2);
              auVar17 = vcmpps_avx(auVar95,auVar222,2);
              auVar223 = ZEXT3264(auVar17);
              auVar234 = vandps_avx(auVar234,auVar17);
              auVar22 = auVar27 & auVar234;
              if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar22 >> 0x7f,0) == '\0') &&
                    (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar22 >> 0xbf,0) == '\0') &&
                  (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar22[0x1f]) goto LAB_00efceae;
              auVar234 = vandps_avx(auVar27,auVar234);
              auVar22 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar169,4);
              auVar21 = auVar234 & auVar22;
              auVar170._8_8_ = local_4c0[1]._8_8_;
              auVar170._0_8_ = local_4c0[1]._0_8_;
              auVar170._16_8_ = local_4c0[1]._16_8_;
              auVar170._24_8_ = local_4c0[1]._24_8_;
              if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar21 >> 0x7f,0) != '\0') ||
                    (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar21 >> 0xbf,0) != '\0') ||
                  (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar21[0x1f] < '\0') {
                auVar170 = vandps_avx(auVar22,auVar234);
                auVar96._4_4_ = auVar293._4_4_ * fVar237;
                auVar96._0_4_ = auVar293._0_4_ * fVar203;
                auVar96._8_4_ = auVar293._8_4_ * fVar205;
                auVar96._12_4_ = auVar293._12_4_ * fVar238;
                auVar96._16_4_ = auVar293._16_4_ * fVar295;
                auVar96._20_4_ = auVar293._20_4_ * fVar297;
                auVar96._24_4_ = auVar293._24_4_ * fVar239;
                auVar96._28_4_ = auVar17._28_4_;
                auVar97._4_4_ = auVar145._4_4_ * fVar237;
                auVar97._0_4_ = auVar145._0_4_ * fVar203;
                auVar97._8_4_ = auVar145._8_4_ * fVar205;
                auVar97._12_4_ = auVar145._12_4_ * fVar238;
                auVar97._16_4_ = auVar145._16_4_ * fVar295;
                auVar97._20_4_ = auVar145._20_4_ * fVar297;
                auVar97._24_4_ = auVar145._24_4_ * fVar239;
                auVar97._28_4_ = auVar145._28_4_;
                auVar246._8_4_ = 0x3f800000;
                auVar246._0_8_ = &DAT_3f8000003f800000;
                auVar246._12_4_ = 0x3f800000;
                auVar246._16_4_ = 0x3f800000;
                auVar246._20_4_ = 0x3f800000;
                auVar246._24_4_ = 0x3f800000;
                auVar246._28_4_ = 0x3f800000;
                auVar234 = vsubps_avx(auVar246,auVar96);
                local_e0 = vblendvps_avx(auVar234,auVar96,auVar16);
                auVar234 = vsubps_avx(auVar246,auVar97);
                auVar223 = ZEXT3264(auVar234);
                _local_280 = vblendvps_avx(auVar234,auVar97,auVar16);
                auVar148 = ZEXT3264(_local_280);
                local_420 = auVar95;
              }
            }
            auVar277 = ZEXT3264(local_720);
            auVar267 = ZEXT3264(local_700);
            auVar112._4_4_ = fStack_61c;
            auVar112._0_4_ = local_620;
            auVar112._8_4_ = fStack_618;
            auVar112._12_4_ = fStack_614;
            auVar112._16_4_ = fStack_610;
            auVar112._20_4_ = fStack_60c;
            auVar112._24_4_ = fStack_608;
            auVar112._28_4_ = fStack_604;
            fVar241 = (float)local_6e0._0_4_;
            fVar248 = (float)local_6e0._4_4_;
            fVar250 = fStack_6d8;
            fVar252 = fStack_6d4;
            fVar203 = fStack_6d0;
            fVar237 = fStack_6cc;
            fVar205 = fStack_6c8;
            fVar238 = fStack_6c4;
            if ((((((((auVar170 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar170 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar170 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar170 >> 0x7f,0) == '\0') &&
                  (auVar170 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar170 >> 0xbf,0) == '\0') &&
                (auVar170 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar170[0x1f]) goto LAB_00efcbc4;
            auVar234 = vsubps_avx(auVar262,auVar112);
            auVar202 = ZEXT3264(local_e0);
            local_620 = local_620 + auVar234._0_4_ * local_e0._0_4_;
            fStack_61c = fStack_61c + auVar234._4_4_ * local_e0._4_4_;
            fVar190 = fStack_618 + auVar234._8_4_ * local_e0._8_4_;
            fVar236 = fStack_614 + auVar234._12_4_ * local_e0._12_4_;
            fVar295 = fStack_610 + auVar234._16_4_ * local_e0._16_4_;
            fVar296 = fStack_60c + auVar234._20_4_ * local_e0._20_4_;
            fVar162 = fStack_608 + auVar234._24_4_ * local_e0._24_4_;
            fVar297 = fStack_604 + auVar234._28_4_;
            fVar227 = pre->depth_scale;
            auVar98._4_4_ = (fStack_61c + fStack_61c) * fVar227;
            auVar98._0_4_ = (local_620 + local_620) * fVar227;
            auVar98._8_4_ = (fVar190 + fVar190) * fVar227;
            auVar98._12_4_ = (fVar236 + fVar236) * fVar227;
            auVar98._16_4_ = (fVar295 + fVar295) * fVar227;
            auVar98._20_4_ = (fVar296 + fVar296) * fVar227;
            auVar98._24_4_ = (fVar162 + fVar162) * fVar227;
            auVar98._28_4_ = fVar297 + fVar297;
            auVar223 = ZEXT3264(local_420);
            auVar234 = vcmpps_avx(local_420,auVar98,6);
            auVar148 = ZEXT3264(auVar234);
            auVar17 = auVar170 & auVar234;
            if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar17 >> 0x7f,0) != '\0') ||
                  (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar17 >> 0xbf,0) != '\0') ||
                (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar17[0x1f] < '\0') {
              auVar234 = vandps_avx(auVar234,auVar170);
              auVar148 = ZEXT3264(auVar234);
              local_280._0_4_ = (float)local_280._0_4_ + (float)local_280._0_4_ + -1.0;
              local_280._4_4_ = (float)local_280._4_4_ + (float)local_280._4_4_ + -1.0;
              uStack_278._0_4_ = (float)uStack_278 + (float)uStack_278 + -1.0;
              uStack_278._4_4_ = uStack_278._4_4_ + uStack_278._4_4_ + -1.0;
              uStack_270._0_4_ = (float)uStack_270 + (float)uStack_270 + -1.0;
              uStack_270._4_4_ = uStack_270._4_4_ + uStack_270._4_4_ + -1.0;
              uStack_268._0_4_ = (float)uStack_268 + (float)uStack_268 + -1.0;
              uStack_268._4_4_ = uStack_268._4_4_ + uStack_268._4_4_ + -1.0;
              local_3c0 = local_e0;
              auVar123 = _local_280;
              auVar17 = _local_280;
              local_3a0 = (float)local_280._0_4_;
              fStack_39c = (float)local_280._4_4_;
              fStack_398 = (float)uStack_278;
              fStack_394 = uStack_278._4_4_;
              fStack_390 = (float)uStack_270;
              fStack_38c = uStack_270._4_4_;
              fStack_388 = (float)uStack_268;
              fStack_384 = uStack_268._4_4_;
              local_380 = local_420;
              local_35c = uVar12;
              local_350 = (float)local_7c0._0_4_;
              fStack_34c = (float)local_7c0._4_4_;
              fStack_348 = fStack_7b8;
              fStack_344 = fStack_7b4;
              local_340 = local_600;
              uStack_338 = uStack_5f8;
              local_330 = local_530;
              uStack_328 = uStack_528;
              local_320 = local_540;
              uStack_318 = uStack_538;
              local_300 = auVar234;
              pGVar13 = (context->scene->geometries).items[local_788].ptr;
              _local_280 = auVar17;
              if ((pGVar13->mask & (ray->super_RayK<1>).mask) != 0) {
                local_4c0[0] = auVar234;
                auVar181._0_4_ = (float)(int)local_360;
                auVar181._4_8_ = SUB128(ZEXT812(0),4);
                auVar181._12_4_ = 0;
                auVar231 = vshufps_avx(auVar181,auVar181,0);
                local_2e0[0] = (auVar231._0_4_ + local_e0._0_4_ + 0.0) * (float)local_400._0_4_;
                local_2e0[1] = (auVar231._4_4_ + local_e0._4_4_ + 1.0) * (float)local_400._4_4_;
                local_2e0[2] = (auVar231._8_4_ + local_e0._8_4_ + 2.0) * fStack_3f8;
                local_2e0[3] = (auVar231._12_4_ + local_e0._12_4_ + 3.0) * fStack_3f4;
                fStack_2d0 = (auVar231._0_4_ + local_e0._16_4_ + 4.0) * fStack_3f0;
                fStack_2cc = (auVar231._4_4_ + local_e0._20_4_ + 5.0) * fStack_3ec;
                fStack_2c8 = (auVar231._8_4_ + local_e0._24_4_ + 6.0) * fStack_3e8;
                fStack_2c4 = auVar231._12_4_ + local_e0._28_4_ + 7.0;
                uStack_270 = auVar123._16_8_;
                uStack_268 = auVar17._24_8_;
                local_2c0 = local_280;
                uStack_2b8 = uStack_278;
                uStack_2b0 = uStack_270;
                uStack_2a8 = uStack_268;
                local_2a0 = local_420;
                auVar171._8_4_ = 0x7f800000;
                auVar171._0_8_ = 0x7f8000007f800000;
                auVar171._12_4_ = 0x7f800000;
                auVar171._16_4_ = 0x7f800000;
                auVar171._20_4_ = 0x7f800000;
                auVar171._24_4_ = 0x7f800000;
                auVar171._28_4_ = 0x7f800000;
                auVar17 = vblendvps_avx(auVar171,local_420,auVar234);
                auVar22 = vshufps_avx(auVar17,auVar17,0xb1);
                auVar22 = vminps_avx(auVar17,auVar22);
                auVar21 = vshufpd_avx(auVar22,auVar22,5);
                auVar22 = vminps_avx(auVar22,auVar21);
                auVar21 = vperm2f128_avx(auVar22,auVar22,1);
                auVar22 = vminps_avx(auVar22,auVar21);
                auVar17 = vcmpps_avx(auVar17,auVar22,0);
                auVar22 = auVar234 & auVar17;
                if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar22 >> 0x7f,0) != '\0') ||
                      (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar22 >> 0xbf,0) != '\0') ||
                    (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar22[0x1f] < '\0') {
                  auVar234 = vandps_avx(auVar17,auVar234);
                }
                uVar125 = vmovmskps_avx(auVar234);
                uVar11 = 0;
                if (uVar125 != 0) {
                  for (; (uVar125 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                  }
                }
                uVar128 = (ulong)uVar11;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar227 = local_2e0[uVar128];
                  auVar148 = ZEXT464((uint)fVar227);
                  fVar190 = *(float *)((long)&local_2c0 + uVar128 * 4);
                  fVar295 = 1.0 - fVar227;
                  fVar236 = fVar227 * fVar295 * 4.0;
                  auVar231 = ZEXT416((uint)(fVar227 * fVar227 * 0.5));
                  auVar231 = vshufps_avx(auVar231,auVar231,0);
                  auVar182 = ZEXT416((uint)((fVar295 * fVar295 + fVar236) * 0.5));
                  auVar182 = vshufps_avx(auVar182,auVar182,0);
                  auVar196 = ZEXT416((uint)((-fVar227 * fVar227 - fVar236) * 0.5));
                  auVar196 = vshufps_avx(auVar196,auVar196,0);
                  fVar236 = auVar196._0_4_ * (float)local_600._0_4_;
                  fVar296 = auVar196._4_4_ * (float)local_600._4_4_;
                  fVar162 = auVar196._8_4_ * (float)uStack_5f8;
                  fVar297 = auVar196._12_4_ * uStack_5f8._4_4_;
                  auVar223 = ZEXT1664(CONCAT412(fVar297,CONCAT48(fVar162,CONCAT44(fVar296,fVar236)))
                                     );
                  auVar196 = ZEXT416((uint)(fVar295 * -fVar295 * 0.5));
                  auVar196 = vshufps_avx(auVar196,auVar196,0);
                  auVar183._0_4_ =
                       (float)local_7c0._0_4_ * auVar196._0_4_ +
                       fVar236 + auVar231._0_4_ * (float)local_540._0_4_ +
                                 auVar182._0_4_ * (float)local_530._0_4_;
                  auVar183._4_4_ =
                       (float)local_7c0._4_4_ * auVar196._4_4_ +
                       fVar296 + auVar231._4_4_ * (float)local_540._4_4_ +
                                 auVar182._4_4_ * (float)local_530._4_4_;
                  auVar183._8_4_ =
                       fStack_7b8 * auVar196._8_4_ +
                       fVar162 + auVar231._8_4_ * (float)uStack_538 +
                                 auVar182._8_4_ * (float)uStack_528;
                  auVar183._12_4_ =
                       fStack_7b4 * auVar196._12_4_ +
                       fVar297 + auVar231._12_4_ * uStack_538._4_4_ +
                                 auVar182._12_4_ * uStack_528._4_4_;
                  auVar202 = ZEXT464((uint)*(float *)(local_2a0 + uVar128 * 4));
                  (ray->super_RayK<1>).tfar = *(float *)(local_2a0 + uVar128 * 4);
                  uVar8 = vmovlps_avx(auVar183);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar8;
                  fVar236 = (float)vextractps_avx(auVar183,2);
                  (ray->Ng).field_0.field_0.z = fVar236;
                  ray->u = fVar227;
                  ray->v = fVar190;
                  ray->primID = uVar127;
                  ray->geomID = (uint)local_788;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                }
                else {
                  local_640._0_8_ = pGVar13;
                  _local_6a0 = _local_600;
                  _local_660 = _local_530;
                  _auStack_6b0 = auVar262._16_16_;
                  _local_6c0 = _local_540;
                  local_790 = pPVar130;
                  local_798 = context;
                  local_7a0 = ray;
                  local_7a8 = pre;
                  fVar227 = (float)local_7c0._0_4_;
                  fVar190 = (float)local_7c0._4_4_;
                  fVar236 = fStack_7b8;
                  fVar295 = fStack_7b4;
                  _local_220 = auVar20;
                  do {
                    local_5e4 = local_2e0[uVar128];
                    local_5e0 = *(undefined4 *)((long)&local_2c0 + uVar128 * 4);
                    local_780._0_4_ = (ray->super_RayK<1>).tfar;
                    local_620 = (float)uVar128;
                    fStack_61c = (float)(uVar128 >> 0x20);
                    (ray->super_RayK<1>).tfar = *(float *)(local_2a0 + uVar128 * 4);
                    local_750.context = context->user;
                    fVar162 = 1.0 - local_5e4;
                    fVar296 = local_5e4 * fVar162 * 4.0;
                    auVar231 = ZEXT416((uint)(local_5e4 * local_5e4 * 0.5));
                    auVar231 = vshufps_avx(auVar231,auVar231,0);
                    auVar182 = ZEXT416((uint)((fVar162 * fVar162 + fVar296) * 0.5));
                    auVar182 = vshufps_avx(auVar182,auVar182,0);
                    auVar196 = ZEXT416((uint)((-local_5e4 * local_5e4 - fVar296) * 0.5));
                    auVar196 = vshufps_avx(auVar196,auVar196,0);
                    auVar217._0_4_ = auVar196._0_4_ * (float)local_6a0._0_4_;
                    auVar217._4_4_ = auVar196._4_4_ * (float)local_6a0._4_4_;
                    auVar217._8_4_ = auVar196._8_4_ * fStack_698;
                    auVar217._12_4_ = auVar196._12_4_ * fStack_694;
                    auVar223 = ZEXT1664(auVar217);
                    auVar196 = ZEXT416((uint)(fVar162 * -fVar162 * 0.5));
                    auVar196 = vshufps_avx(auVar196,auVar196,0);
                    auVar184._0_4_ =
                         fVar227 * auVar196._0_4_ +
                         auVar217._0_4_ +
                         auVar231._0_4_ * (float)local_6c0._0_4_ +
                         auVar182._0_4_ * (float)local_660._0_4_;
                    auVar184._4_4_ =
                         fVar190 * auVar196._4_4_ +
                         auVar217._4_4_ +
                         auVar231._4_4_ * (float)local_6c0._4_4_ +
                         auVar182._4_4_ * (float)local_660._4_4_;
                    auVar184._8_4_ =
                         fVar236 * auVar196._8_4_ +
                         auVar217._8_4_ + auVar231._8_4_ * fStack_6b8 + auVar182._8_4_ * fStack_658;
                    auVar184._12_4_ =
                         fVar295 * auVar196._12_4_ +
                         auVar217._12_4_ +
                         auVar231._12_4_ * fStack_6b4 + auVar182._12_4_ * fStack_654;
                    local_5f0 = vmovlps_avx(auVar184);
                    local_5e8 = vextractps_avx(auVar184,2);
                    local_5dc = uVar127;
                    local_5d8 = (int)local_788;
                    local_5d4 = (local_750.context)->instID[0];
                    local_5d0 = (local_750.context)->instPrimID[0];
                    local_7c4 = -1;
                    local_750.valid = &local_7c4;
                    local_750.geometryUserPtr = *(void **)(local_640._0_8_ + 0x18);
                    local_750.ray = (RTCRayN *)ray;
                    local_750.hit = (RTCHitN *)&local_5f0;
                    local_750.N = 1;
                    if (*(code **)(local_640._0_8_ + 0x40) == (code *)0x0) {
LAB_00efd117:
                      p_Var14 = context->args->filter;
                      if (p_Var14 != (RTCFilterFunctionN)0x0) {
                        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           ((*(byte *)(local_640._0_8_ + 0x3e) & 0x40) != 0)) {
                          auVar223 = ZEXT1664(auVar223._0_16_);
                          (*p_Var14)(&local_750);
                        }
                        auVar267 = ZEXT3264(local_700);
                        auVar277 = ZEXT3264(local_720);
                        pre = local_7a8;
                        pPVar130 = local_790;
                        context = local_798;
                        ray = local_7a0;
                        fVar207 = (float)local_560._0_4_;
                        fVar240 = (float)local_560._4_4_;
                        fVar247 = fStack_558;
                        fVar249 = fStack_554;
                        fVar251 = fStack_550;
                        fVar308 = fStack_54c;
                        fVar188 = fStack_548;
                        fVar159 = fStack_544;
                        fVar227 = (float)local_7c0._0_4_;
                        fVar190 = (float)local_7c0._4_4_;
                        fVar236 = fStack_7b8;
                        fVar295 = fStack_7b4;
                        fVar241 = (float)local_6e0._0_4_;
                        fVar248 = (float)local_6e0._4_4_;
                        fVar250 = fStack_6d8;
                        fVar252 = fStack_6d4;
                        fVar203 = fStack_6d0;
                        fVar237 = fStack_6cc;
                        fVar205 = fStack_6c8;
                        fVar238 = fStack_6c4;
                        if (*local_750.valid == 0) goto LAB_00efd1f8;
                      }
                      (((Vec3f *)((long)local_750.ray + 0x30))->field_0).components[0] =
                           *(float *)local_750.hit;
                      (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_750.hit + 4);
                      (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_750.hit + 8);
                      *(float *)((long)local_750.ray + 0x3c) = *(float *)(local_750.hit + 0xc);
                      *(float *)((long)local_750.ray + 0x40) = *(float *)(local_750.hit + 0x10);
                      *(float *)((long)local_750.ray + 0x44) = *(float *)(local_750.hit + 0x14);
                      *(float *)((long)local_750.ray + 0x48) = *(float *)(local_750.hit + 0x18);
                      *(float *)((long)local_750.ray + 0x4c) = *(float *)(local_750.hit + 0x1c);
                      *(float *)((long)local_750.ray + 0x50) = *(float *)(local_750.hit + 0x20);
                    }
                    else {
                      auVar223 = ZEXT1664(auVar217);
                      (**(code **)(local_640._0_8_ + 0x40))(&local_750);
                      auVar277 = ZEXT3264(local_720);
                      auVar267 = ZEXT3264(local_700);
                      pre = local_7a8;
                      pPVar130 = local_790;
                      context = local_798;
                      ray = local_7a0;
                      fVar207 = (float)local_560._0_4_;
                      fVar240 = (float)local_560._4_4_;
                      fVar247 = fStack_558;
                      fVar249 = fStack_554;
                      fVar251 = fStack_550;
                      fVar308 = fStack_54c;
                      fVar188 = fStack_548;
                      fVar159 = fStack_544;
                      fVar227 = (float)local_7c0._0_4_;
                      fVar190 = (float)local_7c0._4_4_;
                      fVar236 = fStack_7b8;
                      fVar295 = fStack_7b4;
                      fVar241 = (float)local_6e0._0_4_;
                      fVar248 = (float)local_6e0._4_4_;
                      fVar250 = fStack_6d8;
                      fVar252 = fStack_6d4;
                      fVar203 = fStack_6d0;
                      fVar237 = fStack_6cc;
                      fVar205 = fStack_6c8;
                      fVar238 = fStack_6c4;
                      if (*local_750.valid != 0) goto LAB_00efd117;
LAB_00efd1f8:
                      (local_7a0->super_RayK<1>).tfar = (float)local_780._0_4_;
                      pre = local_7a8;
                      pPVar130 = local_790;
                      context = local_798;
                      ray = local_7a0;
                      fVar227 = (float)local_7c0._0_4_;
                      fVar190 = (float)local_7c0._4_4_;
                      fVar236 = fStack_7b8;
                      fVar295 = fStack_7b4;
                      fVar241 = (float)local_6e0._0_4_;
                      fVar248 = (float)local_6e0._4_4_;
                      fVar250 = fStack_6d8;
                      fVar252 = fStack_6d4;
                      fVar203 = fStack_6d0;
                      fVar237 = fStack_6cc;
                      fVar205 = fStack_6c8;
                      fVar238 = fStack_6c4;
                    }
                    auVar17 = local_420;
                    uVar128 = CONCAT44(fStack_61c,local_620);
                    *(undefined4 *)(local_4c0[0] + uVar128 * 4) = 0;
                    auVar22 = local_4c0[0];
                    fVar296 = (ray->super_RayK<1>).tfar;
                    auVar146._4_4_ = fVar296;
                    auVar146._0_4_ = fVar296;
                    auVar146._8_4_ = fVar296;
                    auVar146._12_4_ = fVar296;
                    auVar146._16_4_ = fVar296;
                    auVar146._20_4_ = fVar296;
                    auVar146._24_4_ = fVar296;
                    auVar146._28_4_ = fVar296;
                    auVar234 = vcmpps_avx(auVar17,auVar146,2);
                    local_4c0[0] = vandps_avx(auVar234,local_4c0[0]);
                    auVar148 = ZEXT3264(local_4c0[0]);
                    auVar22 = auVar22 & auVar234;
                    bVar106 = (auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar107 = (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar105 = (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar104 = SUB321(auVar22 >> 0x7f,0) != '\0';
                    bVar103 = (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar102 = SUB321(auVar22 >> 0xbf,0) != '\0';
                    bVar100 = (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar99 = auVar22[0x1f] < '\0';
                    if (((((((bVar106 || bVar107) || bVar105) || bVar104) || bVar103) || bVar102) ||
                        bVar100) || bVar99) {
                      auVar172._8_4_ = 0x7f800000;
                      auVar172._0_8_ = 0x7f8000007f800000;
                      auVar172._12_4_ = 0x7f800000;
                      auVar172._16_4_ = 0x7f800000;
                      auVar172._20_4_ = 0x7f800000;
                      auVar172._24_4_ = 0x7f800000;
                      auVar172._28_4_ = 0x7f800000;
                      auVar234 = vblendvps_avx(auVar172,auVar17,local_4c0[0]);
                      auVar17 = vshufps_avx(auVar234,auVar234,0xb1);
                      auVar17 = vminps_avx(auVar234,auVar17);
                      auVar22 = vshufpd_avx(auVar17,auVar17,5);
                      auVar22 = vminps_avx(auVar17,auVar22);
                      auVar17 = vperm2f128_avx(auVar22,auVar22,1);
                      auVar22 = vminps_avx(auVar22,auVar17);
                      auVar234 = vcmpps_avx(auVar234,auVar22,0);
                      auVar22 = local_4c0[0] & auVar234;
                      if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar22 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar22 >> 0x7f,0) != '\0') ||
                            (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar22 >> 0xbf,0) != '\0') ||
                          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar22[0x1f] < '\0') {
                        auVar234 = vandps_avx(auVar234,local_4c0[0]);
                        auVar148 = ZEXT3264(auVar234);
                      }
                      uVar125 = vmovmskps_avx(auVar148._0_32_);
                      uVar11 = 0;
                      if (uVar125 != 0) {
                        for (; (uVar125 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                        }
                      }
                      uVar128 = (ulong)uVar11;
                    }
                    auVar202 = ZEXT3264(auVar17);
                  } while (((((((bVar106 || bVar107) || bVar105) || bVar104) || bVar103) || bVar102)
                           || bVar100) || bVar99);
                }
              }
            }
          }
          lVar132 = lVar132 + 8;
          fVar228 = (float)local_5c0._0_4_;
          fVar133 = (float)local_5c0._4_4_;
          fVar150 = fStack_5b8;
          fVar152 = fStack_5b4;
          fVar227 = fStack_5b0;
          fVar190 = fStack_5ac;
          fVar236 = fStack_5a8;
        } while ((int)lVar132 < (int)uVar12);
      }
      fVar227 = (ray->super_RayK<1>).tfar;
      auVar137._4_4_ = fVar227;
      auVar137._0_4_ = fVar227;
      auVar137._8_4_ = fVar227;
      auVar137._12_4_ = fVar227;
      auVar231 = vcmpps_avx(local_190,auVar137,2);
      uVar127 = vmovmskps_avx(auVar231);
      uVar127 = (uint)uVar131 & uVar127;
    } while (uVar127 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }